

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [28];
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  Primitive PVar9;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  uint uVar15;
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  bool bVar101;
  bool bVar102;
  bool bVar103;
  bool bVar104;
  bool bVar105;
  bool bVar106;
  bool bVar107;
  bool bVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [24];
  uint uVar125;
  uint uVar126;
  uint uVar127;
  ulong uVar128;
  long lVar129;
  ulong uVar130;
  float fVar131;
  float fVar146;
  float fVar147;
  vint4 bi_2;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar148;
  float fVar150;
  float fVar154;
  float fVar155;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar156;
  undefined8 extraout_XMM1_Qa;
  float fVar174;
  vint4 bi_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  float fVar175;
  float fVar176;
  float fVar178;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar173;
  float fVar177;
  float fVar179;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 extraout_var [56];
  vint4 ai;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar191;
  undefined1 auVar190 [32];
  float fVar192;
  float fVar203;
  float fVar205;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar207;
  float fVar210;
  float fVar212;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar204;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar211;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar213;
  undefined1 auVar202 [64];
  float fVar214;
  float fVar223;
  float fVar224;
  vint4 bi;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar225;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar226;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar227;
  float fVar238;
  float fVar240;
  vint4 ai_2;
  undefined1 auVar229 [16];
  float fVar242;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar228;
  undefined1 auVar232 [16];
  float fVar239;
  float fVar241;
  float fVar243;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar244;
  float fVar245;
  float fVar253;
  float fVar255;
  undefined1 auVar246 [16];
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar259;
  undefined1 auVar251 [32];
  float fVar260;
  undefined1 auVar252 [32];
  float fVar261;
  float fVar268;
  float fVar269;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar270;
  float fVar274;
  undefined1 auVar265 [32];
  float fVar271;
  undefined1 auVar266 [32];
  undefined1 auVar264 [16];
  float fVar272;
  float fVar273;
  undefined1 auVar267 [64];
  float fVar281;
  float fVar282;
  vint4 ai_1;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  float fVar286;
  float fVar287;
  float fVar293;
  float fVar295;
  undefined1 auVar288 [16];
  float fVar294;
  float fVar296;
  float fVar297;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar298;
  float fVar299;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar308 [64];
  undefined1 auVar312 [16];
  float fVar319;
  undefined1 auVar313 [32];
  float fVar318;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar320;
  float fVar325;
  float fVar326;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar327;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  float fVar328;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar334;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_880;
  undefined8 uStack_878;
  uint local_860;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  undefined1 auStack_7b0 [8];
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [16];
  undefined1 (*local_768) [16];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 auStack_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 local_630 [8];
  undefined8 uStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  LinearSpace3fa *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  RTCHitN local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  uint local_360;
  uint local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_300 [32];
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar280 [64];
  
  PVar9 = prim[1];
  uVar128 = (ulong)(byte)PVar9;
  auVar232 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar232 = vinsertps_avx(auVar232,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar186 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar186 = vinsertps_avx(auVar186,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar227 = *(float *)(prim + uVar128 * 0x19 + 0x12);
  auVar232 = vsubps_avx(auVar232,*(undefined1 (*) [16])(prim + uVar128 * 0x19 + 6));
  auVar180._0_4_ = fVar227 * auVar232._0_4_;
  auVar180._4_4_ = fVar227 * auVar232._4_4_;
  auVar180._8_4_ = fVar227 * auVar232._8_4_;
  auVar180._12_4_ = fVar227 * auVar232._12_4_;
  auVar262._0_4_ = fVar227 * auVar186._0_4_;
  auVar262._4_4_ = fVar227 * auVar186._4_4_;
  auVar262._8_4_ = fVar227 * auVar186._8_4_;
  auVar262._12_4_ = fVar227 * auVar186._12_4_;
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 6)));
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 5 + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 6)));
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xb + 6)));
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar128 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar130 = (ulong)(uint)((int)(uVar128 * 9) * 2);
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 + uVar128 + 6)));
  auVar134 = vcvtdq2ps_avx(auVar134);
  uVar130 = (ulong)(uint)((int)(uVar128 * 5) << 2);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar132 = vshufps_avx(auVar262,auVar262,0);
  auVar157 = vshufps_avx(auVar262,auVar262,0x55);
  auVar181 = vshufps_avx(auVar262,auVar262,0xaa);
  fVar227 = auVar181._0_4_;
  fVar192 = auVar181._4_4_;
  fVar238 = auVar181._8_4_;
  fVar203 = auVar181._12_4_;
  fVar244 = auVar157._0_4_;
  fVar253 = auVar157._4_4_;
  fVar255 = auVar157._8_4_;
  fVar257 = auVar157._12_4_;
  fVar240 = auVar132._0_4_;
  fVar205 = auVar132._4_4_;
  fVar242 = auVar132._8_4_;
  fVar207 = auVar132._12_4_;
  auVar312._0_4_ = fVar240 * auVar232._0_4_ + fVar244 * auVar186._0_4_ + fVar227 * auVar195._0_4_;
  auVar312._4_4_ = fVar205 * auVar232._4_4_ + fVar253 * auVar186._4_4_ + fVar192 * auVar195._4_4_;
  auVar312._8_4_ = fVar242 * auVar232._8_4_ + fVar255 * auVar186._8_4_ + fVar238 * auVar195._8_4_;
  auVar312._12_4_ =
       fVar207 * auVar232._12_4_ + fVar257 * auVar186._12_4_ + fVar203 * auVar195._12_4_;
  auVar321._0_4_ = fVar240 * auVar196._0_4_ + fVar244 * auVar19._0_4_ + auVar20._0_4_ * fVar227;
  auVar321._4_4_ = fVar205 * auVar196._4_4_ + fVar253 * auVar19._4_4_ + auVar20._4_4_ * fVar192;
  auVar321._8_4_ = fVar242 * auVar196._8_4_ + fVar255 * auVar19._8_4_ + auVar20._8_4_ * fVar238;
  auVar321._12_4_ = fVar207 * auVar196._12_4_ + fVar257 * auVar19._12_4_ + auVar20._12_4_ * fVar203;
  auVar263._0_4_ = fVar240 * auVar133._0_4_ + fVar244 * auVar134._0_4_ + auVar158._0_4_ * fVar227;
  auVar263._4_4_ = fVar205 * auVar133._4_4_ + fVar253 * auVar134._4_4_ + auVar158._4_4_ * fVar192;
  auVar263._8_4_ = fVar242 * auVar133._8_4_ + fVar255 * auVar134._8_4_ + auVar158._8_4_ * fVar238;
  auVar263._12_4_ =
       fVar207 * auVar133._12_4_ + fVar257 * auVar134._12_4_ + auVar158._12_4_ * fVar203;
  auVar132 = vshufps_avx(auVar180,auVar180,0);
  auVar157 = vshufps_avx(auVar180,auVar180,0x55);
  auVar181 = vshufps_avx(auVar180,auVar180,0xaa);
  fVar227 = auVar181._0_4_;
  fVar192 = auVar181._4_4_;
  fVar238 = auVar181._8_4_;
  fVar203 = auVar181._12_4_;
  fVar244 = auVar157._0_4_;
  fVar253 = auVar157._4_4_;
  fVar255 = auVar157._8_4_;
  fVar257 = auVar157._12_4_;
  fVar240 = auVar132._0_4_;
  fVar205 = auVar132._4_4_;
  fVar242 = auVar132._8_4_;
  fVar207 = auVar132._12_4_;
  auVar215._0_4_ = fVar240 * auVar232._0_4_ + fVar244 * auVar186._0_4_ + fVar227 * auVar195._0_4_;
  auVar215._4_4_ = fVar205 * auVar232._4_4_ + fVar253 * auVar186._4_4_ + fVar192 * auVar195._4_4_;
  auVar215._8_4_ = fVar242 * auVar232._8_4_ + fVar255 * auVar186._8_4_ + fVar238 * auVar195._8_4_;
  auVar215._12_4_ =
       fVar207 * auVar232._12_4_ + fVar257 * auVar186._12_4_ + fVar203 * auVar195._12_4_;
  auVar157._0_4_ = fVar240 * auVar196._0_4_ + auVar20._0_4_ * fVar227 + fVar244 * auVar19._0_4_;
  auVar157._4_4_ = fVar205 * auVar196._4_4_ + auVar20._4_4_ * fVar192 + fVar253 * auVar19._4_4_;
  auVar157._8_4_ = fVar242 * auVar196._8_4_ + auVar20._8_4_ * fVar238 + fVar255 * auVar19._8_4_;
  auVar157._12_4_ = fVar207 * auVar196._12_4_ + auVar20._12_4_ * fVar203 + fVar257 * auVar19._12_4_;
  auVar132._0_4_ = fVar240 * auVar133._0_4_ + fVar244 * auVar134._0_4_ + auVar158._0_4_ * fVar227;
  auVar132._4_4_ = fVar205 * auVar133._4_4_ + fVar253 * auVar134._4_4_ + auVar158._4_4_ * fVar192;
  auVar132._8_4_ = fVar242 * auVar133._8_4_ + fVar255 * auVar134._8_4_ + auVar158._8_4_ * fVar238;
  auVar132._12_4_ =
       fVar207 * auVar133._12_4_ + fVar257 * auVar134._12_4_ + auVar158._12_4_ * fVar203;
  auVar246._8_4_ = 0x7fffffff;
  auVar246._0_8_ = 0x7fffffff7fffffff;
  auVar246._12_4_ = 0x7fffffff;
  auVar232 = vandps_avx(auVar312,auVar246);
  auVar193._8_4_ = 0x219392ef;
  auVar193._0_8_ = 0x219392ef219392ef;
  auVar193._12_4_ = 0x219392ef;
  auVar232 = vcmpps_avx(auVar232,auVar193,1);
  auVar186 = vblendvps_avx(auVar312,auVar193,auVar232);
  auVar232 = vandps_avx(auVar321,auVar246);
  auVar232 = vcmpps_avx(auVar232,auVar193,1);
  auVar195 = vblendvps_avx(auVar321,auVar193,auVar232);
  auVar232 = vandps_avx(auVar263,auVar246);
  auVar232 = vcmpps_avx(auVar232,auVar193,1);
  auVar232 = vblendvps_avx(auVar263,auVar193,auVar232);
  auVar196 = vrcpps_avx(auVar186);
  fVar244 = auVar196._0_4_;
  auVar181._0_4_ = fVar244 * auVar186._0_4_;
  fVar253 = auVar196._4_4_;
  auVar181._4_4_ = fVar253 * auVar186._4_4_;
  fVar255 = auVar196._8_4_;
  auVar181._8_4_ = fVar255 * auVar186._8_4_;
  fVar257 = auVar196._12_4_;
  auVar181._12_4_ = fVar257 * auVar186._12_4_;
  auVar264._8_4_ = 0x3f800000;
  auVar264._0_8_ = &DAT_3f8000003f800000;
  auVar264._12_4_ = 0x3f800000;
  auVar186 = vsubps_avx(auVar264,auVar181);
  fVar244 = fVar244 + fVar244 * auVar186._0_4_;
  fVar253 = fVar253 + fVar253 * auVar186._4_4_;
  fVar255 = fVar255 + fVar255 * auVar186._8_4_;
  fVar257 = fVar257 + fVar257 * auVar186._12_4_;
  auVar186 = vrcpps_avx(auVar195);
  fVar227 = auVar186._0_4_;
  auVar229._0_4_ = fVar227 * auVar195._0_4_;
  fVar238 = auVar186._4_4_;
  auVar229._4_4_ = fVar238 * auVar195._4_4_;
  fVar240 = auVar186._8_4_;
  auVar229._8_4_ = fVar240 * auVar195._8_4_;
  fVar242 = auVar186._12_4_;
  auVar229._12_4_ = fVar242 * auVar195._12_4_;
  auVar186 = vsubps_avx(auVar264,auVar229);
  fVar227 = fVar227 + fVar227 * auVar186._0_4_;
  fVar238 = fVar238 + fVar238 * auVar186._4_4_;
  fVar240 = fVar240 + fVar240 * auVar186._8_4_;
  fVar242 = fVar242 + fVar242 * auVar186._12_4_;
  auVar186 = vrcpps_avx(auVar232);
  fVar192 = auVar186._0_4_;
  auVar194._0_4_ = fVar192 * auVar232._0_4_;
  fVar203 = auVar186._4_4_;
  auVar194._4_4_ = fVar203 * auVar232._4_4_;
  fVar205 = auVar186._8_4_;
  auVar194._8_4_ = fVar205 * auVar232._8_4_;
  fVar207 = auVar186._12_4_;
  auVar194._12_4_ = fVar207 * auVar232._12_4_;
  auVar232 = vsubps_avx(auVar264,auVar194);
  fVar192 = fVar192 + fVar192 * auVar232._0_4_;
  fVar203 = fVar203 + fVar203 * auVar232._4_4_;
  fVar205 = fVar205 + fVar205 * auVar232._8_4_;
  fVar207 = fVar207 + fVar207 * auVar232._12_4_;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar128 * 7 + 6);
  auVar232 = vpmovsxwd_avx(auVar232);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar232 = vsubps_avx(auVar232,auVar215);
  auVar182._0_4_ = fVar244 * auVar232._0_4_;
  auVar182._4_4_ = fVar253 * auVar232._4_4_;
  auVar182._8_4_ = fVar255 * auVar232._8_4_;
  auVar182._12_4_ = fVar257 * auVar232._12_4_;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar128 * 9 + 6);
  auVar232 = vpmovsxwd_avx(auVar186);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar232 = vsubps_avx(auVar232,auVar215);
  auVar216._0_4_ = fVar244 * auVar232._0_4_;
  auVar216._4_4_ = fVar253 * auVar232._4_4_;
  auVar216._8_4_ = fVar255 * auVar232._8_4_;
  auVar216._12_4_ = fVar257 * auVar232._12_4_;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar186 = vpmovsxwd_avx(auVar195);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar128 * -2 + 6);
  auVar232 = vpmovsxwd_avx(auVar196);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar232 = vsubps_avx(auVar232,auVar157);
  auVar275._0_4_ = auVar232._0_4_ * fVar227;
  auVar275._4_4_ = auVar232._4_4_ * fVar238;
  auVar275._8_4_ = auVar232._8_4_ * fVar240;
  auVar275._12_4_ = auVar232._12_4_ * fVar242;
  auVar280 = ZEXT1664(auVar275);
  auVar232 = vcvtdq2ps_avx(auVar186);
  auVar232 = vsubps_avx(auVar232,auVar157);
  auVar158._0_4_ = fVar227 * auVar232._0_4_;
  auVar158._4_4_ = fVar238 * auVar232._4_4_;
  auVar158._8_4_ = fVar240 * auVar232._8_4_;
  auVar158._12_4_ = fVar242 * auVar232._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar130 + uVar128 + 6);
  auVar232 = vpmovsxwd_avx(auVar19);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar232 = vsubps_avx(auVar232,auVar132);
  auVar230._0_4_ = auVar232._0_4_ * fVar192;
  auVar230._4_4_ = auVar232._4_4_ * fVar203;
  auVar230._8_4_ = auVar232._8_4_ * fVar205;
  auVar230._12_4_ = auVar232._12_4_ * fVar207;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar128 * 0x17 + 6);
  auVar232 = vpmovsxwd_avx(auVar20);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar232 = vsubps_avx(auVar232,auVar132);
  auVar133._0_4_ = auVar232._0_4_ * fVar192;
  auVar133._4_4_ = auVar232._4_4_ * fVar203;
  auVar133._8_4_ = auVar232._8_4_ * fVar205;
  auVar133._12_4_ = auVar232._12_4_ * fVar207;
  auVar232 = vpminsd_avx(auVar182,auVar216);
  auVar186 = vpminsd_avx(auVar275,auVar158);
  auVar232 = vmaxps_avx(auVar232,auVar186);
  auVar186 = vpminsd_avx(auVar230,auVar133);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar288._4_4_ = uVar8;
  auVar288._0_4_ = uVar8;
  auVar288._8_4_ = uVar8;
  auVar288._12_4_ = uVar8;
  auVar186 = vmaxps_avx(auVar186,auVar288);
  auVar232 = vmaxps_avx(auVar232,auVar186);
  auVar267 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
  local_170._0_4_ = auVar232._0_4_ * 0.99999964;
  local_170._4_4_ = auVar232._4_4_ * 0.99999964;
  local_170._8_4_ = auVar232._8_4_ * 0.99999964;
  local_170._12_4_ = auVar232._12_4_ * 0.99999964;
  auVar232 = vpmaxsd_avx(auVar182,auVar216);
  auVar186 = vpmaxsd_avx(auVar275,auVar158);
  auVar232 = vminps_avx(auVar232,auVar186);
  auVar186 = vpmaxsd_avx(auVar230,auVar133);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar183._4_4_ = uVar8;
  auVar183._0_4_ = uVar8;
  auVar183._8_4_ = uVar8;
  auVar183._12_4_ = uVar8;
  auVar186 = vminps_avx(auVar186,auVar183);
  auVar232 = vminps_avx(auVar232,auVar186);
  auVar134._0_4_ = auVar232._0_4_ * 1.0000004;
  auVar134._4_4_ = auVar232._4_4_ * 1.0000004;
  auVar134._8_4_ = auVar232._8_4_ * 1.0000004;
  auVar134._12_4_ = auVar232._12_4_ * 1.0000004;
  auVar232 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar186 = vpcmpgtd_avx(auVar232,_DAT_01ff0cf0);
  auVar232 = vcmpps_avx(local_170,auVar134,2);
  auVar232 = vandps_avx(auVar232,auVar186);
  uVar125 = vmovmskps_avx(auVar232);
  if (uVar125 != 0) {
    uVar125 = uVar125 & 0xff;
    local_540 = mm_lookupmask_ps._16_8_;
    uStack_538 = mm_lookupmask_ps._24_8_;
    uStack_530 = mm_lookupmask_ps._16_8_;
    uStack_528 = mm_lookupmask_ps._24_8_;
    local_548 = pre->ray_space + k;
    local_768 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar130 = (ulong)uVar125;
      auVar277 = auVar280._0_32_;
      auVar164 = auVar267._0_32_;
      lVar16 = 0;
      if (uVar130 != 0) {
        for (; (uVar125 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
        }
      }
      uVar130 = uVar130 - 1 & uVar130;
      uVar125 = *(uint *)(prim + 2);
      uVar10 = *(uint *)(prim + lVar16 * 4 + 6);
      pGVar13 = (context->scene->geometries).items[uVar125].ptr;
      uVar128 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                                pGVar13[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar10);
      p_Var14 = pGVar13[1].intersectionFilterN;
      lVar16 = *(long *)&pGVar13[1].time_range.upper;
      auVar232 = *(undefined1 (*) [16])(lVar16 + (long)p_Var14 * uVar128);
      _local_800 = *(undefined1 (*) [16])(lVar16 + (uVar128 + 1) * (long)p_Var14);
      _local_630 = *(undefined1 (*) [16])(lVar16 + (uVar128 + 2) * (long)p_Var14);
      lVar129 = 0;
      if (uVar130 != 0) {
        for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
        }
      }
      _local_640 = *(undefined1 (*) [16])(lVar16 + (uVar128 + 3) * (long)p_Var14);
      if (((uVar130 != 0) && (uVar128 = uVar130 - 1 & uVar130, uVar128 != 0)) &&
         (lVar16 = 0, uVar128 != 0)) {
        for (; (uVar128 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
        }
      }
      uVar11 = (uint)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar186 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar19 = vinsertps_avx(auVar186,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar196 = vsubps_avx(auVar232,auVar19);
      auVar186 = vshufps_avx(auVar196,auVar196,0);
      auVar195 = vshufps_avx(auVar196,auVar196,0x55);
      auVar196 = vshufps_avx(auVar196,auVar196,0xaa);
      fVar227 = (local_548->vx).field_0.m128[0];
      fVar192 = (local_548->vx).field_0.m128[1];
      fVar238 = (local_548->vx).field_0.m128[2];
      fVar203 = (local_548->vx).field_0.m128[3];
      fVar240 = (local_548->vy).field_0.m128[0];
      fVar205 = (local_548->vy).field_0.m128[1];
      fVar242 = (local_548->vy).field_0.m128[2];
      fVar207 = (local_548->vy).field_0.m128[3];
      fVar244 = (local_548->vz).field_0.m128[0];
      fVar253 = (local_548->vz).field_0.m128[1];
      fVar255 = (local_548->vz).field_0.m128[2];
      fVar257 = (local_548->vz).field_0.m128[3];
      auVar159._0_8_ =
           CONCAT44(auVar186._4_4_ * fVar192 + auVar195._4_4_ * fVar205 + fVar253 * auVar196._4_4_,
                    auVar186._0_4_ * fVar227 + auVar195._0_4_ * fVar240 + fVar244 * auVar196._0_4_);
      auVar159._8_4_ =
           auVar186._8_4_ * fVar238 + auVar195._8_4_ * fVar242 + fVar255 * auVar196._8_4_;
      auVar159._12_4_ =
           auVar186._12_4_ * fVar203 + auVar195._12_4_ * fVar207 + fVar257 * auVar196._12_4_;
      auVar186 = vblendps_avx(auVar159,auVar232,8);
      auVar20 = vsubps_avx(_local_800,auVar19);
      auVar195 = vshufps_avx(auVar20,auVar20,0);
      auVar196 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar322._0_4_ = auVar195._0_4_ * fVar227 + auVar196._0_4_ * fVar240 + fVar244 * auVar20._0_4_
      ;
      auVar322._4_4_ = auVar195._4_4_ * fVar192 + auVar196._4_4_ * fVar205 + fVar253 * auVar20._4_4_
      ;
      auVar322._8_4_ = auVar195._8_4_ * fVar238 + auVar196._8_4_ * fVar242 + fVar255 * auVar20._8_4_
      ;
      auVar322._12_4_ =
           auVar195._12_4_ * fVar203 + auVar196._12_4_ * fVar207 + fVar257 * auVar20._12_4_;
      auVar195 = vblendps_avx(auVar322,_local_800,8);
      auVar133 = vsubps_avx(_local_630,auVar19);
      auVar196 = vshufps_avx(auVar133,auVar133,0);
      auVar20 = vshufps_avx(auVar133,auVar133,0x55);
      auVar133 = vshufps_avx(auVar133,auVar133,0xaa);
      auVar231._0_4_ = auVar196._0_4_ * fVar227 + auVar20._0_4_ * fVar240 + fVar244 * auVar133._0_4_
      ;
      auVar231._4_4_ = auVar196._4_4_ * fVar192 + auVar20._4_4_ * fVar205 + fVar253 * auVar133._4_4_
      ;
      auVar231._8_4_ = auVar196._8_4_ * fVar238 + auVar20._8_4_ * fVar242 + fVar255 * auVar133._8_4_
      ;
      auVar231._12_4_ =
           auVar196._12_4_ * fVar203 + auVar20._12_4_ * fVar207 + fVar257 * auVar133._12_4_;
      auVar133 = vshufps_avx(_local_630,_local_630,0xff);
      auVar196 = vblendps_avx(auVar231,_local_630,8);
      auVar134 = vsubps_avx(_local_640,auVar19);
      auVar19 = vshufps_avx(auVar134,auVar134,0);
      auVar20 = vshufps_avx(auVar134,auVar134,0x55);
      auVar134 = vshufps_avx(auVar134,auVar134,0xaa);
      auVar276._0_4_ = auVar19._0_4_ * fVar227 + auVar20._0_4_ * fVar240 + fVar244 * auVar134._0_4_;
      auVar276._4_4_ = auVar19._4_4_ * fVar192 + auVar20._4_4_ * fVar205 + fVar253 * auVar134._4_4_;
      auVar276._8_4_ = auVar19._8_4_ * fVar238 + auVar20._8_4_ * fVar242 + fVar255 * auVar134._8_4_;
      auVar276._12_4_ =
           auVar19._12_4_ * fVar203 + auVar20._12_4_ * fVar207 + fVar257 * auVar134._12_4_;
      auVar134 = vshufps_avx(_local_640,_local_640,0xff);
      auVar19 = vblendps_avx(auVar276,_local_640,8);
      auVar217._8_4_ = 0x7fffffff;
      auVar217._0_8_ = 0x7fffffff7fffffff;
      auVar217._12_4_ = 0x7fffffff;
      auVar186 = vandps_avx(auVar186,auVar217);
      auVar195 = vandps_avx(auVar195,auVar217);
      auVar20 = vmaxps_avx(auVar186,auVar195);
      auVar186 = vandps_avx(auVar196,auVar217);
      auVar195 = vandps_avx(auVar19,auVar217);
      auVar186 = vmaxps_avx(auVar186,auVar195);
      auVar186 = vmaxps_avx(auVar20,auVar186);
      auVar195 = vmovshdup_avx(auVar186);
      auVar195 = vmaxss_avx(auVar195,auVar186);
      auVar186 = vshufpd_avx(auVar186,auVar186,1);
      auVar186 = vmaxss_avx(auVar186,auVar195);
      lVar16 = (long)(int)uVar11 * 0x44;
      fVar176 = *(float *)(bspline_basis0 + lVar16 + 0x908);
      fVar206 = *(float *)(bspline_basis0 + lVar16 + 0x90c);
      fVar271 = *(float *)(bspline_basis0 + lVar16 + 0x910);
      fVar281 = *(float *)(bspline_basis0 + lVar16 + 0x914);
      fVar282 = *(float *)(bspline_basis0 + lVar16 + 0x918);
      fVar209 = *(float *)(bspline_basis0 + lVar16 + 0x91c);
      fVar272 = *(float *)(bspline_basis0 + lVar16 + 0x920);
      auVar195 = vshufps_avx(auVar231,auVar231,0);
      register0x00001450 = auVar195;
      _local_500 = auVar195;
      auVar196 = vshufps_avx(auVar231,auVar231,0x55);
      local_600._16_16_ = auVar196;
      local_600._0_16_ = auVar196;
      register0x00001490 = auVar133;
      _local_1c0 = auVar133;
      fVar192 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar16 + 0xd8c);
      fVar238 = *(float *)(bspline_basis0 + lVar16 + 0xd90);
      fVar240 = *(float *)(bspline_basis0 + lVar16 + 0xd94);
      fVar205 = *(float *)(bspline_basis0 + lVar16 + 0xd98);
      fVar207 = *(float *)(bspline_basis0 + lVar16 + 0xd9c);
      fVar244 = *(float *)(bspline_basis0 + lVar16 + 0xda0);
      fVar255 = *(float *)(bspline_basis0 + lVar16 + 0xda4);
      auVar119 = *(undefined1 (*) [28])(bspline_basis0 + lVar16 + 0xd8c);
      auVar19 = vshufps_avx(auVar276,auVar276,0);
      register0x00001310 = auVar19;
      _local_4a0 = auVar19;
      auVar20 = vshufps_avx(auVar276,auVar276,0x55);
      register0x000015d0 = auVar20;
      _local_720 = auVar20;
      register0x000013d0 = auVar134;
      _local_120 = auVar134;
      fVar214 = auVar19._0_4_;
      fVar223 = auVar19._4_4_;
      fVar224 = auVar19._8_4_;
      fVar225 = auVar19._12_4_;
      fVar334 = auVar20._0_4_;
      fVar338 = auVar20._4_4_;
      fVar339 = auVar20._8_4_;
      fVar340 = auVar20._12_4_;
      fVar286 = auVar195._0_4_;
      fVar293 = auVar195._4_4_;
      fVar295 = auVar195._8_4_;
      fVar297 = auVar195._12_4_;
      fVar245 = auVar196._0_4_;
      fVar254 = auVar196._4_4_;
      fVar256 = auVar196._8_4_;
      fVar258 = auVar196._12_4_;
      fVar261 = auVar134._0_4_;
      fVar268 = auVar134._4_4_;
      fVar269 = auVar134._8_4_;
      fVar270 = auVar134._12_4_;
      fVar298 = auVar133._0_4_;
      fVar303 = auVar133._4_4_;
      fVar305 = auVar133._8_4_;
      auVar195 = vshufps_avx(auVar322,auVar322,0);
      register0x00001490 = auVar195;
      _local_100 = auVar195;
      fVar283 = *(float *)(bspline_basis0 + lVar16 + 0x484);
      fVar284 = *(float *)(bspline_basis0 + lVar16 + 0x488);
      fVar211 = *(float *)(bspline_basis0 + lVar16 + 0x48c);
      fVar273 = *(float *)(bspline_basis0 + lVar16 + 0x490);
      fStack_510 = *(float *)(bspline_basis0 + lVar16 + 0x494);
      fStack_50c = *(float *)(bspline_basis0 + lVar16 + 0x498);
      fStack_508 = *(float *)(bspline_basis0 + lVar16 + 0x49c);
      fStack_504 = *(float *)(bspline_basis0 + lVar16 + 0x4a0);
      fVar299 = auVar195._0_4_;
      fVar304 = auVar195._4_4_;
      fVar306 = auVar195._8_4_;
      fVar307 = auVar195._12_4_;
      auVar195 = vshufps_avx(auVar322,auVar322,0x55);
      register0x00001350 = auVar195;
      _local_220 = auVar195;
      fVar228 = auVar195._0_4_;
      fVar239 = auVar195._4_4_;
      fVar241 = auVar195._8_4_;
      fVar243 = auVar195._12_4_;
      auVar195 = vshufps_avx(_local_800,_local_800,0xff);
      register0x00001590 = auVar195;
      _local_80 = auVar195;
      fVar328 = auVar195._0_4_;
      fVar331 = auVar195._4_4_;
      fVar332 = auVar195._8_4_;
      fVar333 = auVar195._12_4_;
      fVar191 = *(float *)(bspline_basis0 + lVar16 + 0x924) + 0.0 + 0.0;
      auVar109._8_4_ = auVar159._8_4_;
      auVar109._0_8_ = auVar159._0_8_;
      auVar109._12_4_ = auVar159._12_4_;
      auVar195 = vshufps_avx(auVar109,auVar109,0);
      register0x00001550 = auVar195;
      _local_a0 = auVar195;
      pauVar1 = (undefined1 (*) [32])(bspline_basis0 + lVar16);
      fVar257 = *(float *)*pauVar1;
      fVar309 = *(float *)(bspline_basis0 + lVar16 + 4);
      fVar318 = *(float *)(bspline_basis0 + lVar16 + 8);
      fVar310 = *(float *)(bspline_basis0 + lVar16 + 0xc);
      fVar204 = *(float *)(bspline_basis0 + lVar16 + 0x10);
      fVar311 = *(float *)(bspline_basis0 + lVar16 + 0x14);
      fVar319 = *(float *)(bspline_basis0 + lVar16 + 0x18);
      auVar120 = *(undefined1 (*) [28])*pauVar1;
      fVar320 = auVar195._0_4_;
      fVar325 = auVar195._4_4_;
      fVar326 = auVar195._8_4_;
      fVar327 = auVar195._12_4_;
      auVar313._0_4_ = fVar320 * fVar257 + fVar299 * fVar283 + fVar286 * fVar176 + fVar214 * fVar192
      ;
      auVar313._4_4_ = fVar325 * fVar309 + fVar304 * fVar284 + fVar293 * fVar206 + fVar223 * fVar238
      ;
      auVar313._8_4_ = fVar326 * fVar318 + fVar306 * fVar211 + fVar295 * fVar271 + fVar224 * fVar240
      ;
      auVar313._12_4_ =
           fVar327 * fVar310 + fVar307 * fVar273 + fVar297 * fVar281 + fVar225 * fVar205;
      auVar313._16_4_ =
           fVar320 * fVar204 + fVar299 * fStack_510 + fVar286 * fVar282 + fVar214 * fVar207;
      auVar313._20_4_ =
           fVar325 * fVar311 + fVar304 * fStack_50c + fVar293 * fVar209 + fVar223 * fVar244;
      auVar313._24_4_ =
           fVar326 * fVar319 + fVar306 * fStack_508 + fVar295 * fVar272 + fVar224 * fVar255;
      auVar313._28_4_ = fStack_504 + 0.0;
      auVar195 = vshufps_avx(auVar109,auVar109,0x55);
      register0x00001210 = auVar195;
      _local_1e0 = auVar195;
      fVar227 = auVar195._0_4_;
      fVar203 = auVar195._4_4_;
      fVar242 = auVar195._8_4_;
      fVar253 = auVar195._12_4_;
      auVar278._0_4_ = fVar257 * fVar227 + fVar228 * fVar283 + fVar245 * fVar176 + fVar334 * fVar192
      ;
      auVar278._4_4_ = fVar309 * fVar203 + fVar239 * fVar284 + fVar254 * fVar206 + fVar338 * fVar238
      ;
      auVar278._8_4_ = fVar318 * fVar242 + fVar241 * fVar211 + fVar256 * fVar271 + fVar339 * fVar240
      ;
      auVar278._12_4_ =
           fVar310 * fVar253 + fVar243 * fVar273 + fVar258 * fVar281 + fVar340 * fVar205;
      auVar278._16_4_ =
           fVar204 * fVar227 + fVar228 * fStack_510 + fVar245 * fVar282 + fVar334 * fVar207;
      auVar278._20_4_ =
           fVar311 * fVar203 + fVar239 * fStack_50c + fVar254 * fVar209 + fVar338 * fVar244;
      auVar278._24_4_ =
           fVar319 * fVar242 + fVar241 * fStack_508 + fVar256 * fVar272 + fVar339 * fVar255;
      auVar278._28_4_ = 0;
      auVar195 = vpermilps_avx(auVar232,0xff);
      register0x00001450 = auVar195;
      _local_140 = auVar195;
      _local_200 = *pauVar1;
      auVar144 = _local_200;
      fVar287 = auVar195._0_4_;
      fVar294 = auVar195._4_4_;
      fVar296 = auVar195._8_4_;
      local_840._0_4_ =
           fVar287 * fVar257 + fVar328 * fVar283 + fVar298 * fVar176 + fVar261 * fVar192;
      local_840._4_4_ =
           fVar294 * fVar309 + fVar331 * fVar284 + fVar303 * fVar206 + fVar268 * fVar238;
      fStack_838 = fVar296 * fVar318 + fVar332 * fVar211 + fVar305 * fVar271 + fVar269 * fVar240;
      fStack_834 = auVar195._12_4_ * fVar310 +
                   fVar333 * fVar273 + auVar133._12_4_ * fVar281 + fVar270 * fVar205;
      fStack_830 = fVar287 * fVar204 + fVar328 * fStack_510 + fVar298 * fVar282 + fVar261 * fVar207;
      fStack_82c = fVar294 * fVar311 + fVar331 * fStack_50c + fVar303 * fVar209 + fVar268 * fVar244;
      fStack_828 = fVar296 * fVar319 + fVar332 * fStack_508 + fVar305 * fVar272 + fVar269 * fVar255;
      fStack_824 = fVar191 + 0.0;
      fVar213 = *(float *)(bspline_basis1 + lVar16 + 0x908);
      fVar285 = *(float *)(bspline_basis1 + lVar16 + 0x90c);
      fVar212 = *(float *)(bspline_basis1 + lVar16 + 0x910);
      fVar155 = *(float *)(bspline_basis1 + lVar16 + 0x914);
      fVar156 = *(float *)(bspline_basis1 + lVar16 + 0x918);
      fVar173 = *(float *)(bspline_basis1 + lVar16 + 0x91c);
      fVar174 = *(float *)(bspline_basis1 + lVar16 + 0x920);
      fVar131 = *(float *)(bspline_basis1 + lVar16 + 0xd8c);
      fVar146 = *(float *)(bspline_basis1 + lVar16 + 0xd90);
      fVar148 = *(float *)(bspline_basis1 + lVar16 + 0xd94);
      fVar150 = *(float *)(bspline_basis1 + lVar16 + 0xd98);
      fVar151 = *(float *)(bspline_basis1 + lVar16 + 0xd9c);
      fVar152 = *(float *)(bspline_basis1 + lVar16 + 0xda0);
      fVar153 = *(float *)(bspline_basis1 + lVar16 + 0xda4);
      fVar154 = *(float *)(bspline_basis1 + lVar16 + 0x484);
      fVar226 = *(float *)(bspline_basis1 + lVar16 + 0x488);
      fVar259 = *(float *)(bspline_basis1 + lVar16 + 0x48c);
      fVar147 = *(float *)(bspline_basis1 + lVar16 + 0x490);
      fVar149 = *(float *)(bspline_basis1 + lVar16 + 0x494);
      fVar178 = *(float *)(bspline_basis1 + lVar16 + 0x498);
      fVar274 = *(float *)(bspline_basis1 + lVar16 + 0x49c);
      fVar238 = fVar327 + fVar191 + 0.0;
      fVar191 = *(float *)(bspline_basis1 + lVar16);
      fVar208 = *(float *)(bspline_basis1 + lVar16 + 4);
      fVar210 = *(float *)(bspline_basis1 + lVar16 + 8);
      fVar175 = *(float *)(bspline_basis1 + lVar16 + 0xc);
      fVar177 = *(float *)(bspline_basis1 + lVar16 + 0x10);
      fVar179 = *(float *)(bspline_basis1 + lVar16 + 0x14);
      fVar260 = *(float *)(bspline_basis1 + lVar16 + 0x18);
      auVar218._0_4_ = fVar320 * fVar191 + fVar299 * fVar154 + fVar213 * fVar286 + fVar131 * fVar214
      ;
      auVar218._4_4_ = fVar325 * fVar208 + fVar304 * fVar226 + fVar285 * fVar293 + fVar146 * fVar223
      ;
      auVar218._8_4_ = fVar326 * fVar210 + fVar306 * fVar259 + fVar212 * fVar295 + fVar148 * fVar224
      ;
      auVar218._12_4_ =
           fVar327 * fVar175 + fVar307 * fVar147 + fVar155 * fVar297 + fVar150 * fVar225;
      auVar218._16_4_ =
           fVar320 * fVar177 + fVar299 * fVar149 + fVar156 * fVar286 + fVar151 * fVar214;
      auVar218._20_4_ =
           fVar325 * fVar179 + fVar304 * fVar178 + fVar173 * fVar293 + fVar152 * fVar223;
      auVar218._24_4_ =
           fVar326 * fVar260 + fVar306 * fVar274 + fVar174 * fVar295 + fVar153 * fVar224;
      auVar218._28_4_ = fVar333 + fVar238;
      auVar197._0_4_ = fVar227 * fVar191 + fVar228 * fVar154 + fVar213 * fVar245 + fVar334 * fVar131
      ;
      auVar197._4_4_ = fVar203 * fVar208 + fVar239 * fVar226 + fVar285 * fVar254 + fVar338 * fVar146
      ;
      auVar197._8_4_ = fVar242 * fVar210 + fVar241 * fVar259 + fVar212 * fVar256 + fVar339 * fVar148
      ;
      auVar197._12_4_ =
           fVar253 * fVar175 + fVar243 * fVar147 + fVar155 * fVar258 + fVar340 * fVar150;
      auVar197._16_4_ =
           fVar227 * fVar177 + fVar228 * fVar149 + fVar156 * fVar245 + fVar334 * fVar151;
      auVar197._20_4_ =
           fVar203 * fVar179 + fVar239 * fVar178 + fVar173 * fVar254 + fVar338 * fVar152;
      auVar197._24_4_ =
           fVar242 * fVar260 + fVar241 * fVar274 + fVar174 * fVar256 + fVar339 * fVar153;
      auVar197._28_4_ = fVar238 + fVar327 + fStack_504 + 0.0;
      auVar233._0_4_ = fVar328 * fVar154 + fVar213 * fVar298 + fVar131 * fVar261 + fVar287 * fVar191
      ;
      auVar233._4_4_ = fVar331 * fVar226 + fVar285 * fVar303 + fVar146 * fVar268 + fVar294 * fVar208
      ;
      auVar233._8_4_ = fVar332 * fVar259 + fVar212 * fVar305 + fVar148 * fVar269 + fVar296 * fVar210
      ;
      auVar233._12_4_ =
           fVar333 * fVar147 + fVar155 * auVar133._12_4_ + fVar150 * fVar270 +
           auVar195._12_4_ * fVar175;
      auVar233._16_4_ =
           fVar328 * fVar149 + fVar156 * fVar298 + fVar151 * fVar261 + fVar287 * fVar177;
      auVar233._20_4_ =
           fVar331 * fVar178 + fVar173 * fVar303 + fVar152 * fVar268 + fVar294 * fVar179;
      auVar233._24_4_ =
           fVar332 * fVar274 + fVar174 * fVar305 + fVar153 * fVar269 + fVar296 * fVar260;
      auVar233._28_4_ = fVar327 + fVar270 + fStack_504 + fVar238;
      local_260 = vsubps_avx(auVar218,auVar313);
      auVar21 = vsubps_avx(auVar197,auVar278);
      fVar192 = local_260._0_4_;
      fVar240 = local_260._4_4_;
      auVar18._4_4_ = auVar278._4_4_ * fVar240;
      auVar18._0_4_ = auVar278._0_4_ * fVar192;
      fVar207 = local_260._8_4_;
      auVar18._8_4_ = auVar278._8_4_ * fVar207;
      fVar255 = local_260._12_4_;
      auVar18._12_4_ = auVar278._12_4_ * fVar255;
      fVar309 = local_260._16_4_;
      auVar18._16_4_ = auVar278._16_4_ * fVar309;
      fVar310 = local_260._20_4_;
      auVar18._20_4_ = auVar278._20_4_ * fVar310;
      fVar311 = local_260._24_4_;
      auVar18._24_4_ = auVar278._24_4_ * fVar311;
      auVar18._28_4_ = fVar238;
      fVar238 = auVar21._0_4_;
      fVar205 = auVar21._4_4_;
      auVar22._4_4_ = auVar313._4_4_ * fVar205;
      auVar22._0_4_ = auVar313._0_4_ * fVar238;
      fVar244 = auVar21._8_4_;
      auVar22._8_4_ = auVar313._8_4_ * fVar244;
      fVar257 = auVar21._12_4_;
      auVar22._12_4_ = auVar313._12_4_ * fVar257;
      fVar318 = auVar21._16_4_;
      auVar22._16_4_ = auVar313._16_4_ * fVar318;
      fVar204 = auVar21._20_4_;
      auVar22._20_4_ = auVar313._20_4_ * fVar204;
      fVar319 = auVar21._24_4_;
      auVar22._24_4_ = auVar313._24_4_ * fVar319;
      auVar22._28_4_ = auVar197._28_4_;
      auVar22 = vsubps_avx(auVar18,auVar22);
      auVar18 = vmaxps_avx(_local_840,auVar233);
      auVar30._4_4_ = auVar18._4_4_ * auVar18._4_4_ * (fVar240 * fVar240 + fVar205 * fVar205);
      auVar30._0_4_ = auVar18._0_4_ * auVar18._0_4_ * (fVar192 * fVar192 + fVar238 * fVar238);
      auVar30._8_4_ = auVar18._8_4_ * auVar18._8_4_ * (fVar207 * fVar207 + fVar244 * fVar244);
      auVar30._12_4_ = auVar18._12_4_ * auVar18._12_4_ * (fVar255 * fVar255 + fVar257 * fVar257);
      auVar30._16_4_ = auVar18._16_4_ * auVar18._16_4_ * (fVar309 * fVar309 + fVar318 * fVar318);
      auVar30._20_4_ = auVar18._20_4_ * auVar18._20_4_ * (fVar310 * fVar310 + fVar204 * fVar204);
      auVar30._24_4_ = auVar18._24_4_ * auVar18._24_4_ * (fVar311 * fVar311 + fVar319 * fVar319);
      auVar30._28_4_ = auVar21._28_4_ + auVar197._28_4_;
      auVar17._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar17._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar17._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar17._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar17._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar17._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar17._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar17._28_4_ = auVar22._28_4_;
      auVar18 = vcmpps_avx(auVar17,auVar30,2);
      auVar195 = ZEXT416((uint)(float)(int)uVar11);
      _local_4c0 = auVar195;
      auVar195 = vshufps_avx(auVar195,auVar195,0);
      auVar198._16_16_ = auVar195;
      auVar198._0_16_ = auVar195;
      auVar22 = vcmpps_avx(_DAT_02020f40,auVar198,1);
      auVar202 = ZEXT3264(auVar22);
      auVar110._8_4_ = auVar159._8_4_;
      auVar110._0_8_ = auVar159._0_8_;
      auVar110._12_4_ = auVar159._12_4_;
      auVar195 = vpermilps_avx(auVar110,0xaa);
      register0x00001450 = auVar195;
      _local_620 = auVar195;
      auVar196 = vpermilps_avx(auVar322,0xaa);
      register0x00001550 = auVar196;
      _local_480 = auVar196;
      auVar19 = vpermilps_avx(auVar231,0xaa);
      register0x00001590 = auVar19;
      _local_c0 = auVar19;
      auVar20 = vpermilps_avx(auVar276,0xaa);
      register0x00001310 = auVar20;
      _local_6a0 = auVar20;
      auVar30 = auVar22 & auVar18;
      uVar127 = *(uint *)(ray + k * 4 + 0x30);
      auVar186 = ZEXT416((uint)(auVar186._0_4_ * 4.7683716e-07));
      local_740._0_16_ = auVar186;
      local_880._0_4_ = auVar232._0_4_;
      fVar192 = (float)local_880;
      local_880._4_4_ = auVar232._4_4_;
      fVar238 = local_880._4_4_;
      uStack_878._0_4_ = auVar232._8_4_;
      fVar240 = (float)uStack_878;
      uStack_878._4_4_ = auVar232._12_4_;
      fVar205 = uStack_878._4_4_;
      local_880 = auVar232._0_8_;
      uStack_878 = auVar232._8_8_;
      fVar207 = fVar334;
      fVar244 = fVar338;
      fVar255 = fVar339;
      fVar257 = fVar340;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar30 >> 0x7f,0) == '\0') &&
            (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar30 >> 0xbf,0) == '\0') &&
          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar30[0x1f])
      {
        auVar267 = ZEXT3264(auVar164);
        auVar280 = ZEXT3264(auVar277);
      }
      else {
        auVar18 = vandps_avx(auVar18,auVar22);
        fVar261 = auVar195._0_4_;
        fVar268 = auVar195._4_4_;
        fVar269 = auVar195._8_4_;
        fVar270 = auVar195._12_4_;
        fVar287 = auVar196._0_4_;
        fVar294 = auVar196._4_4_;
        fVar296 = auVar196._8_4_;
        fVar298 = auVar196._12_4_;
        fVar303 = auVar19._0_4_;
        fVar305 = auVar19._4_4_;
        fVar328 = auVar19._8_4_;
        fVar331 = auVar19._12_4_;
        fVar309 = auVar20._0_4_;
        fVar318 = auVar20._4_4_;
        fVar310 = auVar20._8_4_;
        fVar204 = auVar20._12_4_;
        fVar311 = auVar22._28_4_ + *(float *)(bspline_basis1 + lVar16 + 0x924) + 0.0;
        local_240._0_4_ =
             fVar261 * fVar191 + fVar287 * fVar154 + fVar303 * fVar213 + fVar131 * fVar309;
        local_240._4_4_ =
             fVar268 * fVar208 + fVar294 * fVar226 + fVar305 * fVar285 + fVar146 * fVar318;
        fStack_238 = fVar269 * fVar210 + fVar296 * fVar259 + fVar328 * fVar212 + fVar148 * fVar310;
        fStack_234 = fVar270 * fVar175 + fVar298 * fVar147 + fVar331 * fVar155 + fVar150 * fVar204;
        fStack_230 = fVar261 * fVar177 + fVar287 * fVar149 + fVar303 * fVar156 + fVar151 * fVar309;
        fStack_22c = fVar268 * fVar179 + fVar294 * fVar178 + fVar305 * fVar173 + fVar152 * fVar318;
        fStack_228 = fVar269 * fVar260 + fVar296 * fVar274 + fVar328 * fVar174 + fVar153 * fVar310;
        fStack_224 = auVar18._28_4_ + fVar311;
        local_200._0_4_ = auVar120._0_4_;
        local_200._4_4_ = auVar120._4_4_;
        fStack_1f8 = auVar120._8_4_;
        fStack_1f4 = auVar120._12_4_;
        fStack_1f0 = auVar120._16_4_;
        fStack_1ec = auVar120._20_4_;
        fStack_1e8 = auVar120._24_4_;
        local_700._0_4_ = auVar119._0_4_;
        local_700._4_4_ = auVar119._4_4_;
        fStack_6f8 = auVar119._8_4_;
        fStack_6f4 = auVar119._12_4_;
        fStack_6f0 = auVar119._16_4_;
        fStack_6ec = auVar119._20_4_;
        fStack_6e8 = auVar119._24_4_;
        fVar226 = fVar261 * (float)local_200._0_4_ +
                  fVar287 * fVar283 + fVar303 * fVar176 + fVar309 * (float)local_700._0_4_;
        fVar259 = fVar268 * (float)local_200._4_4_ +
                  fVar294 * fVar284 + fVar305 * fVar206 + fVar318 * (float)local_700._4_4_;
        fVar147 = fVar269 * fStack_1f8 +
                  fVar296 * fVar211 + fVar328 * fVar271 + fVar310 * fStack_6f8;
        fVar149 = fVar270 * fStack_1f4 +
                  fVar298 * fVar273 + fVar331 * fVar281 + fVar204 * fStack_6f4;
        fStack_5b0 = fVar261 * fStack_1f0 +
                     fVar287 * fStack_510 + fVar303 * fVar282 + fVar309 * fStack_6f0;
        fStack_5ac = fVar268 * fStack_1ec +
                     fVar294 * fStack_50c + fVar305 * fVar209 + fVar318 * fStack_6ec;
        fStack_5a8 = fVar269 * fStack_1e8 +
                     fVar296 * fStack_508 + fVar328 * fVar272 + fVar310 * fStack_6e8;
        fStack_5a4 = fStack_224 + fVar311 + auVar18._28_4_ + auVar22._28_4_;
        fVar311 = *(float *)(bspline_basis0 + lVar16 + 0x1210);
        fVar319 = *(float *)(bspline_basis0 + lVar16 + 0x1214);
        fVar176 = *(float *)(bspline_basis0 + lVar16 + 0x1218);
        fVar206 = *(float *)(bspline_basis0 + lVar16 + 0x121c);
        fVar271 = *(float *)(bspline_basis0 + lVar16 + 0x1220);
        fVar281 = *(float *)(bspline_basis0 + lVar16 + 0x1224);
        fVar282 = *(float *)(bspline_basis0 + lVar16 + 0x1228);
        fVar209 = *(float *)(bspline_basis0 + lVar16 + 0x1694);
        fVar272 = *(float *)(bspline_basis0 + lVar16 + 0x1698);
        fVar283 = *(float *)(bspline_basis0 + lVar16 + 0x169c);
        fVar284 = *(float *)(bspline_basis0 + lVar16 + 0x16a0);
        fVar211 = *(float *)(bspline_basis0 + lVar16 + 0x16a4);
        fVar273 = *(float *)(bspline_basis0 + lVar16 + 0x16a8);
        fVar213 = *(float *)(bspline_basis0 + lVar16 + 0x16ac);
        fVar285 = *(float *)(bspline_basis0 + lVar16 + 0x1b18);
        fVar212 = *(float *)(bspline_basis0 + lVar16 + 0x1b1c);
        fVar155 = *(float *)(bspline_basis0 + lVar16 + 0x1b20);
        fVar156 = *(float *)(bspline_basis0 + lVar16 + 0x1b24);
        fVar173 = *(float *)(bspline_basis0 + lVar16 + 0x1b28);
        fVar174 = *(float *)(bspline_basis0 + lVar16 + 0x1b2c);
        fVar131 = *(float *)(bspline_basis0 + lVar16 + 0x1b30);
        fVar146 = *(float *)(bspline_basis0 + lVar16 + 0x1f9c);
        fVar148 = *(float *)(bspline_basis0 + lVar16 + 0x1fa0);
        fVar150 = *(float *)(bspline_basis0 + lVar16 + 0x1fa4);
        fVar151 = *(float *)(bspline_basis0 + lVar16 + 0x1fa8);
        fVar152 = *(float *)(bspline_basis0 + lVar16 + 0x1fac);
        fVar153 = *(float *)(bspline_basis0 + lVar16 + 0x1fb0);
        fVar154 = *(float *)(bspline_basis0 + lVar16 + 0x1fb4);
        fVar178 = *(float *)(bspline_basis0 + lVar16 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar16 + 0x1fb8);
        fVar274 = *(float *)(bspline_basis0 + lVar16 + 0x16b0) + fVar178;
        local_700._4_4_ =
             fVar325 * fVar319 + fVar304 * fVar272 + fVar293 * fVar212 + fVar223 * fVar148;
        local_700._0_4_ =
             fVar320 * fVar311 + fVar299 * fVar209 + fVar286 * fVar285 + fVar214 * fVar146;
        fStack_6f8 = fVar326 * fVar176 + fVar306 * fVar283 + fVar295 * fVar155 + fVar224 * fVar150;
        fStack_6f4 = fVar327 * fVar206 + fVar307 * fVar284 + fVar297 * fVar156 + fVar225 * fVar151;
        fStack_6f0 = fVar320 * fVar271 + fVar299 * fVar211 + fVar286 * fVar173 + fVar214 * fVar152;
        fStack_6ec = fVar325 * fVar281 + fVar304 * fVar273 + fVar293 * fVar174 + fVar223 * fVar153;
        fStack_6e8 = fVar326 * fVar282 + fVar306 * fVar213 + fVar295 * fVar131 + fVar224 * fVar154;
        fStack_6e4 = *(float *)(bspline_basis0 + lVar16 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar16 + 0x1fb8) +
                     fVar270 + *(float *)(bspline_basis1 + lVar16 + 0x4a0);
        auVar247._0_4_ =
             fVar227 * fVar311 + fVar228 * fVar209 + fVar245 * fVar285 + fVar334 * fVar146;
        auVar247._4_4_ =
             fVar203 * fVar319 + fVar239 * fVar272 + fVar254 * fVar212 + fVar338 * fVar148;
        auVar247._8_4_ =
             fVar242 * fVar176 + fVar241 * fVar283 + fVar256 * fVar155 + fVar339 * fVar150;
        auVar247._12_4_ =
             fVar253 * fVar206 + fVar243 * fVar284 + fVar258 * fVar156 + fVar340 * fVar151;
        auVar247._16_4_ =
             fVar227 * fVar271 + fVar228 * fVar211 + fVar245 * fVar173 + fVar334 * fVar152;
        auVar247._20_4_ =
             fVar203 * fVar281 + fVar239 * fVar273 + fVar254 * fVar174 + fVar338 * fVar153;
        auVar247._24_4_ =
             fVar242 * fVar282 + fVar241 * fVar213 + fVar256 * fVar131 + fVar339 * fVar154;
        auVar247._28_4_ =
             fVar178 + fVar270 + *(float *)(bspline_basis1 + lVar16 + 0x4a0) +
                       fVar270 + *(float *)(bspline_basis1 + lVar16 + 0x1c);
        local_520 = fVar261 * fVar311 + fVar287 * fVar209 + fVar303 * fVar285 + fVar309 * fVar146;
        fStack_51c = fVar268 * fVar319 + fVar294 * fVar272 + fVar305 * fVar212 + fVar318 * fVar148;
        fStack_518 = fVar269 * fVar176 + fVar296 * fVar283 + fVar328 * fVar155 + fVar310 * fVar150;
        fStack_514 = fVar270 * fVar206 + fVar298 * fVar284 + fVar331 * fVar156 + fVar204 * fVar151;
        fStack_510 = fVar261 * fVar271 + fVar287 * fVar211 + fVar303 * fVar173 + fVar309 * fVar152;
        fStack_50c = fVar268 * fVar281 + fVar294 * fVar273 + fVar305 * fVar174 + fVar318 * fVar153;
        fStack_508 = fVar269 * fVar282 + fVar296 * fVar213 + fVar328 * fVar131 + fVar310 * fVar154;
        fStack_504 = *(float *)(bspline_basis0 + lVar16 + 0x122c) + fVar274;
        fVar311 = *(float *)(bspline_basis1 + lVar16 + 0x1b18);
        fVar319 = *(float *)(bspline_basis1 + lVar16 + 0x1b1c);
        fVar176 = *(float *)(bspline_basis1 + lVar16 + 0x1b20);
        fVar206 = *(float *)(bspline_basis1 + lVar16 + 0x1b24);
        fVar271 = *(float *)(bspline_basis1 + lVar16 + 0x1b28);
        fVar281 = *(float *)(bspline_basis1 + lVar16 + 0x1b2c);
        fVar282 = *(float *)(bspline_basis1 + lVar16 + 0x1b30);
        fVar209 = *(float *)(bspline_basis1 + lVar16 + 0x1f9c);
        fVar272 = *(float *)(bspline_basis1 + lVar16 + 0x1fa0);
        fVar283 = *(float *)(bspline_basis1 + lVar16 + 0x1fa4);
        fVar284 = *(float *)(bspline_basis1 + lVar16 + 0x1fa8);
        fVar211 = *(float *)(bspline_basis1 + lVar16 + 0x1fac);
        fVar273 = *(float *)(bspline_basis1 + lVar16 + 0x1fb0);
        fVar213 = *(float *)(bspline_basis1 + lVar16 + 0x1fb4);
        fVar285 = *(float *)(bspline_basis1 + lVar16 + 0x1694);
        fVar212 = *(float *)(bspline_basis1 + lVar16 + 0x1698);
        fVar155 = *(float *)(bspline_basis1 + lVar16 + 0x169c);
        fVar156 = *(float *)(bspline_basis1 + lVar16 + 0x16a0);
        fVar173 = *(float *)(bspline_basis1 + lVar16 + 0x16a4);
        fVar174 = *(float *)(bspline_basis1 + lVar16 + 0x16a8);
        fVar131 = *(float *)(bspline_basis1 + lVar16 + 0x16ac);
        fVar146 = *(float *)(bspline_basis1 + lVar16 + 0x1210);
        fVar148 = *(float *)(bspline_basis1 + lVar16 + 0x1214);
        fVar150 = *(float *)(bspline_basis1 + lVar16 + 0x1218);
        fVar151 = *(float *)(bspline_basis1 + lVar16 + 0x121c);
        fVar152 = *(float *)(bspline_basis1 + lVar16 + 0x1220);
        fVar153 = *(float *)(bspline_basis1 + lVar16 + 0x1224);
        fVar154 = *(float *)(bspline_basis1 + lVar16 + 0x1228);
        auVar265._0_4_ =
             fVar320 * fVar146 + fVar299 * fVar285 + fVar286 * fVar311 + fVar214 * fVar209;
        auVar265._4_4_ =
             fVar325 * fVar148 + fVar304 * fVar212 + fVar293 * fVar319 + fVar223 * fVar272;
        auVar265._8_4_ =
             fVar326 * fVar150 + fVar306 * fVar155 + fVar295 * fVar176 + fVar224 * fVar283;
        auVar265._12_4_ =
             fVar327 * fVar151 + fVar307 * fVar156 + fVar297 * fVar206 + fVar225 * fVar284;
        auVar265._16_4_ =
             fVar320 * fVar152 + fVar299 * fVar173 + fVar286 * fVar271 + fVar214 * fVar211;
        auVar265._20_4_ =
             fVar325 * fVar153 + fVar304 * fVar174 + fVar293 * fVar281 + fVar223 * fVar273;
        auVar265._24_4_ =
             fVar326 * fVar154 + fVar306 * fVar131 + fVar295 * fVar282 + fVar224 * fVar213;
        auVar265._28_4_ = fVar297 + fVar297 + fVar270 + fVar274;
        auVar289._0_4_ =
             fVar227 * fVar146 + fVar228 * fVar285 + fVar245 * fVar311 + fVar334 * fVar209;
        auVar289._4_4_ =
             fVar203 * fVar148 + fVar239 * fVar212 + fVar254 * fVar319 + fVar338 * fVar272;
        auVar289._8_4_ =
             fVar242 * fVar150 + fVar241 * fVar155 + fVar256 * fVar176 + fVar339 * fVar283;
        auVar289._12_4_ =
             fVar253 * fVar151 + fVar243 * fVar156 + fVar258 * fVar206 + fVar340 * fVar284;
        auVar289._16_4_ =
             fVar227 * fVar152 + fVar228 * fVar173 + fVar245 * fVar271 + fVar334 * fVar211;
        auVar289._20_4_ =
             fVar203 * fVar153 + fVar239 * fVar174 + fVar254 * fVar281 + fVar338 * fVar273;
        auVar289._24_4_ =
             fVar242 * fVar154 + fVar241 * fVar131 + fVar256 * fVar282 + fVar339 * fVar213;
        auVar289._28_4_ = fVar297 + fVar297 + fVar297 + fVar270;
        auVar190._0_4_ =
             fVar261 * fVar146 + fVar287 * fVar285 + fVar303 * fVar311 + fVar209 * fVar309;
        auVar190._4_4_ =
             fVar268 * fVar148 + fVar294 * fVar212 + fVar305 * fVar319 + fVar272 * fVar318;
        auVar190._8_4_ =
             fVar269 * fVar150 + fVar296 * fVar155 + fVar328 * fVar176 + fVar283 * fVar310;
        auVar190._12_4_ =
             fVar270 * fVar151 + fVar298 * fVar156 + fVar331 * fVar206 + fVar284 * fVar204;
        auVar190._16_4_ =
             fVar261 * fVar152 + fVar287 * fVar173 + fVar303 * fVar271 + fVar211 * fVar309;
        auVar190._20_4_ =
             fVar268 * fVar153 + fVar294 * fVar174 + fVar305 * fVar281 + fVar273 * fVar318;
        auVar190._24_4_ =
             fVar269 * fVar154 + fVar296 * fVar131 + fVar328 * fVar282 + fVar213 * fVar310;
        auVar190._28_4_ =
             *(float *)(bspline_basis1 + lVar16 + 0x122c) +
             *(float *)(bspline_basis1 + lVar16 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar16 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar16 + 0x1fb8);
        auVar219._8_4_ = 0x7fffffff;
        auVar219._0_8_ = 0x7fffffff7fffffff;
        auVar219._12_4_ = 0x7fffffff;
        auVar219._16_4_ = 0x7fffffff;
        auVar219._20_4_ = 0x7fffffff;
        auVar219._24_4_ = 0x7fffffff;
        auVar219._28_4_ = 0x7fffffff;
        auVar22 = vandps_avx(_local_700,auVar219);
        auVar30 = vandps_avx(auVar247,auVar219);
        auVar30 = vmaxps_avx(auVar22,auVar30);
        auVar118._4_4_ = fStack_51c;
        auVar118._0_4_ = local_520;
        auVar118._8_4_ = fStack_518;
        auVar118._12_4_ = fStack_514;
        auVar118._16_4_ = fStack_510;
        auVar118._20_4_ = fStack_50c;
        auVar118._24_4_ = fStack_508;
        auVar118._28_4_ = fStack_504;
        auVar22 = vandps_avx(auVar219,auVar118);
        auVar22 = vmaxps_avx(auVar30,auVar22);
        auVar232 = vpermilps_avx(auVar186,0);
        auVar248._16_16_ = auVar232;
        auVar248._0_16_ = auVar232;
        auVar22 = vcmpps_avx(auVar22,auVar248,1);
        auVar17 = vblendvps_avx(_local_700,local_260,auVar22);
        auVar198 = vblendvps_avx(auVar247,auVar21,auVar22);
        auVar22 = vandps_avx(auVar265,auVar219);
        auVar30 = vandps_avx(auVar289,auVar219);
        auVar28 = vmaxps_avx(auVar22,auVar30);
        auVar22 = vandps_avx(auVar190,auVar219);
        auVar22 = vmaxps_avx(auVar28,auVar22);
        auVar28 = vcmpps_avx(auVar22,auVar248,1);
        auVar22 = vblendvps_avx(auVar265,local_260,auVar28);
        auVar21 = vblendvps_avx(auVar289,auVar21,auVar28);
        fVar146 = auVar17._0_4_;
        fVar148 = auVar17._4_4_;
        fVar150 = auVar17._8_4_;
        fVar151 = auVar17._12_4_;
        fVar152 = auVar17._16_4_;
        fVar153 = auVar17._20_4_;
        fVar154 = auVar17._24_4_;
        fVar178 = auVar22._0_4_;
        fVar274 = auVar22._4_4_;
        fVar191 = auVar22._8_4_;
        fVar208 = auVar22._12_4_;
        fVar210 = auVar22._16_4_;
        fVar175 = auVar22._20_4_;
        fVar177 = auVar22._24_4_;
        fVar179 = -auVar22._28_4_;
        fVar227 = auVar198._0_4_;
        fVar309 = auVar198._4_4_;
        fVar311 = auVar198._8_4_;
        fVar271 = auVar198._12_4_;
        fVar272 = auVar198._16_4_;
        fVar273 = auVar198._20_4_;
        fVar155 = auVar198._24_4_;
        auVar137._0_4_ = fVar227 * fVar227 + fVar146 * fVar146;
        auVar137._4_4_ = fVar309 * fVar309 + fVar148 * fVar148;
        auVar137._8_4_ = fVar311 * fVar311 + fVar150 * fVar150;
        auVar137._12_4_ = fVar271 * fVar271 + fVar151 * fVar151;
        auVar137._16_4_ = fVar272 * fVar272 + fVar152 * fVar152;
        auVar137._20_4_ = fVar273 * fVar273 + fVar153 * fVar153;
        auVar137._24_4_ = fVar155 * fVar155 + fVar154 * fVar154;
        auVar137._28_4_ = auVar289._28_4_ + auVar17._28_4_;
        auVar17 = vrsqrtps_avx(auVar137);
        fVar203 = auVar17._0_4_;
        fVar242 = auVar17._4_4_;
        auVar28._4_4_ = fVar242 * 1.5;
        auVar28._0_4_ = fVar203 * 1.5;
        fVar253 = auVar17._8_4_;
        auVar28._8_4_ = fVar253 * 1.5;
        fVar318 = auVar17._12_4_;
        auVar28._12_4_ = fVar318 * 1.5;
        fVar310 = auVar17._16_4_;
        auVar28._16_4_ = fVar310 * 1.5;
        fVar204 = auVar17._20_4_;
        auVar28._20_4_ = fVar204 * 1.5;
        fVar319 = auVar17._24_4_;
        fVar131 = auVar30._28_4_;
        auVar28._24_4_ = fVar319 * 1.5;
        auVar28._28_4_ = fVar131;
        auVar29._4_4_ = fVar242 * fVar242 * fVar242 * auVar137._4_4_ * 0.5;
        auVar29._0_4_ = fVar203 * fVar203 * fVar203 * auVar137._0_4_ * 0.5;
        auVar29._8_4_ = fVar253 * fVar253 * fVar253 * auVar137._8_4_ * 0.5;
        auVar29._12_4_ = fVar318 * fVar318 * fVar318 * auVar137._12_4_ * 0.5;
        auVar29._16_4_ = fVar310 * fVar310 * fVar310 * auVar137._16_4_ * 0.5;
        auVar29._20_4_ = fVar204 * fVar204 * fVar204 * auVar137._20_4_ * 0.5;
        auVar29._24_4_ = fVar319 * fVar319 * fVar319 * auVar137._24_4_ * 0.5;
        auVar29._28_4_ = auVar137._28_4_;
        auVar30 = vsubps_avx(auVar28,auVar29);
        fVar203 = auVar30._0_4_;
        fVar318 = auVar30._4_4_;
        fVar319 = auVar30._8_4_;
        fVar281 = auVar30._12_4_;
        fVar283 = auVar30._16_4_;
        fVar213 = auVar30._20_4_;
        fVar156 = auVar30._24_4_;
        fVar242 = auVar21._0_4_;
        fVar310 = auVar21._4_4_;
        fVar176 = auVar21._8_4_;
        fVar282 = auVar21._12_4_;
        fVar284 = auVar21._16_4_;
        fVar285 = auVar21._20_4_;
        fVar173 = auVar21._24_4_;
        auVar138._0_4_ = fVar242 * fVar242 + fVar178 * fVar178;
        auVar138._4_4_ = fVar310 * fVar310 + fVar274 * fVar274;
        auVar138._8_4_ = fVar176 * fVar176 + fVar191 * fVar191;
        auVar138._12_4_ = fVar282 * fVar282 + fVar208 * fVar208;
        auVar138._16_4_ = fVar284 * fVar284 + fVar210 * fVar210;
        auVar138._20_4_ = fVar285 * fVar285 + fVar175 * fVar175;
        auVar138._24_4_ = fVar173 * fVar173 + fVar177 * fVar177;
        auVar138._28_4_ = auVar22._28_4_ + auVar30._28_4_;
        auVar22 = vrsqrtps_avx(auVar138);
        fVar253 = auVar22._0_4_;
        fVar204 = auVar22._4_4_;
        auVar23._4_4_ = fVar204 * 1.5;
        auVar23._0_4_ = fVar253 * 1.5;
        fVar206 = auVar22._8_4_;
        auVar23._8_4_ = fVar206 * 1.5;
        fVar209 = auVar22._12_4_;
        auVar23._12_4_ = fVar209 * 1.5;
        fVar211 = auVar22._16_4_;
        auVar23._16_4_ = fVar211 * 1.5;
        fVar212 = auVar22._20_4_;
        auVar23._20_4_ = fVar212 * 1.5;
        fVar174 = auVar22._24_4_;
        auVar23._24_4_ = fVar174 * 1.5;
        auVar23._28_4_ = fVar131;
        auVar24._4_4_ = fVar204 * fVar204 * fVar204 * auVar138._4_4_ * 0.5;
        auVar24._0_4_ = fVar253 * fVar253 * fVar253 * auVar138._0_4_ * 0.5;
        auVar24._8_4_ = fVar206 * fVar206 * fVar206 * auVar138._8_4_ * 0.5;
        auVar24._12_4_ = fVar209 * fVar209 * fVar209 * auVar138._12_4_ * 0.5;
        auVar24._16_4_ = fVar211 * fVar211 * fVar211 * auVar138._16_4_ * 0.5;
        auVar24._20_4_ = fVar212 * fVar212 * fVar212 * auVar138._20_4_ * 0.5;
        auVar24._24_4_ = fVar174 * fVar174 * fVar174 * auVar138._24_4_ * 0.5;
        auVar24._28_4_ = auVar138._28_4_;
        auVar22 = vsubps_avx(auVar23,auVar24);
        fVar253 = auVar22._0_4_;
        fVar204 = auVar22._4_4_;
        fVar206 = auVar22._8_4_;
        fVar209 = auVar22._12_4_;
        fVar211 = auVar22._16_4_;
        fVar212 = auVar22._20_4_;
        fVar174 = auVar22._24_4_;
        fVar227 = (float)local_840._0_4_ * fVar227 * fVar203;
        fVar309 = (float)local_840._4_4_ * fVar309 * fVar318;
        auVar25._4_4_ = fVar309;
        auVar25._0_4_ = fVar227;
        fVar311 = fStack_838 * fVar311 * fVar319;
        auVar25._8_4_ = fVar311;
        fVar271 = fStack_834 * fVar271 * fVar281;
        auVar25._12_4_ = fVar271;
        fVar272 = fStack_830 * fVar272 * fVar283;
        auVar25._16_4_ = fVar272;
        fVar273 = fStack_82c * fVar273 * fVar213;
        auVar25._20_4_ = fVar273;
        fVar155 = fStack_828 * fVar155 * fVar156;
        auVar25._24_4_ = fVar155;
        auVar25._28_4_ = fVar179;
        local_700._4_4_ = auVar313._4_4_ + fVar309;
        local_700._0_4_ = auVar313._0_4_ + fVar227;
        fStack_6f8 = auVar313._8_4_ + fVar311;
        fStack_6f4 = auVar313._12_4_ + fVar271;
        fStack_6f0 = auVar313._16_4_ + fVar272;
        fStack_6ec = auVar313._20_4_ + fVar273;
        fStack_6e8 = auVar313._24_4_ + fVar155;
        fStack_6e4 = auVar313._28_4_ + fVar179;
        fVar227 = (float)local_840._0_4_ * fVar203 * -fVar146;
        fVar309 = (float)local_840._4_4_ * fVar318 * -fVar148;
        auVar26._4_4_ = fVar309;
        auVar26._0_4_ = fVar227;
        fVar311 = fStack_838 * fVar319 * -fVar150;
        auVar26._8_4_ = fVar311;
        fVar271 = fStack_834 * fVar281 * -fVar151;
        auVar26._12_4_ = fVar271;
        fVar272 = fStack_830 * fVar283 * -fVar152;
        auVar26._16_4_ = fVar272;
        fVar273 = fStack_82c * fVar213 * -fVar153;
        auVar26._20_4_ = fVar273;
        fVar155 = fStack_828 * fVar156 * -fVar154;
        auVar26._24_4_ = fVar155;
        auVar26._28_4_ = fVar131;
        local_5e0._4_4_ = fVar309 + auVar278._4_4_;
        local_5e0._0_4_ = fVar227 + auVar278._0_4_;
        fStack_5d8 = fVar311 + auVar278._8_4_;
        fStack_5d4 = fVar271 + auVar278._12_4_;
        fStack_5d0 = fVar272 + auVar278._16_4_;
        fStack_5cc = fVar273 + auVar278._20_4_;
        fStack_5c8 = fVar155 + auVar278._24_4_;
        fStack_5c4 = fVar131 + 0.0;
        fVar227 = fVar203 * 0.0 * (float)local_840._0_4_;
        fVar203 = fVar318 * 0.0 * (float)local_840._4_4_;
        auVar27._4_4_ = fVar203;
        auVar27._0_4_ = fVar227;
        fVar309 = fVar319 * 0.0 * fStack_838;
        auVar27._8_4_ = fVar309;
        fVar318 = fVar281 * 0.0 * fStack_834;
        auVar27._12_4_ = fVar318;
        fVar311 = fVar283 * 0.0 * fStack_830;
        auVar27._16_4_ = fVar311;
        fVar319 = fVar213 * 0.0 * fStack_82c;
        auVar27._20_4_ = fVar319;
        fVar271 = fVar156 * 0.0 * fStack_828;
        auVar27._24_4_ = fVar271;
        auVar27._28_4_ = fVar327;
        auVar116._4_4_ = fVar259;
        auVar116._0_4_ = fVar226;
        auVar116._8_4_ = fVar147;
        auVar116._12_4_ = fVar149;
        auVar116._16_4_ = fStack_5b0;
        auVar116._20_4_ = fStack_5ac;
        auVar116._24_4_ = fStack_5a8;
        auVar116._28_4_ = fStack_5a4;
        auVar249._0_4_ = fVar227 + fVar226;
        auVar249._4_4_ = fVar203 + fVar259;
        auVar249._8_4_ = fVar309 + fVar147;
        auVar249._12_4_ = fVar318 + fVar149;
        auVar249._16_4_ = fVar311 + fStack_5b0;
        auVar249._20_4_ = fVar319 + fStack_5ac;
        auVar249._24_4_ = fVar271 + fStack_5a8;
        auVar249._28_4_ = fVar327 + fStack_5a4;
        fVar227 = auVar233._0_4_ * fVar242 * fVar253;
        fVar203 = auVar233._4_4_ * fVar310 * fVar204;
        auVar31._4_4_ = fVar203;
        auVar31._0_4_ = fVar227;
        fVar242 = auVar233._8_4_ * fVar176 * fVar206;
        auVar31._8_4_ = fVar242;
        fVar309 = auVar233._12_4_ * fVar282 * fVar209;
        auVar31._12_4_ = fVar309;
        fVar318 = auVar233._16_4_ * fVar284 * fVar211;
        auVar31._16_4_ = fVar318;
        fVar310 = auVar233._20_4_ * fVar285 * fVar212;
        auVar31._20_4_ = fVar310;
        fVar311 = auVar233._24_4_ * fVar173 * fVar174;
        auVar31._24_4_ = fVar311;
        auVar31._28_4_ = auVar21._28_4_;
        auVar313 = vsubps_avx(auVar313,auVar25);
        auVar290._0_4_ = auVar218._0_4_ + fVar227;
        auVar290._4_4_ = auVar218._4_4_ + fVar203;
        auVar290._8_4_ = auVar218._8_4_ + fVar242;
        auVar290._12_4_ = auVar218._12_4_ + fVar309;
        auVar290._16_4_ = auVar218._16_4_ + fVar318;
        auVar290._20_4_ = auVar218._20_4_ + fVar310;
        auVar290._24_4_ = auVar218._24_4_ + fVar311;
        auVar290._28_4_ = auVar218._28_4_ + auVar21._28_4_;
        fVar227 = auVar233._0_4_ * fVar253 * -fVar178;
        fVar203 = auVar233._4_4_ * fVar204 * -fVar274;
        auVar21._4_4_ = fVar203;
        auVar21._0_4_ = fVar227;
        fVar242 = auVar233._8_4_ * fVar206 * -fVar191;
        auVar21._8_4_ = fVar242;
        fVar309 = auVar233._12_4_ * fVar209 * -fVar208;
        auVar21._12_4_ = fVar309;
        fVar318 = auVar233._16_4_ * fVar211 * -fVar210;
        auVar21._16_4_ = fVar318;
        fVar310 = auVar233._20_4_ * fVar212 * -fVar175;
        auVar21._20_4_ = fVar310;
        fVar311 = auVar233._24_4_ * fVar174 * -fVar177;
        auVar21._24_4_ = fVar311;
        auVar21._28_4_ = fVar298;
        auVar28 = vsubps_avx(auVar278,auVar26);
        auVar300._0_4_ = fVar227 + auVar197._0_4_;
        auVar300._4_4_ = fVar203 + auVar197._4_4_;
        auVar300._8_4_ = fVar242 + auVar197._8_4_;
        auVar300._12_4_ = fVar309 + auVar197._12_4_;
        auVar300._16_4_ = fVar318 + auVar197._16_4_;
        auVar300._20_4_ = fVar310 + auVar197._20_4_;
        auVar300._24_4_ = fVar311 + auVar197._24_4_;
        auVar300._28_4_ = fVar298 + auVar197._28_4_;
        fVar227 = auVar233._0_4_ * fVar253 * 0.0;
        fVar203 = auVar233._4_4_ * fVar204 * 0.0;
        auVar32._4_4_ = fVar203;
        auVar32._0_4_ = fVar227;
        fVar242 = auVar233._8_4_ * fVar206 * 0.0;
        auVar32._8_4_ = fVar242;
        fVar253 = auVar233._12_4_ * fVar209 * 0.0;
        auVar32._12_4_ = fVar253;
        fVar309 = auVar233._16_4_ * fVar211 * 0.0;
        auVar32._16_4_ = fVar309;
        fVar318 = auVar233._20_4_ * fVar212 * 0.0;
        auVar32._20_4_ = fVar318;
        fVar310 = auVar233._24_4_ * fVar174 * 0.0;
        auVar32._24_4_ = fVar310;
        auVar32._28_4_ = 0x3f000000;
        auVar23 = vsubps_avx(auVar116,auVar27);
        auVar329._0_4_ = fVar227 + (float)local_240._0_4_;
        auVar329._4_4_ = fVar203 + (float)local_240._4_4_;
        auVar329._8_4_ = fVar242 + fStack_238;
        auVar329._12_4_ = fVar253 + fStack_234;
        auVar329._16_4_ = fVar309 + fStack_230;
        auVar329._20_4_ = fVar318 + fStack_22c;
        auVar329._24_4_ = fVar310 + fStack_228;
        auVar329._28_4_ = fStack_224 + 0.5;
        auVar22 = vsubps_avx(auVar218,auVar31);
        auVar21 = vsubps_avx(auVar197,auVar21);
        auVar24 = vsubps_avx(_local_240,auVar32);
        auVar30 = vsubps_avx(auVar300,auVar28);
        auVar17 = vsubps_avx(auVar329,auVar23);
        auVar33._4_4_ = auVar23._4_4_ * auVar30._4_4_;
        auVar33._0_4_ = auVar23._0_4_ * auVar30._0_4_;
        auVar33._8_4_ = auVar23._8_4_ * auVar30._8_4_;
        auVar33._12_4_ = auVar23._12_4_ * auVar30._12_4_;
        auVar33._16_4_ = auVar23._16_4_ * auVar30._16_4_;
        auVar33._20_4_ = auVar23._20_4_ * auVar30._20_4_;
        auVar33._24_4_ = auVar23._24_4_ * auVar30._24_4_;
        auVar33._28_4_ = fVar258;
        auVar34._4_4_ = auVar28._4_4_ * auVar17._4_4_;
        auVar34._0_4_ = auVar28._0_4_ * auVar17._0_4_;
        auVar34._8_4_ = auVar28._8_4_ * auVar17._8_4_;
        auVar34._12_4_ = auVar28._12_4_ * auVar17._12_4_;
        auVar34._16_4_ = auVar28._16_4_ * auVar17._16_4_;
        auVar34._20_4_ = auVar28._20_4_ * auVar17._20_4_;
        auVar34._24_4_ = auVar28._24_4_ * auVar17._24_4_;
        auVar34._28_4_ = auVar197._28_4_;
        auVar198 = vsubps_avx(auVar34,auVar33);
        auVar35._4_4_ = auVar313._4_4_ * auVar17._4_4_;
        auVar35._0_4_ = auVar313._0_4_ * auVar17._0_4_;
        auVar35._8_4_ = auVar313._8_4_ * auVar17._8_4_;
        auVar35._12_4_ = auVar313._12_4_ * auVar17._12_4_;
        auVar35._16_4_ = auVar313._16_4_ * auVar17._16_4_;
        auVar35._20_4_ = auVar313._20_4_ * auVar17._20_4_;
        auVar35._24_4_ = auVar313._24_4_ * auVar17._24_4_;
        auVar35._28_4_ = auVar17._28_4_;
        auVar278 = vsubps_avx(auVar290,auVar313);
        auVar36._4_4_ = auVar23._4_4_ * auVar278._4_4_;
        auVar36._0_4_ = auVar23._0_4_ * auVar278._0_4_;
        auVar36._8_4_ = auVar23._8_4_ * auVar278._8_4_;
        auVar36._12_4_ = auVar23._12_4_ * auVar278._12_4_;
        auVar36._16_4_ = auVar23._16_4_ * auVar278._16_4_;
        auVar36._20_4_ = auVar23._20_4_ * auVar278._20_4_;
        auVar36._24_4_ = auVar23._24_4_ * auVar278._24_4_;
        auVar36._28_4_ = auVar218._28_4_;
        auVar29 = vsubps_avx(auVar36,auVar35);
        auVar37._4_4_ = auVar278._4_4_ * auVar28._4_4_;
        auVar37._0_4_ = auVar278._0_4_ * auVar28._0_4_;
        auVar37._8_4_ = auVar278._8_4_ * auVar28._8_4_;
        auVar37._12_4_ = auVar278._12_4_ * auVar28._12_4_;
        auVar37._16_4_ = auVar278._16_4_ * auVar28._16_4_;
        auVar37._20_4_ = auVar278._20_4_ * auVar28._20_4_;
        auVar37._24_4_ = auVar278._24_4_ * auVar28._24_4_;
        auVar37._28_4_ = auVar17._28_4_;
        auVar38._4_4_ = auVar313._4_4_ * auVar30._4_4_;
        auVar38._0_4_ = auVar313._0_4_ * auVar30._0_4_;
        auVar38._8_4_ = auVar313._8_4_ * auVar30._8_4_;
        auVar38._12_4_ = auVar313._12_4_ * auVar30._12_4_;
        auVar38._16_4_ = auVar313._16_4_ * auVar30._16_4_;
        auVar38._20_4_ = auVar313._20_4_ * auVar30._20_4_;
        auVar38._24_4_ = auVar313._24_4_ * auVar30._24_4_;
        auVar38._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar38,auVar37);
        auVar139._0_4_ = auVar198._0_4_ * 0.0 + auVar30._0_4_ + auVar29._0_4_ * 0.0;
        auVar139._4_4_ = auVar198._4_4_ * 0.0 + auVar30._4_4_ + auVar29._4_4_ * 0.0;
        auVar139._8_4_ = auVar198._8_4_ * 0.0 + auVar30._8_4_ + auVar29._8_4_ * 0.0;
        auVar139._12_4_ = auVar198._12_4_ * 0.0 + auVar30._12_4_ + auVar29._12_4_ * 0.0;
        auVar139._16_4_ = auVar198._16_4_ * 0.0 + auVar30._16_4_ + auVar29._16_4_ * 0.0;
        auVar139._20_4_ = auVar198._20_4_ * 0.0 + auVar30._20_4_ + auVar29._20_4_ * 0.0;
        auVar139._24_4_ = auVar198._24_4_ * 0.0 + auVar30._24_4_ + auVar29._24_4_ * 0.0;
        auVar139._28_4_ = auVar30._28_4_ + auVar30._28_4_ + auVar29._28_4_;
        auVar29 = vcmpps_avx(auVar139,ZEXT432(0) << 0x20,2);
        auVar22 = vblendvps_avx(auVar22,_local_700,auVar29);
        auVar21 = vblendvps_avx(auVar21,_local_5e0,auVar29);
        auVar30 = vblendvps_avx(auVar24,auVar249,auVar29);
        auVar17 = vblendvps_avx(auVar313,auVar290,auVar29);
        auVar198 = vblendvps_avx(auVar28,auVar300,auVar29);
        auVar278 = vblendvps_avx(auVar23,auVar329,auVar29);
        auVar313 = vblendvps_avx(auVar290,auVar313,auVar29);
        auVar28 = vblendvps_avx(auVar300,auVar28,auVar29);
        _local_7a0 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
        auStack_790 = auVar18._16_16_;
        auVar18 = vblendvps_avx(auVar329,auVar23,auVar29);
        auVar313 = vsubps_avx(auVar313,auVar22);
        auVar23 = vsubps_avx(auVar28,auVar21);
        auVar25 = vsubps_avx(auVar18,auVar30);
        auVar18 = vsubps_avx(auVar21,auVar198);
        fVar227 = auVar23._0_4_;
        fVar154 = auVar30._0_4_;
        fVar318 = auVar23._4_4_;
        fVar226 = auVar30._4_4_;
        auVar39._4_4_ = fVar226 * fVar318;
        auVar39._0_4_ = fVar154 * fVar227;
        fVar176 = auVar23._8_4_;
        fVar259 = auVar30._8_4_;
        auVar39._8_4_ = fVar259 * fVar176;
        fVar209 = auVar23._12_4_;
        fVar147 = auVar30._12_4_;
        auVar39._12_4_ = fVar147 * fVar209;
        fVar273 = auVar23._16_4_;
        fVar149 = auVar30._16_4_;
        auVar39._16_4_ = fVar149 * fVar273;
        fVar156 = auVar23._20_4_;
        fVar178 = auVar30._20_4_;
        auVar39._20_4_ = fVar178 * fVar156;
        fVar148 = auVar23._24_4_;
        fVar274 = auVar30._24_4_;
        auVar39._24_4_ = fVar274 * fVar148;
        auVar39._28_4_ = auVar28._28_4_;
        fVar203 = auVar21._0_4_;
        fVar214 = auVar25._0_4_;
        fVar310 = auVar21._4_4_;
        fVar223 = auVar25._4_4_;
        auVar40._4_4_ = fVar223 * fVar310;
        auVar40._0_4_ = fVar214 * fVar203;
        fVar206 = auVar21._8_4_;
        fVar224 = auVar25._8_4_;
        auVar40._8_4_ = fVar224 * fVar206;
        fVar272 = auVar21._12_4_;
        fVar225 = auVar25._12_4_;
        auVar40._12_4_ = fVar225 * fVar272;
        fVar213 = auVar21._16_4_;
        fVar228 = auVar25._16_4_;
        auVar40._16_4_ = fVar228 * fVar213;
        fVar173 = auVar21._20_4_;
        fVar239 = auVar25._20_4_;
        auVar40._20_4_ = fVar239 * fVar173;
        fVar150 = auVar21._24_4_;
        fVar241 = auVar25._24_4_;
        uVar8 = auVar24._28_4_;
        auVar40._24_4_ = fVar241 * fVar150;
        auVar40._28_4_ = uVar8;
        auVar28 = vsubps_avx(auVar40,auVar39);
        fVar242 = auVar22._0_4_;
        fVar204 = auVar22._4_4_;
        auVar41._4_4_ = fVar223 * fVar204;
        auVar41._0_4_ = fVar214 * fVar242;
        fVar271 = auVar22._8_4_;
        auVar41._8_4_ = fVar224 * fVar271;
        fVar283 = auVar22._12_4_;
        auVar41._12_4_ = fVar225 * fVar283;
        fVar285 = auVar22._16_4_;
        auVar41._16_4_ = fVar228 * fVar285;
        fVar174 = auVar22._20_4_;
        auVar41._20_4_ = fVar239 * fVar174;
        fVar151 = auVar22._24_4_;
        auVar41._24_4_ = fVar241 * fVar151;
        auVar41._28_4_ = uVar8;
        fVar253 = auVar313._0_4_;
        fVar311 = auVar313._4_4_;
        auVar42._4_4_ = fVar226 * fVar311;
        auVar42._0_4_ = fVar154 * fVar253;
        fVar281 = auVar313._8_4_;
        auVar42._8_4_ = fVar259 * fVar281;
        fVar284 = auVar313._12_4_;
        auVar42._12_4_ = fVar147 * fVar284;
        fVar212 = auVar313._16_4_;
        auVar42._16_4_ = fVar149 * fVar212;
        fVar131 = auVar313._20_4_;
        auVar42._20_4_ = fVar178 * fVar131;
        fVar152 = auVar313._24_4_;
        auVar42._24_4_ = fVar274 * fVar152;
        auVar42._28_4_ = auVar329._28_4_;
        auVar24 = vsubps_avx(auVar42,auVar41);
        auVar43._4_4_ = fVar310 * fVar311;
        auVar43._0_4_ = fVar203 * fVar253;
        auVar43._8_4_ = fVar206 * fVar281;
        auVar43._12_4_ = fVar272 * fVar284;
        auVar43._16_4_ = fVar213 * fVar212;
        auVar43._20_4_ = fVar173 * fVar131;
        auVar43._24_4_ = fVar150 * fVar152;
        auVar43._28_4_ = uVar8;
        auVar335._0_4_ = fVar242 * fVar227;
        auVar335._4_4_ = fVar204 * fVar318;
        auVar335._8_4_ = fVar271 * fVar176;
        auVar335._12_4_ = fVar283 * fVar209;
        auVar335._16_4_ = fVar285 * fVar273;
        auVar335._20_4_ = fVar174 * fVar156;
        auVar335._24_4_ = fVar151 * fVar148;
        auVar335._28_4_ = 0;
        auVar26 = vsubps_avx(auVar335,auVar43);
        auVar27 = vsubps_avx(auVar30,auVar278);
        fVar309 = auVar26._28_4_ + auVar24._28_4_;
        auVar163._0_4_ = auVar26._0_4_ + auVar24._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
        auVar163._4_4_ = auVar26._4_4_ + auVar24._4_4_ * 0.0 + auVar28._4_4_ * 0.0;
        auVar163._8_4_ = auVar26._8_4_ + auVar24._8_4_ * 0.0 + auVar28._8_4_ * 0.0;
        auVar163._12_4_ = auVar26._12_4_ + auVar24._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
        auVar163._16_4_ = auVar26._16_4_ + auVar24._16_4_ * 0.0 + auVar28._16_4_ * 0.0;
        auVar163._20_4_ = auVar26._20_4_ + auVar24._20_4_ * 0.0 + auVar28._20_4_ * 0.0;
        auVar163._24_4_ = auVar26._24_4_ + auVar24._24_4_ * 0.0 + auVar28._24_4_ * 0.0;
        auVar163._28_4_ = fVar309 + auVar28._28_4_;
        fVar191 = auVar18._0_4_;
        fVar208 = auVar18._4_4_;
        auVar44._4_4_ = fVar208 * auVar278._4_4_;
        auVar44._0_4_ = fVar191 * auVar278._0_4_;
        fVar210 = auVar18._8_4_;
        auVar44._8_4_ = fVar210 * auVar278._8_4_;
        fVar175 = auVar18._12_4_;
        auVar44._12_4_ = fVar175 * auVar278._12_4_;
        fVar177 = auVar18._16_4_;
        auVar44._16_4_ = fVar177 * auVar278._16_4_;
        fVar179 = auVar18._20_4_;
        auVar44._20_4_ = fVar179 * auVar278._20_4_;
        fVar260 = auVar18._24_4_;
        auVar44._24_4_ = fVar260 * auVar278._24_4_;
        auVar44._28_4_ = fVar309;
        fVar309 = auVar27._0_4_;
        fVar319 = auVar27._4_4_;
        auVar45._4_4_ = auVar198._4_4_ * fVar319;
        auVar45._0_4_ = auVar198._0_4_ * fVar309;
        fVar282 = auVar27._8_4_;
        auVar45._8_4_ = auVar198._8_4_ * fVar282;
        fVar211 = auVar27._12_4_;
        auVar45._12_4_ = auVar198._12_4_ * fVar211;
        fVar155 = auVar27._16_4_;
        auVar45._16_4_ = auVar198._16_4_ * fVar155;
        fVar146 = auVar27._20_4_;
        auVar45._20_4_ = auVar198._20_4_ * fVar146;
        fVar153 = auVar27._24_4_;
        auVar45._24_4_ = auVar198._24_4_ * fVar153;
        auVar45._28_4_ = auVar26._28_4_;
        auVar18 = vsubps_avx(auVar45,auVar44);
        auVar24 = vsubps_avx(auVar22,auVar17);
        fVar243 = auVar24._0_4_;
        fVar245 = auVar24._4_4_;
        auVar46._4_4_ = fVar245 * auVar278._4_4_;
        auVar46._0_4_ = fVar243 * auVar278._0_4_;
        fVar254 = auVar24._8_4_;
        auVar46._8_4_ = fVar254 * auVar278._8_4_;
        fVar256 = auVar24._12_4_;
        auVar46._12_4_ = fVar256 * auVar278._12_4_;
        fVar258 = auVar24._16_4_;
        auVar46._16_4_ = fVar258 * auVar278._16_4_;
        fVar261 = auVar24._20_4_;
        auVar46._20_4_ = fVar261 * auVar278._20_4_;
        fVar268 = auVar24._24_4_;
        auVar46._24_4_ = fVar268 * auVar278._24_4_;
        auVar46._28_4_ = auVar278._28_4_;
        auVar47._4_4_ = auVar17._4_4_ * fVar319;
        auVar47._0_4_ = auVar17._0_4_ * fVar309;
        auVar47._8_4_ = auVar17._8_4_ * fVar282;
        auVar47._12_4_ = auVar17._12_4_ * fVar211;
        auVar47._16_4_ = auVar17._16_4_ * fVar155;
        auVar47._20_4_ = auVar17._20_4_ * fVar146;
        auVar47._24_4_ = auVar17._24_4_ * fVar153;
        auVar47._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar46,auVar47);
        auVar48._4_4_ = auVar198._4_4_ * fVar245;
        auVar48._0_4_ = auVar198._0_4_ * fVar243;
        auVar48._8_4_ = auVar198._8_4_ * fVar254;
        auVar48._12_4_ = auVar198._12_4_ * fVar256;
        auVar48._16_4_ = auVar198._16_4_ * fVar258;
        auVar48._20_4_ = auVar198._20_4_ * fVar261;
        auVar48._24_4_ = auVar198._24_4_ * fVar268;
        auVar48._28_4_ = auVar278._28_4_;
        auVar49._4_4_ = auVar17._4_4_ * fVar208;
        auVar49._0_4_ = auVar17._0_4_ * fVar191;
        auVar49._8_4_ = auVar17._8_4_ * fVar210;
        auVar49._12_4_ = auVar17._12_4_ * fVar175;
        auVar49._16_4_ = auVar17._16_4_ * fVar177;
        auVar49._20_4_ = auVar17._20_4_ * fVar179;
        auVar49._24_4_ = auVar17._24_4_ * fVar260;
        auVar49._28_4_ = auVar17._28_4_;
        auVar17 = vsubps_avx(auVar49,auVar48);
        auVar308 = ZEXT864(0) << 0x20;
        auVar220._0_4_ = auVar18._0_4_ * 0.0 + auVar17._0_4_ + auVar28._0_4_ * 0.0;
        auVar220._4_4_ = auVar18._4_4_ * 0.0 + auVar17._4_4_ + auVar28._4_4_ * 0.0;
        auVar220._8_4_ = auVar18._8_4_ * 0.0 + auVar17._8_4_ + auVar28._8_4_ * 0.0;
        auVar220._12_4_ = auVar18._12_4_ * 0.0 + auVar17._12_4_ + auVar28._12_4_ * 0.0;
        auVar220._16_4_ = auVar18._16_4_ * 0.0 + auVar17._16_4_ + auVar28._16_4_ * 0.0;
        auVar220._20_4_ = auVar18._20_4_ * 0.0 + auVar17._20_4_ + auVar28._20_4_ * 0.0;
        auVar220._24_4_ = auVar18._24_4_ * 0.0 + auVar17._24_4_ + auVar28._24_4_ * 0.0;
        auVar220._28_4_ = auVar17._28_4_ + auVar17._28_4_ + auVar28._28_4_;
        auVar18 = vmaxps_avx(auVar163,auVar220);
        auVar18 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,2);
        auVar232 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
        auVar232 = vpand_avx(auVar232,_local_7a0);
        auVar186 = vpmovsxwd_avx(auVar232);
        auVar195 = vpunpckhwd_avx(auVar232,auVar232);
        auVar199._16_16_ = auVar195;
        auVar199._0_16_ = auVar186;
        if ((((((((auVar199 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar199 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar199 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar199 >> 0x7f,0) == '\0') &&
              (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar195 >> 0x3f,0) == '\0') &&
            (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar195[0xf]) {
LAB_00fac1cb:
          auVar280 = ZEXT3264(auVar277);
          auVar267 = ZEXT3264(auVar164);
          auVar145 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar202 = ZEXT3264(auVar199);
        }
        else {
          auVar50._4_4_ = fVar319 * fVar318;
          auVar50._0_4_ = fVar309 * fVar227;
          auVar50._8_4_ = fVar282 * fVar176;
          auVar50._12_4_ = fVar211 * fVar209;
          auVar50._16_4_ = fVar155 * fVar273;
          auVar50._20_4_ = fVar146 * fVar156;
          auVar50._24_4_ = fVar153 * fVar148;
          auVar50._28_4_ = auVar195._12_4_;
          auVar314._0_4_ = fVar191 * fVar214;
          auVar314._4_4_ = fVar208 * fVar223;
          auVar314._8_4_ = fVar210 * fVar224;
          auVar314._12_4_ = fVar175 * fVar225;
          auVar314._16_4_ = fVar177 * fVar228;
          auVar314._20_4_ = fVar179 * fVar239;
          auVar314._24_4_ = fVar260 * fVar241;
          auVar314._28_4_ = 0;
          auVar18 = vsubps_avx(auVar314,auVar50);
          auVar51._4_4_ = fVar245 * fVar223;
          auVar51._0_4_ = fVar243 * fVar214;
          auVar51._8_4_ = fVar254 * fVar224;
          auVar51._12_4_ = fVar256 * fVar225;
          auVar51._16_4_ = fVar258 * fVar228;
          auVar51._20_4_ = fVar261 * fVar239;
          auVar51._24_4_ = fVar268 * fVar241;
          auVar51._28_4_ = auVar25._28_4_;
          auVar52._4_4_ = fVar319 * fVar311;
          auVar52._0_4_ = fVar309 * fVar253;
          auVar52._8_4_ = fVar282 * fVar281;
          auVar52._12_4_ = fVar211 * fVar284;
          auVar52._16_4_ = fVar155 * fVar212;
          auVar52._20_4_ = fVar146 * fVar131;
          auVar52._24_4_ = fVar153 * fVar152;
          auVar52._28_4_ = auVar27._28_4_;
          auVar198 = vsubps_avx(auVar52,auVar51);
          auVar53._4_4_ = fVar208 * fVar311;
          auVar53._0_4_ = fVar191 * fVar253;
          auVar53._8_4_ = fVar210 * fVar281;
          auVar53._12_4_ = fVar175 * fVar284;
          auVar53._16_4_ = fVar177 * fVar212;
          auVar53._20_4_ = fVar179 * fVar131;
          auVar53._24_4_ = fVar260 * fVar152;
          auVar53._28_4_ = auVar163._28_4_;
          auVar54._4_4_ = fVar245 * fVar318;
          auVar54._0_4_ = fVar243 * fVar227;
          auVar54._8_4_ = fVar254 * fVar176;
          auVar54._12_4_ = fVar256 * fVar209;
          auVar54._16_4_ = fVar258 * fVar273;
          auVar54._20_4_ = fVar261 * fVar156;
          auVar54._24_4_ = fVar268 * fVar148;
          auVar54._28_4_ = auVar23._28_4_;
          auVar278 = vsubps_avx(auVar54,auVar53);
          auVar266._0_4_ = auVar18._0_4_ * 0.0 + auVar278._0_4_ + auVar198._0_4_ * 0.0;
          auVar266._4_4_ = auVar18._4_4_ * 0.0 + auVar278._4_4_ + auVar198._4_4_ * 0.0;
          auVar266._8_4_ = auVar18._8_4_ * 0.0 + auVar278._8_4_ + auVar198._8_4_ * 0.0;
          auVar266._12_4_ = auVar18._12_4_ * 0.0 + auVar278._12_4_ + auVar198._12_4_ * 0.0;
          auVar266._16_4_ = auVar18._16_4_ * 0.0 + auVar278._16_4_ + auVar198._16_4_ * 0.0;
          auVar266._20_4_ = auVar18._20_4_ * 0.0 + auVar278._20_4_ + auVar198._20_4_ * 0.0;
          auVar266._24_4_ = auVar18._24_4_ * 0.0 + auVar278._24_4_ + auVar198._24_4_ * 0.0;
          auVar266._28_4_ = auVar23._28_4_ + auVar278._28_4_ + auVar163._28_4_;
          auVar17 = vrcpps_avx(auVar266);
          fVar227 = auVar17._0_4_;
          fVar253 = auVar17._4_4_;
          auVar55._4_4_ = auVar266._4_4_ * fVar253;
          auVar55._0_4_ = auVar266._0_4_ * fVar227;
          fVar309 = auVar17._8_4_;
          auVar55._8_4_ = auVar266._8_4_ * fVar309;
          fVar318 = auVar17._12_4_;
          auVar55._12_4_ = auVar266._12_4_ * fVar318;
          fVar311 = auVar17._16_4_;
          auVar55._16_4_ = auVar266._16_4_ * fVar311;
          fVar319 = auVar17._20_4_;
          auVar55._20_4_ = auVar266._20_4_ * fVar319;
          fVar176 = auVar17._24_4_;
          auVar55._24_4_ = auVar266._24_4_ * fVar176;
          auVar55._28_4_ = auVar27._28_4_;
          auVar315._8_4_ = 0x3f800000;
          auVar315._0_8_ = &DAT_3f8000003f800000;
          auVar315._12_4_ = 0x3f800000;
          auVar315._16_4_ = 0x3f800000;
          auVar315._20_4_ = 0x3f800000;
          auVar315._24_4_ = 0x3f800000;
          auVar315._28_4_ = 0x3f800000;
          auVar28 = vsubps_avx(auVar315,auVar55);
          fVar227 = auVar28._0_4_ * fVar227 + fVar227;
          fVar253 = auVar28._4_4_ * fVar253 + fVar253;
          fVar309 = auVar28._8_4_ * fVar309 + fVar309;
          fVar318 = auVar28._12_4_ * fVar318 + fVar318;
          fVar311 = auVar28._16_4_ * fVar311 + fVar311;
          fVar319 = auVar28._20_4_ * fVar319 + fVar319;
          fVar176 = auVar28._24_4_ * fVar176 + fVar176;
          auVar56._4_4_ =
               (auVar18._4_4_ * fVar204 + auVar198._4_4_ * fVar310 + auVar278._4_4_ * fVar226) *
               fVar253;
          auVar56._0_4_ =
               (auVar18._0_4_ * fVar242 + auVar198._0_4_ * fVar203 + auVar278._0_4_ * fVar154) *
               fVar227;
          auVar56._8_4_ =
               (auVar18._8_4_ * fVar271 + auVar198._8_4_ * fVar206 + auVar278._8_4_ * fVar259) *
               fVar309;
          auVar56._12_4_ =
               (auVar18._12_4_ * fVar283 + auVar198._12_4_ * fVar272 + auVar278._12_4_ * fVar147) *
               fVar318;
          auVar56._16_4_ =
               (auVar18._16_4_ * fVar285 + auVar198._16_4_ * fVar213 + auVar278._16_4_ * fVar149) *
               fVar311;
          auVar56._20_4_ =
               (auVar18._20_4_ * fVar174 + auVar198._20_4_ * fVar173 + auVar278._20_4_ * fVar178) *
               fVar319;
          auVar56._24_4_ =
               (auVar18._24_4_ * fVar151 + auVar198._24_4_ * fVar150 + auVar278._24_4_ * fVar274) *
               fVar176;
          auVar56._28_4_ = auVar22._28_4_ + auVar313._28_4_ + auVar30._28_4_;
          auVar186 = vpermilps_avx(ZEXT416(uVar127),0);
          auVar200._16_16_ = auVar186;
          auVar200._0_16_ = auVar186;
          auVar18 = vcmpps_avx(auVar200,auVar56,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar234._4_4_ = uVar8;
          auVar234._0_4_ = uVar8;
          auVar234._8_4_ = uVar8;
          auVar234._12_4_ = uVar8;
          auVar234._16_4_ = uVar8;
          auVar234._20_4_ = uVar8;
          auVar234._24_4_ = uVar8;
          auVar234._28_4_ = uVar8;
          auVar30 = vcmpps_avx(auVar56,auVar234,2);
          auVar18 = vandps_avx(auVar30,auVar18);
          auVar186 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
          auVar232 = vpand_avx(auVar232,auVar186);
          auVar186 = vpmovsxwd_avx(auVar232);
          auVar195 = vpshufd_avx(auVar232,0xee);
          auVar195 = vpmovsxwd_avx(auVar195);
          auVar199._16_16_ = auVar195;
          auVar199._0_16_ = auVar186;
          if ((((((((auVar199 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar199 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar199 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar199 >> 0x7f,0) == '\0') &&
                (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar195 >> 0x3f,0) == '\0') &&
              (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar195[0xf]) goto LAB_00fac1cb;
          auVar18 = vcmpps_avx(ZEXT832(0) << 0x20,auVar266,4);
          auVar186 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
          auVar232 = vpand_avx(auVar232,auVar186);
          auVar186 = vpmovsxwd_avx(auVar232);
          auVar232 = vpunpckhwd_avx(auVar232,auVar232);
          auVar202 = ZEXT1664(auVar232);
          auVar250._16_16_ = auVar232;
          auVar250._0_16_ = auVar186;
          auVar145 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar267 = ZEXT3264(auVar164);
          auVar280 = ZEXT3264(auVar277);
          if ((((((((auVar250 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar250 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar250 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar250 >> 0x7f,0) != '\0') ||
                (auVar250 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar232 >> 0x3f,0) != '\0') ||
              (auVar250 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar232[0xf] < '\0') {
            auVar201._0_4_ = auVar163._0_4_ * fVar227;
            auVar201._4_4_ = auVar163._4_4_ * fVar253;
            auVar201._8_4_ = auVar163._8_4_ * fVar309;
            auVar201._12_4_ = auVar163._12_4_ * fVar318;
            auVar201._16_4_ = auVar163._16_4_ * fVar311;
            auVar201._20_4_ = auVar163._20_4_ * fVar319;
            auVar201._24_4_ = auVar163._24_4_ * fVar176;
            auVar201._28_4_ = 0;
            auVar277._4_4_ = auVar220._4_4_ * fVar253;
            auVar277._0_4_ = auVar220._0_4_ * fVar227;
            auVar277._8_4_ = auVar220._8_4_ * fVar309;
            auVar277._12_4_ = auVar220._12_4_ * fVar318;
            auVar277._16_4_ = auVar220._16_4_ * fVar311;
            auVar277._20_4_ = auVar220._20_4_ * fVar319;
            auVar277._24_4_ = auVar220._24_4_ * fVar176;
            auVar277._28_4_ = auVar28._28_4_ + auVar17._28_4_;
            auVar235._8_4_ = 0x3f800000;
            auVar235._0_8_ = &DAT_3f8000003f800000;
            auVar235._12_4_ = 0x3f800000;
            auVar235._16_4_ = 0x3f800000;
            auVar235._20_4_ = 0x3f800000;
            auVar235._24_4_ = 0x3f800000;
            auVar235._28_4_ = 0x3f800000;
            auVar164 = vsubps_avx(auVar235,auVar201);
            auVar164 = vblendvps_avx(auVar164,auVar201,auVar29);
            auVar267 = ZEXT3264(auVar164);
            auVar164 = vsubps_avx(auVar235,auVar277);
            auVar202 = ZEXT3264(auVar164);
            _local_280 = vblendvps_avx(auVar164,auVar277,auVar29);
            auVar145 = ZEXT3264(auVar250);
            auVar280 = ZEXT3264(auVar56);
          }
        }
        auVar164 = auVar145._0_32_;
        if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0x7f,0) != '\0') ||
              (auVar145 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar164 >> 0xbf,0) != '\0') ||
            (auVar145 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar145[0x1f] < '\0') {
          auVar277 = vsubps_avx(auVar233,_local_840);
          local_660 = auVar267._0_32_;
          local_840._0_4_ = (float)local_840._0_4_ + auVar277._0_4_ * auVar267._0_4_;
          local_840._4_4_ = (float)local_840._4_4_ + auVar277._4_4_ * auVar267._4_4_;
          fStack_838 = fStack_838 + auVar277._8_4_ * auVar267._8_4_;
          fStack_834 = fStack_834 + auVar277._12_4_ * auVar267._12_4_;
          fStack_830 = fStack_830 + auVar277._16_4_ * auVar267._16_4_;
          fStack_82c = fStack_82c + auVar277._20_4_ * auVar267._20_4_;
          fStack_828 = fStack_828 + auVar277._24_4_ * auVar267._24_4_;
          fStack_824 = fStack_824 + auVar277._28_4_;
          fVar227 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar57._4_4_ = ((float)local_840._4_4_ + (float)local_840._4_4_) * fVar227;
          auVar57._0_4_ = ((float)local_840._0_4_ + (float)local_840._0_4_) * fVar227;
          auVar57._8_4_ = (fStack_838 + fStack_838) * fVar227;
          auVar57._12_4_ = (fStack_834 + fStack_834) * fVar227;
          auVar57._16_4_ = (fStack_830 + fStack_830) * fVar227;
          auVar57._20_4_ = (fStack_82c + fStack_82c) * fVar227;
          auVar57._24_4_ = (fStack_828 + fStack_828) * fVar227;
          auVar57._28_4_ = fStack_824 + fStack_824;
          local_680 = auVar280._0_32_;
          auVar277 = vcmpps_avx(local_680,auVar57,6);
          auVar18 = auVar164 & auVar277;
          if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0x7f,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0xbf,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar18[0x1f] < '\0') {
            local_300 = vandps_avx(auVar277,auVar164);
            local_280._0_4_ = (float)local_280._0_4_ + (float)local_280._0_4_ + -1.0;
            local_280._4_4_ = (float)local_280._4_4_ + (float)local_280._4_4_ + -1.0;
            uStack_278._0_4_ = (float)uStack_278 + (float)uStack_278 + -1.0;
            uStack_278._4_4_ = uStack_278._4_4_ + uStack_278._4_4_ + -1.0;
            uStack_270._0_4_ = (float)uStack_270 + (float)uStack_270 + -1.0;
            uStack_270._4_4_ = uStack_270._4_4_ + uStack_270._4_4_ + -1.0;
            uStack_268._0_4_ = (float)uStack_268 + (float)uStack_268 + -1.0;
            uStack_268._4_4_ = uStack_268._4_4_ + uStack_268._4_4_ + -1.0;
            local_3c0 = local_660;
            auVar124 = _local_280;
            auVar164 = _local_280;
            local_3a0 = (float)local_280._0_4_;
            fStack_39c = (float)local_280._4_4_;
            fStack_398 = (float)uStack_278;
            fStack_394 = uStack_278._4_4_;
            fStack_390 = (float)uStack_270;
            fStack_38c = uStack_270._4_4_;
            fStack_388 = (float)uStack_268;
            fStack_384 = uStack_268._4_4_;
            local_380 = local_680;
            local_360 = 0;
            local_35c = uVar11;
            local_350 = local_880;
            uStack_348 = uStack_878;
            local_340 = (float)local_800._0_4_;
            fStack_33c = (float)local_800._4_4_;
            fStack_338 = fStack_7f8;
            fStack_334 = fStack_7f4;
            local_330 = local_630;
            uStack_328 = local_630._8_8_;
            local_320 = local_640;
            uStack_318 = local_640._8_8_;
            _local_280 = auVar164;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar184._0_4_ = 1.0 / (float)(int)uVar11;
              auVar184._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar232 = vshufps_avx(auVar184,auVar184,0);
              local_2e0[0] = auVar232._0_4_ * (auVar267._0_4_ + 0.0);
              local_2e0[1] = auVar232._4_4_ * (auVar267._4_4_ + 1.0);
              local_2e0[2] = auVar232._8_4_ * (auVar267._8_4_ + 2.0);
              local_2e0[3] = auVar232._12_4_ * (auVar267._12_4_ + 3.0);
              fStack_2d0 = auVar232._0_4_ * (auVar267._16_4_ + 4.0);
              fStack_2cc = auVar232._4_4_ * (auVar267._20_4_ + 5.0);
              fStack_2c8 = auVar232._8_4_ * (auVar267._24_4_ + 6.0);
              fStack_2c4 = auVar267._28_4_ + 7.0;
              uStack_270 = auVar124._16_8_;
              uStack_268 = auVar164._24_8_;
              local_2c0 = local_280;
              uStack_2b8 = uStack_278;
              uStack_2b0 = uStack_270;
              uStack_2a8 = uStack_268;
              local_2a0 = local_680;
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar164 = vblendvps_avx(auVar164,local_680,local_300);
              auVar277 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar277 = vminps_avx(auVar164,auVar277);
              auVar18 = vshufpd_avx(auVar277,auVar277,5);
              auVar277 = vminps_avx(auVar277,auVar18);
              auVar18 = vperm2f128_avx(auVar277,auVar277,1);
              auVar277 = vminps_avx(auVar277,auVar18);
              auVar277 = vcmpps_avx(auVar164,auVar277,0);
              auVar18 = local_300 & auVar277;
              auVar164 = local_300;
              if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar18 >> 0x7f,0) != '\0') ||
                    (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0xbf,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar18[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar277,local_300);
              }
              uVar126 = vmovmskps_avx(auVar164);
              uVar15 = 0;
              if (uVar126 != 0) {
                for (; (uVar126 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar128 = (ulong)uVar15;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar227 = local_2e0[uVar128];
                uVar8 = *(undefined4 *)((long)&local_2c0 + uVar128 * 4);
                fVar242 = 1.0 - fVar227;
                fVar203 = fVar227 * fVar242 * 4.0;
                auVar232 = ZEXT416((uint)(fVar227 * fVar227 * 0.5));
                auVar232 = vshufps_avx(auVar232,auVar232,0);
                auVar186 = ZEXT416((uint)((fVar242 * fVar242 + fVar203) * 0.5));
                auVar186 = vshufps_avx(auVar186,auVar186,0);
                auVar195 = ZEXT416((uint)((-fVar227 * fVar227 - fVar203) * 0.5));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar196 = ZEXT416((uint)(fVar242 * -fVar242 * 0.5));
                auVar196 = vshufps_avx(auVar196,auVar196,0);
                auVar185._0_4_ =
                     auVar196._0_4_ * fVar192 +
                     (float)local_800._0_4_ * auVar195._0_4_ +
                     (float)local_640._0_4_ * auVar232._0_4_ +
                     (float)local_630._0_4_ * auVar186._0_4_;
                auVar185._4_4_ =
                     auVar196._4_4_ * fVar238 +
                     (float)local_800._4_4_ * auVar195._4_4_ +
                     (float)local_640._4_4_ * auVar232._4_4_ +
                     (float)local_630._4_4_ * auVar186._4_4_;
                auVar185._8_4_ =
                     auVar196._8_4_ * fVar240 +
                     fStack_7f8 * auVar195._8_4_ +
                     (float)uStack_638 * auVar232._8_4_ + (float)uStack_628 * auVar186._8_4_;
                auVar185._12_4_ =
                     auVar196._12_4_ * fVar205 +
                     fStack_7f4 * auVar195._12_4_ +
                     uStack_638._4_4_ * auVar232._12_4_ + uStack_628._4_4_ * auVar186._12_4_;
                auVar202 = ZEXT464(*(uint *)(local_2a0 + uVar128 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_2a0 + uVar128 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar185._0_4_;
                uVar12 = vextractps_avx(auVar185,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar12;
                uVar12 = vextractps_avx(auVar185,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar12;
                *(float *)(ray + k * 4 + 0xf0) = fVar227;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                *(uint *)(ray + k * 4 + 0x110) = uVar10;
                *(uint *)(ray + k * 4 + 0x120) = uVar125;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_760 = vshufps_avx(ZEXT416(uVar125),ZEXT416(uVar125),0);
                auStack_750 = auVar233._16_16_;
                _local_6c0 = vshufps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0);
                auStack_6b0 = auVar22._16_16_;
                _auStack_7b0 = auVar21._16_16_;
                _local_7c0 = _local_800;
                _auStack_6d0 = auVar218._16_16_;
                _local_6e0 = _local_630;
                _auStack_590 = auVar197._16_16_;
                _local_5a0 = _local_640;
                local_5c0 = (float)*(undefined8 *)*local_768;
                fStack_5bc = (float)((ulong)*(undefined8 *)*local_768 >> 0x20);
                fStack_5b8 = (float)*(undefined8 *)(*local_768 + 8);
                fStack_5b4 = (float)((ulong)*(undefined8 *)(*local_768 + 8) >> 0x20);
                local_580 = local_300;
                _local_200 = auVar144;
                do {
                  local_7a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_420 = local_2e0[uVar128];
                  uVar8 = *(undefined4 *)((long)&local_2c0 + uVar128 * 4);
                  auVar161._4_4_ = uVar8;
                  auVar161._0_4_ = uVar8;
                  auVar161._8_4_ = uVar8;
                  auVar161._12_4_ = uVar8;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar128 * 4);
                  fVar203 = 1.0 - local_420;
                  fVar227 = local_420 * fVar203 * 4.0;
                  auVar232 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                  auVar232 = vshufps_avx(auVar232,auVar232,0);
                  auVar186 = ZEXT416((uint)((fVar203 * fVar203 + fVar227) * 0.5));
                  auVar186 = vshufps_avx(auVar186,auVar186,0);
                  auVar195 = ZEXT416((uint)((-local_420 * local_420 - fVar227) * 0.5));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  local_7f0.context = context->user;
                  auVar196 = ZEXT416((uint)(fVar203 * -fVar203 * 0.5));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  auVar189._0_4_ =
                       auVar196._0_4_ * fVar192 +
                       auVar195._0_4_ * (float)local_7c0._0_4_ +
                       auVar232._0_4_ * (float)local_5a0._0_4_ +
                       auVar186._0_4_ * (float)local_6e0._0_4_;
                  auVar189._4_4_ =
                       auVar196._4_4_ * fVar238 +
                       auVar195._4_4_ * (float)local_7c0._4_4_ +
                       auVar232._4_4_ * (float)local_5a0._4_4_ +
                       auVar186._4_4_ * (float)local_6e0._4_4_;
                  auVar189._8_4_ =
                       auVar196._8_4_ * fVar240 +
                       auVar195._8_4_ * (float)uStack_7b8 +
                       auVar232._8_4_ * fStack_598 + auVar186._8_4_ * fStack_6d8;
                  auVar189._12_4_ =
                       auVar196._12_4_ * fVar205 +
                       auVar195._12_4_ * uStack_7b8._4_4_ +
                       auVar232._12_4_ * fStack_594 + auVar186._12_4_ * fStack_6d4;
                  auVar232 = vshufps_avx(auVar189,auVar189,0);
                  local_450[0] = (RTCHitN)auVar232[0];
                  local_450[1] = (RTCHitN)auVar232[1];
                  local_450[2] = (RTCHitN)auVar232[2];
                  local_450[3] = (RTCHitN)auVar232[3];
                  local_450[4] = (RTCHitN)auVar232[4];
                  local_450[5] = (RTCHitN)auVar232[5];
                  local_450[6] = (RTCHitN)auVar232[6];
                  local_450[7] = (RTCHitN)auVar232[7];
                  local_450[8] = (RTCHitN)auVar232[8];
                  local_450[9] = (RTCHitN)auVar232[9];
                  local_450[10] = (RTCHitN)auVar232[10];
                  local_450[0xb] = (RTCHitN)auVar232[0xb];
                  local_450[0xc] = (RTCHitN)auVar232[0xc];
                  local_450[0xd] = (RTCHitN)auVar232[0xd];
                  local_450[0xe] = (RTCHitN)auVar232[0xe];
                  local_450[0xf] = (RTCHitN)auVar232[0xf];
                  local_440 = vshufps_avx(auVar189,auVar189,0x55);
                  auVar202 = ZEXT1664(local_440);
                  local_430 = vshufps_avx(auVar189,auVar189,0xaa);
                  fStack_41c = local_420;
                  fStack_418 = local_420;
                  fStack_414 = local_420;
                  local_410 = auVar161;
                  local_400 = local_6c0;
                  uStack_3f8 = uStack_6b8;
                  local_3f0 = local_760;
                  uStack_3e8 = uStack_758;
                  vcmpps_avx(auVar308._0_32_,auVar308._0_32_,0xf);
                  uStack_3dc = (local_7f0.context)->instID[0];
                  local_3e0 = uStack_3dc;
                  uStack_3d8 = uStack_3dc;
                  uStack_3d4 = uStack_3dc;
                  uStack_3d0 = (local_7f0.context)->instPrimID[0];
                  uStack_3cc = uStack_3d0;
                  uStack_3c8 = uStack_3d0;
                  uStack_3c4 = uStack_3d0;
                  local_810 = CONCAT44(fStack_5bc,local_5c0);
                  uStack_808 = CONCAT44(fStack_5b4,fStack_5b8);
                  local_7f0.valid = (int *)&local_810;
                  local_7f0.geometryUserPtr = pGVar13->userPtr;
                  local_7f0.hit = local_450;
                  local_7f0.N = 4;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar202 = ZEXT1664(local_440);
                    (*pGVar13->intersectionFilterN)(&local_7f0);
                    auVar267._8_56_ = extraout_var;
                    auVar267._0_8_ = extraout_XMM1_Qa;
                    auVar161 = auVar267._0_16_;
                    auVar280 = ZEXT3264(local_680);
                    auVar267 = ZEXT3264(local_660);
                    auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar114._8_8_ = uStack_808;
                  auVar114._0_8_ = local_810;
                  if (auVar114 == (undefined1  [16])0x0) {
                    auVar232 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar186 = vpcmpeqd_avx(auVar161,auVar161);
                    auVar232 = auVar232 ^ auVar186;
                  }
                  else {
                    p_Var14 = context->args->filter;
                    auVar232 = vpcmpeqd_avx(auVar202._0_16_,auVar202._0_16_);
                    auVar202 = ZEXT1664(auVar232);
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_7f0);
                      auVar280 = ZEXT3264(local_680);
                      auVar267 = ZEXT3264(local_660);
                      auVar232 = vpcmpeqd_avx(auVar232,auVar232);
                      auVar202 = ZEXT1664(auVar232);
                      auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar115._8_8_ = uStack_808;
                    auVar115._0_8_ = local_810;
                    auVar186 = vpcmpeqd_avx(auVar115,_DAT_01feba10);
                    auVar232 = auVar186 ^ auVar202._0_16_;
                    if (auVar115 != (undefined1  [16])0x0) {
                      auVar186 = auVar186 ^ auVar202._0_16_;
                      auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])local_7f0.hit);
                      *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar195;
                      auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x10));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar195;
                      auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x20));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar195;
                      auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x30));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar195;
                      auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x40));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar195;
                      auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x50));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar195;
                      auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x60));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar195;
                      auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x70));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar195;
                      auVar186 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar186;
                    }
                  }
                  auVar162._8_8_ = 0x100000001;
                  auVar162._0_8_ = 0x100000001;
                  if ((auVar162 & auVar232) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_7a0._0_4_;
                  }
                  *(undefined4 *)(local_580 + uVar128 * 4) = 0;
                  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar144._4_4_ = uVar8;
                  auVar144._0_4_ = uVar8;
                  auVar144._8_4_ = uVar8;
                  auVar144._12_4_ = uVar8;
                  auVar144._16_4_ = uVar8;
                  auVar144._20_4_ = uVar8;
                  auVar144._24_4_ = uVar8;
                  auVar144._28_4_ = uVar8;
                  auVar277 = vcmpps_avx(auVar280._0_32_,auVar144,2);
                  auVar164 = vandps_avx(auVar277,local_580);
                  local_580 = local_580 & auVar277;
                  bVar107 = (local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar108 = (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar106 = (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar105 = SUB321(local_580 >> 0x7f,0) != '\0';
                  bVar104 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar103 = SUB321(local_580 >> 0xbf,0) != '\0';
                  bVar102 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar101 = local_580[0x1f] < '\0';
                  if (((((((bVar107 || bVar108) || bVar106) || bVar105) || bVar104) || bVar103) ||
                      bVar102) || bVar101) {
                    auVar172._8_4_ = 0x7f800000;
                    auVar172._0_8_ = 0x7f8000007f800000;
                    auVar172._12_4_ = 0x7f800000;
                    auVar172._16_4_ = 0x7f800000;
                    auVar172._20_4_ = 0x7f800000;
                    auVar172._24_4_ = 0x7f800000;
                    auVar172._28_4_ = 0x7f800000;
                    auVar277 = vblendvps_avx(auVar172,auVar280._0_32_,auVar164);
                    auVar18 = vshufps_avx(auVar277,auVar277,0xb1);
                    auVar18 = vminps_avx(auVar277,auVar18);
                    auVar22 = vshufpd_avx(auVar18,auVar18,5);
                    auVar18 = vminps_avx(auVar18,auVar22);
                    auVar22 = vperm2f128_avx(auVar18,auVar18,1);
                    auVar202 = ZEXT3264(auVar22);
                    auVar18 = vminps_avx(auVar18,auVar22);
                    auVar18 = vcmpps_avx(auVar277,auVar18,0);
                    auVar22 = auVar164 & auVar18;
                    auVar277 = auVar164;
                    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar22 >> 0x7f,0) != '\0') ||
                          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar22 >> 0xbf,0) != '\0') ||
                        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar22[0x1f] < '\0') {
                      auVar277 = vandps_avx(auVar18,auVar164);
                    }
                    uVar126 = vmovmskps_avx(auVar277);
                    uVar15 = 0;
                    if (uVar126 != 0) {
                      for (; (uVar126 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    uVar128 = (ulong)uVar15;
                  }
                  local_580 = auVar164;
                } while (((((((bVar107 || bVar108) || bVar106) || bVar105) || bVar104) || bVar103)
                         || bVar102) || bVar101);
              }
            }
          }
          fVar334 = (float)local_720._0_4_;
          fVar338 = (float)local_720._4_4_;
          fVar339 = fStack_718;
          fVar340 = fStack_714;
          fVar207 = fStack_710;
          fVar244 = fStack_70c;
          fVar255 = fStack_708;
          fVar257 = fStack_704;
        }
      }
      auVar308 = ZEXT3264(local_600);
      if (8 < (int)uVar11) {
        auVar232 = vpshufd_avx(ZEXT416(uVar11),0);
        local_520 = auVar232._0_4_;
        fStack_51c = auVar232._4_4_;
        fStack_518 = auVar232._8_4_;
        fStack_514 = auVar232._12_4_;
        auVar232 = vshufps_avx(local_740._0_16_,local_740._0_16_,0);
        register0x00001210 = auVar232;
        _local_240 = auVar232;
        auVar232 = vpermilps_avx(ZEXT416(uVar127),0);
        local_260._16_16_ = auVar232;
        local_260._0_16_ = auVar232;
        auVar136._0_4_ = 1.0 / (float)local_4c0._0_4_;
        auVar136._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar232 = vshufps_avx(auVar136,auVar136,0);
        _fStack_4b0 = auVar232;
        _local_4c0 = auVar232;
        local_180 = vshufps_avx(ZEXT416(uVar125),ZEXT416(uVar125),0);
        local_190 = vshufps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0);
        auVar145 = ZEXT1664(local_190);
        lVar129 = 8;
        local_660 = auVar267._0_32_;
        local_680 = auVar280._0_32_;
        do {
          pauVar2 = (undefined1 (*) [28])(bspline_basis0 + lVar129 * 4 + lVar16);
          fVar227 = *(float *)*pauVar2;
          fVar203 = *(float *)(*pauVar2 + 4);
          fVar242 = *(float *)(*pauVar2 + 8);
          fVar253 = *(float *)(*pauVar2 + 0xc);
          fVar309 = *(float *)(*pauVar2 + 0x10);
          fVar318 = *(float *)(*pauVar2 + 0x14);
          fVar310 = *(float *)(*pauVar2 + 0x18);
          auVar121 = *pauVar2;
          pauVar3 = (undefined1 (*) [28])(lVar16 + 0x222bfac + lVar129 * 4);
          fVar204 = *(float *)*pauVar3;
          fVar311 = *(float *)(*pauVar3 + 4);
          fVar319 = *(float *)(*pauVar3 + 8);
          fVar176 = *(float *)(*pauVar3 + 0xc);
          fVar206 = *(float *)(*pauVar3 + 0x10);
          fVar271 = *(float *)(*pauVar3 + 0x14);
          fVar281 = *(float *)(*pauVar3 + 0x18);
          auVar120 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar16 + 0x222c430 + lVar129 * 4);
          fVar282 = *(float *)*pauVar3;
          fVar209 = *(float *)(*pauVar3 + 4);
          fVar272 = *(float *)(*pauVar3 + 8);
          fVar283 = *(float *)(*pauVar3 + 0xc);
          fVar284 = *(float *)(*pauVar3 + 0x10);
          fVar211 = *(float *)(*pauVar3 + 0x14);
          fVar273 = *(float *)(*pauVar3 + 0x18);
          auVar119 = *pauVar3;
          pfVar4 = (float *)(lVar16 + 0x222c8b4 + lVar129 * 4);
          local_5c0 = *pfVar4;
          fStack_5bc = pfVar4[1];
          fStack_5b8 = pfVar4[2];
          fStack_5b4 = pfVar4[3];
          fStack_5b0 = pfVar4[4];
          fStack_5ac = pfVar4[5];
          fStack_5a8 = pfVar4[6];
          fStack_5a4 = pfVar4[7];
          fVar213 = auVar202._28_4_;
          fVar147 = auVar308._0_4_;
          fVar149 = auVar308._4_4_;
          fVar178 = auVar308._8_4_;
          fVar274 = auVar308._12_4_;
          fVar191 = auVar308._16_4_;
          fVar208 = auVar308._20_4_;
          fVar210 = auVar308._24_4_;
          fVar154 = fVar213 + fVar213 + auVar145._28_4_;
          auVar336._0_4_ =
               (float)local_a0._0_4_ * fVar227 +
               (float)local_100._0_4_ * fVar204 +
               (float)local_500._0_4_ * fVar282 + (float)local_4a0._0_4_ * local_5c0;
          auVar336._4_4_ =
               (float)local_a0._4_4_ * fVar203 +
               (float)local_100._4_4_ * fVar311 +
               (float)local_500._4_4_ * fVar209 + (float)local_4a0._4_4_ * fStack_5bc;
          auVar336._8_4_ =
               fStack_98 * fVar242 +
               fStack_f8 * fVar319 + fStack_4f8 * fVar272 + fStack_498 * fStack_5b8;
          auVar336._12_4_ =
               fStack_94 * fVar253 +
               fStack_f4 * fVar176 + fStack_4f4 * fVar283 + fStack_494 * fStack_5b4;
          auVar336._16_4_ =
               fStack_90 * fVar309 +
               fStack_f0 * fVar206 + fStack_4f0 * fVar284 + fStack_490 * fStack_5b0;
          auVar336._20_4_ =
               fStack_8c * fVar318 +
               fStack_ec * fVar271 + fStack_4ec * fVar211 + fStack_48c * fStack_5ac;
          auVar336._24_4_ =
               fStack_88 * fVar310 +
               fStack_e8 * fVar281 + fStack_4e8 * fVar273 + fStack_488 * fStack_5a8;
          auVar336._28_4_ = fVar213 + fStack_5a4 + fVar154;
          local_740._0_4_ =
               (float)local_220._0_4_ * fVar204 + fVar147 * fVar282 + fVar334 * local_5c0 +
               (float)local_1e0._0_4_ * fVar227;
          local_740._4_4_ =
               (float)local_220._4_4_ * fVar311 + fVar149 * fVar209 + fVar338 * fStack_5bc +
               (float)local_1e0._4_4_ * fVar203;
          local_740._8_4_ =
               fStack_218 * fVar319 + fVar178 * fVar272 + fVar339 * fStack_5b8 +
               fStack_1d8 * fVar242;
          local_740._12_4_ =
               fStack_214 * fVar176 + fVar274 * fVar283 + fVar340 * fStack_5b4 +
               fStack_1d4 * fVar253;
          local_740._16_4_ =
               fStack_210 * fVar206 + fVar191 * fVar284 + fVar207 * fStack_5b0 +
               fStack_1d0 * fVar309;
          local_740._20_4_ =
               fStack_20c * fVar271 + fVar208 * fVar211 + fVar244 * fStack_5ac +
               fStack_1cc * fVar318;
          local_740._24_4_ =
               fStack_208 * fVar281 + fVar210 * fVar273 + fVar255 * fStack_5a8 +
               fStack_1c8 * fVar310;
          local_740._28_4_ = fVar213 + fVar213 + fVar257 + fVar154;
          fVar131 = fVar227 * (float)local_140._0_4_ +
                    (float)local_80._0_4_ * fVar204 +
                    fVar282 * (float)local_1c0._0_4_ + local_5c0 * (float)local_120._0_4_;
          fVar146 = fVar203 * (float)local_140._4_4_ +
                    (float)local_80._4_4_ * fVar311 +
                    fVar209 * (float)local_1c0._4_4_ + fStack_5bc * (float)local_120._4_4_;
          fVar148 = fVar242 * fStack_138 +
                    fStack_78 * fVar319 + fVar272 * fStack_1b8 + fStack_5b8 * fStack_118;
          fVar150 = fVar253 * fStack_134 +
                    fStack_74 * fVar176 + fVar283 * fStack_1b4 + fStack_5b4 * fStack_114;
          fVar151 = fVar309 * fStack_130 +
                    fStack_70 * fVar206 + fVar284 * fStack_1b0 + fStack_5b0 * fStack_110;
          fVar152 = fVar318 * fStack_12c +
                    fStack_6c * fVar271 + fVar211 * fStack_1ac + fStack_5ac * fStack_10c;
          fVar153 = fVar310 * fStack_128 +
                    fStack_68 * fVar281 + fVar273 * fStack_1a8 + fStack_5a8 * fStack_108;
          fVar154 = fVar154 + fVar213 + fVar213 + fStack_5a4;
          pfVar4 = (float *)(bspline_basis1 + lVar129 * 4 + lVar16);
          fVar176 = *pfVar4;
          fVar206 = pfVar4[1];
          fVar271 = pfVar4[2];
          fVar281 = pfVar4[3];
          fVar282 = pfVar4[4];
          fVar209 = pfVar4[5];
          fVar272 = pfVar4[6];
          pauVar3 = (undefined1 (*) [28])(lVar16 + 0x222e3cc + lVar129 * 4);
          fVar203 = *(float *)*pauVar3;
          fVar204 = *(float *)(*pauVar3 + 4);
          fVar319 = *(float *)(*pauVar3 + 8);
          fVar283 = *(float *)(*pauVar3 + 0xc);
          fVar284 = *(float *)(*pauVar3 + 0x10);
          fVar211 = *(float *)(*pauVar3 + 0x14);
          fVar273 = *(float *)(*pauVar3 + 0x18);
          auVar123 = *pauVar3;
          auVar164 = *(undefined1 (*) [32])(lVar16 + 0x222e850 + lVar129 * 4);
          auVar145 = ZEXT3264(auVar164);
          pauVar3 = (undefined1 (*) [28])(lVar16 + 0x222ecd4 + lVar129 * 4);
          fVar213 = *(float *)*pauVar3;
          fVar285 = *(float *)(*pauVar3 + 4);
          fVar212 = *(float *)(*pauVar3 + 8);
          fVar155 = *(float *)(*pauVar3 + 0xc);
          fVar156 = *(float *)(*pauVar3 + 0x10);
          fVar173 = *(float *)(*pauVar3 + 0x14);
          fVar174 = *(float *)(*pauVar3 + 0x18);
          auVar122 = *pauVar3;
          fVar227 = auVar164._0_4_;
          fVar242 = auVar164._4_4_;
          fVar253 = auVar164._8_4_;
          fVar309 = auVar164._12_4_;
          fVar318 = auVar164._16_4_;
          fVar310 = auVar164._20_4_;
          fVar311 = auVar164._24_4_;
          fVar259 = fVar257 + *(float *)pauVar3[1];
          fVar226 = fVar257 + fVar257 + fStack_484;
          auVar111._4_4_ = fVar146;
          auVar111._0_4_ = fVar131;
          auVar111._8_4_ = fVar148;
          auVar111._12_4_ = fVar150;
          auVar111._16_4_ = fVar151;
          auVar111._20_4_ = fVar152;
          auVar111._24_4_ = fVar153;
          auVar111._28_4_ = fVar154;
          auVar251._0_4_ =
               (float)local_a0._0_4_ * fVar176 +
               (float)local_100._0_4_ * fVar203 +
               (float)local_500._0_4_ * fVar227 + (float)local_4a0._0_4_ * fVar213;
          auVar251._4_4_ =
               (float)local_a0._4_4_ * fVar206 +
               (float)local_100._4_4_ * fVar204 +
               (float)local_500._4_4_ * fVar242 + (float)local_4a0._4_4_ * fVar285;
          auVar251._8_4_ =
               fStack_98 * fVar271 +
               fStack_f8 * fVar319 + fStack_4f8 * fVar253 + fStack_498 * fVar212;
          auVar251._12_4_ =
               fStack_94 * fVar281 +
               fStack_f4 * fVar283 + fStack_4f4 * fVar309 + fStack_494 * fVar155;
          auVar251._16_4_ =
               fStack_90 * fVar282 +
               fStack_f0 * fVar284 + fStack_4f0 * fVar318 + fStack_490 * fVar156;
          auVar251._20_4_ =
               fStack_8c * fVar209 +
               fStack_ec * fVar211 + fStack_4ec * fVar310 + fStack_48c * fVar173;
          auVar251._24_4_ =
               fStack_88 * fVar272 +
               fStack_e8 * fVar273 + fStack_4e8 * fVar311 + fStack_488 * fVar174;
          auVar251._28_4_ = fVar259 + fVar226;
          auVar236._0_4_ =
               fVar176 * (float)local_1e0._0_4_ +
               fVar203 * (float)local_220._0_4_ + fVar147 * fVar227 + fVar334 * fVar213;
          auVar236._4_4_ =
               fVar206 * (float)local_1e0._4_4_ +
               fVar204 * (float)local_220._4_4_ + fVar149 * fVar242 + fVar338 * fVar285;
          auVar236._8_4_ =
               fVar271 * fStack_1d8 + fVar319 * fStack_218 + fVar178 * fVar253 + fVar339 * fVar212;
          auVar236._12_4_ =
               fVar281 * fStack_1d4 + fVar283 * fStack_214 + fVar274 * fVar309 + fVar340 * fVar155;
          auVar236._16_4_ =
               fVar282 * fStack_1d0 + fVar284 * fStack_210 + fVar191 * fVar318 + fVar207 * fVar156;
          auVar236._20_4_ =
               fVar209 * fStack_1cc + fVar211 * fStack_20c + fVar208 * fVar310 + fVar244 * fVar173;
          auVar236._24_4_ =
               fVar272 * fStack_1c8 + fVar273 * fStack_208 + fVar210 * fVar311 + fVar255 * fVar174;
          auVar236._28_4_ = fVar226 + fVar257 + fVar257 + *(float *)pauVar2[1];
          auVar165._0_4_ =
               (float)local_80._0_4_ * fVar203 +
               fVar227 * (float)local_1c0._0_4_ + fVar213 * (float)local_120._0_4_ +
               fVar176 * (float)local_140._0_4_;
          auVar165._4_4_ =
               (float)local_80._4_4_ * fVar204 +
               fVar242 * (float)local_1c0._4_4_ + fVar285 * (float)local_120._4_4_ +
               fVar206 * (float)local_140._4_4_;
          auVar165._8_4_ =
               fStack_78 * fVar319 + fVar253 * fStack_1b8 + fVar212 * fStack_118 +
               fVar271 * fStack_138;
          auVar165._12_4_ =
               fStack_74 * fVar283 + fVar309 * fStack_1b4 + fVar155 * fStack_114 +
               fVar281 * fStack_134;
          auVar165._16_4_ =
               fStack_70 * fVar284 + fVar318 * fStack_1b0 + fVar156 * fStack_110 +
               fVar282 * fStack_130;
          auVar165._20_4_ =
               fStack_6c * fVar211 + fVar310 * fStack_1ac + fVar173 * fStack_10c +
               fVar209 * fStack_12c;
          auVar165._24_4_ =
               fStack_68 * fVar273 + fVar311 * fStack_1a8 + fVar174 * fStack_108 +
               fVar272 * fStack_128;
          auVar165._28_4_ = fVar257 + fVar259 + fVar226;
          auVar18 = vsubps_avx(auVar251,auVar336);
          auVar22 = vsubps_avx(auVar236,local_740);
          fVar283 = auVar18._0_4_;
          fVar284 = auVar18._4_4_;
          auVar58._4_4_ = fVar284 * local_740._4_4_;
          auVar58._0_4_ = fVar283 * (float)local_740._0_4_;
          fVar211 = auVar18._8_4_;
          auVar58._8_4_ = fVar211 * local_740._8_4_;
          fVar273 = auVar18._12_4_;
          auVar58._12_4_ = fVar273 * local_740._12_4_;
          fVar213 = auVar18._16_4_;
          auVar58._16_4_ = fVar213 * local_740._16_4_;
          fVar285 = auVar18._20_4_;
          auVar58._20_4_ = fVar285 * local_740._20_4_;
          fVar212 = auVar18._24_4_;
          auVar58._24_4_ = fVar212 * local_740._24_4_;
          auVar58._28_4_ = fVar226;
          fVar203 = auVar22._0_4_;
          fVar207 = auVar22._4_4_;
          auVar59._4_4_ = auVar336._4_4_ * fVar207;
          auVar59._0_4_ = auVar336._0_4_ * fVar203;
          fVar244 = auVar22._8_4_;
          auVar59._8_4_ = auVar336._8_4_ * fVar244;
          fVar255 = auVar22._12_4_;
          auVar59._12_4_ = auVar336._12_4_ * fVar255;
          fVar257 = auVar22._16_4_;
          auVar59._16_4_ = auVar336._16_4_ * fVar257;
          fVar204 = auVar22._20_4_;
          auVar59._20_4_ = auVar336._20_4_ * fVar204;
          fVar319 = auVar22._24_4_;
          auVar59._24_4_ = auVar336._24_4_ * fVar319;
          auVar59._28_4_ = auVar236._28_4_;
          auVar21 = vsubps_avx(auVar58,auVar59);
          auVar277 = vmaxps_avx(auVar111,auVar165);
          auVar60._4_4_ = auVar277._4_4_ * auVar277._4_4_ * (fVar284 * fVar284 + fVar207 * fVar207);
          auVar60._0_4_ = auVar277._0_4_ * auVar277._0_4_ * (fVar283 * fVar283 + fVar203 * fVar203);
          auVar60._8_4_ = auVar277._8_4_ * auVar277._8_4_ * (fVar211 * fVar211 + fVar244 * fVar244);
          auVar60._12_4_ =
               auVar277._12_4_ * auVar277._12_4_ * (fVar273 * fVar273 + fVar255 * fVar255);
          auVar60._16_4_ =
               auVar277._16_4_ * auVar277._16_4_ * (fVar213 * fVar213 + fVar257 * fVar257);
          auVar60._20_4_ =
               auVar277._20_4_ * auVar277._20_4_ * (fVar285 * fVar285 + fVar204 * fVar204);
          auVar60._24_4_ =
               auVar277._24_4_ * auVar277._24_4_ * (fVar212 * fVar212 + fVar319 * fVar319);
          auVar60._28_4_ = auVar251._28_4_ + auVar236._28_4_;
          auVar61._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar61._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar61._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar61._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar61._16_4_ = auVar21._16_4_ * auVar21._16_4_;
          auVar61._20_4_ = auVar21._20_4_ * auVar21._20_4_;
          auVar61._24_4_ = auVar21._24_4_ * auVar21._24_4_;
          auVar61._28_4_ = auVar21._28_4_;
          auVar277 = vcmpps_avx(auVar61,auVar60,2);
          auVar202 = ZEXT3264(auVar277);
          local_360 = (uint)lVar129;
          auVar186 = vpshufd_avx(ZEXT416(local_360),0);
          auVar232 = vpor_avx(auVar186,_DAT_01ff0cf0);
          auVar186 = vpor_avx(auVar186,_DAT_02020ea0);
          auVar117._4_4_ = fStack_51c;
          auVar117._0_4_ = local_520;
          auVar117._8_4_ = fStack_518;
          auVar117._12_4_ = fStack_514;
          auVar232 = vpcmpgtd_avx(auVar117,auVar232);
          auVar186 = vpcmpgtd_avx(auVar117,auVar186);
          register0x00001250 = auVar186;
          _local_200 = auVar232;
          auVar21 = _local_200 & auVar277;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
            auVar308 = ZEXT3264(auVar308._0_32_);
          }
          else {
            local_700._0_4_ = auVar123._0_4_;
            local_700._4_4_ = auVar123._4_4_;
            fStack_6f8 = auVar123._8_4_;
            fStack_6f4 = auVar123._12_4_;
            fStack_6f0 = auVar123._16_4_;
            fStack_6ec = auVar123._20_4_;
            fStack_6e8 = auVar123._24_4_;
            local_5e0._0_4_ = auVar122._0_4_;
            local_5e0._4_4_ = auVar122._4_4_;
            fStack_5d8 = auVar122._8_4_;
            fStack_5d4 = auVar122._12_4_;
            fStack_5d0 = auVar122._16_4_;
            fStack_5cc = auVar122._20_4_;
            fStack_5c8 = auVar122._24_4_;
            local_5e0._0_4_ =
                 fVar176 * (float)local_620._0_4_ +
                 (float)local_480._0_4_ * (float)local_700._0_4_ +
                 (float)local_c0._0_4_ * fVar227 + (float)local_6a0._0_4_ * (float)local_5e0._0_4_;
            local_5e0._4_4_ =
                 fVar206 * (float)local_620._4_4_ +
                 (float)local_480._4_4_ * (float)local_700._4_4_ +
                 (float)local_c0._4_4_ * fVar242 + (float)local_6a0._4_4_ * (float)local_5e0._4_4_;
            fStack_5d8 = fVar271 * fStack_618 +
                         fStack_478 * fStack_6f8 + fStack_b8 * fVar253 + fStack_698 * fStack_5d8;
            fStack_5d4 = fVar281 * fStack_614 +
                         fStack_474 * fStack_6f4 + fStack_b4 * fVar309 + fStack_694 * fStack_5d4;
            fStack_5d0 = fVar282 * fStack_610 +
                         fStack_470 * fStack_6f0 + fStack_b0 * fVar318 + fStack_690 * fStack_5d0;
            fStack_5cc = fVar209 * fStack_60c +
                         fStack_46c * fStack_6ec + fStack_ac * fVar310 + fStack_68c * fStack_5cc;
            fStack_5c8 = fVar272 * fStack_608 +
                         fStack_468 * fStack_6e8 + fStack_a8 * fVar311 + fStack_688 * fStack_5c8;
            fStack_5c4 = pfVar4[7] + auVar164._28_4_ + auVar186._12_4_ + 0.0;
            local_6e0._0_4_ = auVar120._0_4_;
            local_6e0._4_4_ = auVar120._4_4_;
            fStack_6d8 = auVar120._8_4_;
            fStack_6d4 = auVar120._12_4_;
            auStack_6d0._0_4_ = auVar120._16_4_;
            auStack_6d0._4_4_ = auVar120._20_4_;
            fStack_6c8 = auVar120._24_4_;
            local_5a0._0_4_ = auVar119._0_4_;
            local_5a0._4_4_ = auVar119._4_4_;
            fStack_598 = auVar119._8_4_;
            fStack_594 = auVar119._12_4_;
            auStack_590._0_4_ = auVar119._16_4_;
            auStack_590._4_4_ = auVar119._20_4_;
            fStack_588 = auVar119._24_4_;
            fVar156 = (float)local_c0._0_4_ * (float)local_5a0._0_4_;
            fVar173 = (float)local_c0._4_4_ * (float)local_5a0._4_4_;
            fVar174 = fStack_b8 * fStack_598;
            fVar226 = fStack_b4 * fStack_594;
            fVar259 = fStack_b0 * (float)auStack_590._0_4_;
            fVar175 = fStack_ac * (float)auStack_590._4_4_;
            fVar177 = fStack_a8 * fStack_588;
            pfVar4 = (float *)(lVar16 + 0x222d640 + lVar129 * 4);
            fVar227 = *pfVar4;
            fVar203 = pfVar4[1];
            fVar242 = pfVar4[2];
            fVar207 = pfVar4[3];
            fVar244 = pfVar4[4];
            fVar253 = pfVar4[5];
            fVar255 = pfVar4[6];
            pfVar5 = (float *)(lVar16 + 0x222dac4 + lVar129 * 4);
            fVar257 = *pfVar5;
            fVar309 = pfVar5[1];
            fVar318 = pfVar5[2];
            fVar310 = pfVar5[3];
            fVar204 = pfVar5[4];
            fVar311 = pfVar5[5];
            fVar319 = pfVar5[6];
            pfVar6 = (float *)(lVar16 + 0x222d1bc + lVar129 * 4);
            fVar176 = *pfVar6;
            fVar206 = pfVar6[1];
            fVar271 = pfVar6[2];
            fVar281 = pfVar6[3];
            fVar282 = pfVar6[4];
            fVar209 = pfVar6[5];
            fVar272 = pfVar6[6];
            fVar155 = pfVar4[7] + pfVar5[7];
            fVar179 = pfVar5[7] + fVar154 + 0.0;
            fVar260 = fVar154 + auVar308._28_4_ + fVar154 + 0.0;
            pfVar4 = (float *)(lVar16 + 0x222cd38 + lVar129 * 4);
            fVar283 = *pfVar4;
            fVar284 = pfVar4[1];
            fVar211 = pfVar4[2];
            fVar273 = pfVar4[3];
            fVar213 = pfVar4[4];
            fVar285 = pfVar4[5];
            fVar212 = pfVar4[6];
            local_5a0._4_4_ =
                 (float)local_a0._4_4_ * fVar284 +
                 (float)local_100._4_4_ * fVar206 +
                 (float)local_500._4_4_ * fVar203 + (float)local_4a0._4_4_ * fVar309;
            local_5a0._0_4_ =
                 (float)local_a0._0_4_ * fVar283 +
                 (float)local_100._0_4_ * fVar176 +
                 (float)local_500._0_4_ * fVar227 + (float)local_4a0._0_4_ * fVar257;
            fStack_598 = fStack_98 * fVar211 +
                         fStack_f8 * fVar271 + fStack_4f8 * fVar242 + fStack_498 * fVar318;
            fStack_594 = fStack_94 * fVar273 +
                         fStack_f4 * fVar281 + fStack_4f4 * fVar207 + fStack_494 * fVar310;
            auStack_590._0_4_ =
                 fStack_90 * fVar213 +
                 fStack_f0 * fVar282 + fStack_4f0 * fVar244 + fStack_490 * fVar204;
            auStack_590._4_4_ =
                 fStack_8c * fVar285 +
                 fStack_ec * fVar209 + fStack_4ec * fVar253 + fStack_48c * fVar311;
            fStack_588 = fStack_88 * fVar212 +
                         fStack_e8 * fVar272 + fStack_4e8 * fVar255 + fStack_488 * fVar319;
            fStack_584 = fVar155 + fVar179;
            auVar166._0_4_ =
                 fVar283 * (float)local_1e0._0_4_ +
                 fVar147 * fVar227 + (float)local_720._0_4_ * fVar257 +
                 fVar176 * (float)local_220._0_4_;
            auVar166._4_4_ =
                 fVar284 * (float)local_1e0._4_4_ +
                 fVar149 * fVar203 + (float)local_720._4_4_ * fVar309 +
                 fVar206 * (float)local_220._4_4_;
            auVar166._8_4_ =
                 fVar211 * fStack_1d8 +
                 fVar178 * fVar242 + fStack_718 * fVar318 + fVar271 * fStack_218;
            auVar166._12_4_ =
                 fVar273 * fStack_1d4 +
                 fVar274 * fVar207 + fStack_714 * fVar310 + fVar281 * fStack_214;
            auVar166._16_4_ =
                 fVar213 * fStack_1d0 +
                 fVar191 * fVar244 + fStack_710 * fVar204 + fVar282 * fStack_210;
            auVar166._20_4_ =
                 fVar285 * fStack_1cc +
                 fVar208 * fVar253 + fStack_70c * fVar311 + fVar209 * fStack_20c;
            auVar166._24_4_ =
                 fVar212 * fStack_1c8 +
                 fVar210 * fVar255 + fStack_708 * fVar319 + fVar272 * fStack_208;
            auVar166._28_4_ = fVar179 + fVar260;
            auVar323._0_4_ =
                 fVar176 * (float)local_480._0_4_ +
                 (float)local_c0._0_4_ * fVar227 + (float)local_6a0._0_4_ * fVar257 +
                 fVar283 * (float)local_620._0_4_;
            auVar323._4_4_ =
                 fVar206 * (float)local_480._4_4_ +
                 (float)local_c0._4_4_ * fVar203 + (float)local_6a0._4_4_ * fVar309 +
                 fVar284 * (float)local_620._4_4_;
            auVar323._8_4_ =
                 fVar271 * fStack_478 + fStack_b8 * fVar242 + fStack_698 * fVar318 +
                 fVar211 * fStack_618;
            auVar323._12_4_ =
                 fVar281 * fStack_474 + fStack_b4 * fVar207 + fStack_694 * fVar310 +
                 fVar273 * fStack_614;
            auVar323._16_4_ =
                 fVar282 * fStack_470 + fStack_b0 * fVar244 + fStack_690 * fVar204 +
                 fVar213 * fStack_610;
            auVar323._20_4_ =
                 fVar209 * fStack_46c + fStack_ac * fVar253 + fStack_68c * fVar311 +
                 fVar285 * fStack_60c;
            auVar323._24_4_ =
                 fVar272 * fStack_468 + fStack_a8 * fVar255 + fStack_688 * fVar319 +
                 fVar212 * fStack_608;
            auVar323._28_4_ = pfVar6[7] + fVar155 + fVar260;
            pfVar4 = (float *)(lVar16 + 0x222fa60 + lVar129 * 4);
            fVar227 = *pfVar4;
            fVar203 = pfVar4[1];
            fVar242 = pfVar4[2];
            fVar207 = pfVar4[3];
            fVar244 = pfVar4[4];
            fVar253 = pfVar4[5];
            fVar255 = pfVar4[6];
            pfVar5 = (float *)(lVar16 + 0x222fee4 + lVar129 * 4);
            fVar257 = *pfVar5;
            fVar309 = pfVar5[1];
            fVar318 = pfVar5[2];
            fVar310 = pfVar5[3];
            fVar204 = pfVar5[4];
            fVar311 = pfVar5[5];
            fVar319 = pfVar5[6];
            pfVar6 = (float *)(lVar16 + 0x222f5dc + lVar129 * 4);
            fVar176 = *pfVar6;
            fVar206 = pfVar6[1];
            fVar271 = pfVar6[2];
            fVar281 = pfVar6[3];
            fVar282 = pfVar6[4];
            fVar209 = pfVar6[5];
            fVar272 = pfVar6[6];
            pfVar7 = (float *)(lVar16 + 0x222f158 + lVar129 * 4);
            fVar283 = *pfVar7;
            fVar284 = pfVar7[1];
            fVar211 = pfVar7[2];
            fVar273 = pfVar7[3];
            fVar213 = pfVar7[4];
            fVar285 = pfVar7[5];
            fVar212 = pfVar7[6];
            auVar291._0_4_ =
                 (float)local_a0._0_4_ * fVar283 +
                 (float)local_100._0_4_ * fVar176 +
                 (float)local_500._0_4_ * fVar227 + (float)local_4a0._0_4_ * fVar257;
            auVar291._4_4_ =
                 (float)local_a0._4_4_ * fVar284 +
                 (float)local_100._4_4_ * fVar206 +
                 (float)local_500._4_4_ * fVar203 + (float)local_4a0._4_4_ * fVar309;
            auVar291._8_4_ =
                 fStack_98 * fVar211 +
                 fStack_f8 * fVar271 + fStack_4f8 * fVar242 + fStack_498 * fVar318;
            auVar291._12_4_ =
                 fStack_94 * fVar273 +
                 fStack_f4 * fVar281 + fStack_4f4 * fVar207 + fStack_494 * fVar310;
            auVar291._16_4_ =
                 fStack_90 * fVar213 +
                 fStack_f0 * fVar282 + fStack_4f0 * fVar244 + fStack_490 * fVar204;
            auVar291._20_4_ =
                 fStack_8c * fVar285 +
                 fStack_ec * fVar209 + fStack_4ec * fVar253 + fStack_48c * fVar311;
            auVar291._24_4_ =
                 fStack_88 * fVar212 +
                 fStack_e8 * fVar272 + fStack_4e8 * fVar255 + fStack_488 * fVar319;
            auVar291._28_4_ = fStack_84 + fStack_84 + fStack_484 + fStack_84;
            auVar316._0_4_ =
                 fVar283 * (float)local_1e0._0_4_ +
                 fVar176 * (float)local_220._0_4_ +
                 fVar147 * fVar227 + (float)local_720._0_4_ * fVar257;
            auVar316._4_4_ =
                 fVar284 * (float)local_1e0._4_4_ +
                 fVar206 * (float)local_220._4_4_ +
                 fVar149 * fVar203 + (float)local_720._4_4_ * fVar309;
            auVar316._8_4_ =
                 fVar211 * fStack_1d8 +
                 fVar271 * fStack_218 + fVar178 * fVar242 + fStack_718 * fVar318;
            auVar316._12_4_ =
                 fVar273 * fStack_1d4 +
                 fVar281 * fStack_214 + fVar274 * fVar207 + fStack_714 * fVar310;
            auVar316._16_4_ =
                 fVar213 * fStack_1d0 +
                 fVar282 * fStack_210 + fVar191 * fVar244 + fStack_710 * fVar204;
            auVar316._20_4_ =
                 fVar285 * fStack_1cc +
                 fVar209 * fStack_20c + fVar208 * fVar253 + fStack_70c * fVar311;
            auVar316._24_4_ =
                 fVar212 * fStack_1c8 +
                 fVar272 * fStack_208 + fVar210 * fVar255 + fStack_708 * fVar319;
            auVar316._28_4_ = fStack_84 + fStack_84 + fStack_704 + fStack_84;
            auVar237._8_4_ = 0x7fffffff;
            auVar237._0_8_ = 0x7fffffff7fffffff;
            auVar237._12_4_ = 0x7fffffff;
            auVar237._16_4_ = 0x7fffffff;
            auVar237._20_4_ = 0x7fffffff;
            auVar237._24_4_ = 0x7fffffff;
            auVar237._28_4_ = 0x7fffffff;
            auVar164 = vandps_avx(_local_5a0,auVar237);
            auVar21 = vandps_avx(auVar166,auVar237);
            auVar21 = vmaxps_avx(auVar164,auVar21);
            auVar164 = vandps_avx(auVar323,auVar237);
            auVar21 = vmaxps_avx(auVar21,auVar164);
            auVar21 = vcmpps_avx(auVar21,_local_240,1);
            auVar30 = vblendvps_avx(_local_5a0,auVar18,auVar21);
            auVar140._0_4_ =
                 fVar283 * (float)local_620._0_4_ +
                 fVar176 * (float)local_480._0_4_ +
                 fVar257 * (float)local_6a0._0_4_ + (float)local_c0._0_4_ * fVar227;
            auVar140._4_4_ =
                 fVar284 * (float)local_620._4_4_ +
                 fVar206 * (float)local_480._4_4_ +
                 fVar309 * (float)local_6a0._4_4_ + (float)local_c0._4_4_ * fVar203;
            auVar140._8_4_ =
                 fVar211 * fStack_618 +
                 fVar271 * fStack_478 + fVar318 * fStack_698 + fStack_b8 * fVar242;
            auVar140._12_4_ =
                 fVar273 * fStack_614 +
                 fVar281 * fStack_474 + fVar310 * fStack_694 + fStack_b4 * fVar207;
            auVar140._16_4_ =
                 fVar213 * fStack_610 +
                 fVar282 * fStack_470 + fVar204 * fStack_690 + fStack_b0 * fVar244;
            auVar140._20_4_ =
                 fVar285 * fStack_60c +
                 fVar209 * fStack_46c + fVar311 * fStack_68c + fStack_ac * fVar253;
            auVar140._24_4_ =
                 fVar212 * fStack_608 +
                 fVar272 * fStack_468 + fVar319 * fStack_688 + fStack_a8 * fVar255;
            auVar140._28_4_ = auVar164._28_4_ + pfVar6[7] + pfVar5[7] + pfVar4[7];
            auVar17 = vblendvps_avx(auVar166,auVar22,auVar21);
            auVar164 = vandps_avx(auVar291,auVar237);
            auVar21 = vandps_avx(auVar316,auVar237);
            auVar144 = vmaxps_avx(auVar164,auVar21);
            auVar164 = vandps_avx(auVar140,auVar237);
            auVar164 = vmaxps_avx(auVar144,auVar164);
            local_7c0._0_4_ = auVar121._0_4_;
            local_7c0._4_4_ = auVar121._4_4_;
            uStack_7b8._0_4_ = auVar121._8_4_;
            uStack_7b8._4_4_ = auVar121._12_4_;
            auStack_7b0._0_4_ = auVar121._16_4_;
            auStack_7b0._4_4_ = auVar121._20_4_;
            fStack_7a8 = auVar121._24_4_;
            auVar21 = vcmpps_avx(auVar164,_local_240,1);
            auVar164 = vblendvps_avx(auVar291,auVar18,auVar21);
            auVar141._0_4_ =
                 (float)local_620._0_4_ * (float)local_7c0._0_4_ +
                 (float)local_480._0_4_ * (float)local_6e0._0_4_ +
                 fVar156 + (float)local_6a0._0_4_ * local_5c0;
            auVar141._4_4_ =
                 (float)local_620._4_4_ * (float)local_7c0._4_4_ +
                 (float)local_480._4_4_ * (float)local_6e0._4_4_ +
                 fVar173 + (float)local_6a0._4_4_ * fStack_5bc;
            auVar141._8_4_ =
                 fStack_618 * (float)uStack_7b8 +
                 fStack_478 * fStack_6d8 + fVar174 + fStack_698 * fStack_5b8;
            auVar141._12_4_ =
                 fStack_614 * uStack_7b8._4_4_ +
                 fStack_474 * fStack_6d4 + fVar226 + fStack_694 * fStack_5b4;
            auVar141._16_4_ =
                 fStack_610 * (float)auStack_7b0._0_4_ +
                 fStack_470 * (float)auStack_6d0._0_4_ + fVar259 + fStack_690 * fStack_5b0;
            auVar141._20_4_ =
                 fStack_60c * (float)auStack_7b0._4_4_ +
                 fStack_46c * (float)auStack_6d0._4_4_ + fVar175 + fStack_68c * fStack_5ac;
            auVar141._24_4_ =
                 fStack_608 * fStack_7a8 +
                 fStack_468 * fStack_6c8 + fVar177 + fStack_688 * fStack_5a8;
            auVar141._28_4_ = auVar144._28_4_ + fStack_5c4 + auVar186._12_4_ + 0.0;
            auVar22 = vblendvps_avx(auVar316,auVar22,auVar21);
            fVar149 = auVar30._0_4_;
            fVar178 = auVar30._4_4_;
            fVar274 = auVar30._8_4_;
            fVar191 = auVar30._12_4_;
            fVar208 = auVar30._16_4_;
            fVar210 = auVar30._20_4_;
            fVar175 = auVar30._24_4_;
            fVar177 = auVar30._28_4_;
            fVar176 = auVar164._0_4_;
            fVar271 = auVar164._4_4_;
            fVar282 = auVar164._8_4_;
            fVar272 = auVar164._12_4_;
            fVar284 = auVar164._16_4_;
            fVar273 = auVar164._20_4_;
            fVar285 = auVar164._24_4_;
            fVar227 = auVar17._0_4_;
            fVar242 = auVar17._4_4_;
            fVar244 = auVar17._8_4_;
            fVar255 = auVar17._12_4_;
            fVar309 = auVar17._16_4_;
            fVar310 = auVar17._20_4_;
            fVar311 = auVar17._24_4_;
            auVar301._0_4_ = fVar227 * fVar227 + fVar149 * fVar149;
            auVar301._4_4_ = fVar242 * fVar242 + fVar178 * fVar178;
            auVar301._8_4_ = fVar244 * fVar244 + fVar274 * fVar274;
            auVar301._12_4_ = fVar255 * fVar255 + fVar191 * fVar191;
            auVar301._16_4_ = fVar309 * fVar309 + fVar208 * fVar208;
            auVar301._20_4_ = fVar310 * fVar310 + fVar210 * fVar210;
            auVar301._24_4_ = fVar311 * fVar311 + fVar175 * fVar175;
            auVar301._28_4_ = auVar18._28_4_ + fStack_84;
            auVar18 = vrsqrtps_avx(auVar301);
            fVar203 = auVar18._0_4_;
            fVar207 = auVar18._4_4_;
            auVar62._4_4_ = fVar207 * 1.5;
            auVar62._0_4_ = fVar203 * 1.5;
            fVar253 = auVar18._8_4_;
            auVar62._8_4_ = fVar253 * 1.5;
            fVar257 = auVar18._12_4_;
            auVar62._12_4_ = fVar257 * 1.5;
            fVar318 = auVar18._16_4_;
            auVar62._16_4_ = fVar318 * 1.5;
            fVar204 = auVar18._20_4_;
            auVar62._20_4_ = fVar204 * 1.5;
            fVar319 = auVar18._24_4_;
            auVar62._24_4_ = fVar319 * 1.5;
            auVar62._28_4_ = auVar316._28_4_;
            auVar63._4_4_ = fVar207 * fVar207 * fVar207 * auVar301._4_4_ * 0.5;
            auVar63._0_4_ = fVar203 * fVar203 * fVar203 * auVar301._0_4_ * 0.5;
            auVar63._8_4_ = fVar253 * fVar253 * fVar253 * auVar301._8_4_ * 0.5;
            auVar63._12_4_ = fVar257 * fVar257 * fVar257 * auVar301._12_4_ * 0.5;
            auVar63._16_4_ = fVar318 * fVar318 * fVar318 * auVar301._16_4_ * 0.5;
            auVar63._20_4_ = fVar204 * fVar204 * fVar204 * auVar301._20_4_ * 0.5;
            auVar63._24_4_ = fVar319 * fVar319 * fVar319 * auVar301._24_4_ * 0.5;
            auVar63._28_4_ = auVar301._28_4_;
            auVar21 = vsubps_avx(auVar62,auVar63);
            fVar155 = auVar21._0_4_;
            fVar156 = auVar21._4_4_;
            fVar173 = auVar21._8_4_;
            fVar174 = auVar21._12_4_;
            fVar226 = auVar21._16_4_;
            fVar259 = auVar21._20_4_;
            fVar147 = auVar21._24_4_;
            fVar203 = auVar22._0_4_;
            fVar207 = auVar22._4_4_;
            fVar253 = auVar22._8_4_;
            fVar257 = auVar22._12_4_;
            fVar318 = auVar22._16_4_;
            fVar204 = auVar22._20_4_;
            fVar319 = auVar22._24_4_;
            auVar279._0_4_ = fVar203 * fVar203 + fVar176 * fVar176;
            auVar279._4_4_ = fVar207 * fVar207 + fVar271 * fVar271;
            auVar279._8_4_ = fVar253 * fVar253 + fVar282 * fVar282;
            auVar279._12_4_ = fVar257 * fVar257 + fVar272 * fVar272;
            auVar279._16_4_ = fVar318 * fVar318 + fVar284 * fVar284;
            auVar279._20_4_ = fVar204 * fVar204 + fVar273 * fVar273;
            auVar279._24_4_ = fVar319 * fVar319 + fVar285 * fVar285;
            auVar279._28_4_ = auVar18._28_4_ + auVar164._28_4_;
            auVar164 = vrsqrtps_avx(auVar279);
            fVar206 = auVar164._0_4_;
            fVar281 = auVar164._4_4_;
            auVar64._4_4_ = fVar281 * 1.5;
            auVar64._0_4_ = fVar206 * 1.5;
            fVar209 = auVar164._8_4_;
            auVar64._8_4_ = fVar209 * 1.5;
            fVar283 = auVar164._12_4_;
            auVar64._12_4_ = fVar283 * 1.5;
            fVar211 = auVar164._16_4_;
            auVar64._16_4_ = fVar211 * 1.5;
            fVar213 = auVar164._20_4_;
            auVar64._20_4_ = fVar213 * 1.5;
            fVar212 = auVar164._24_4_;
            auVar64._24_4_ = fVar212 * 1.5;
            auVar64._28_4_ = auVar316._28_4_;
            auVar65._4_4_ = fVar281 * fVar281 * fVar281 * auVar279._4_4_ * 0.5;
            auVar65._0_4_ = fVar206 * fVar206 * fVar206 * auVar279._0_4_ * 0.5;
            auVar65._8_4_ = fVar209 * fVar209 * fVar209 * auVar279._8_4_ * 0.5;
            auVar65._12_4_ = fVar283 * fVar283 * fVar283 * auVar279._12_4_ * 0.5;
            auVar65._16_4_ = fVar211 * fVar211 * fVar211 * auVar279._16_4_ * 0.5;
            auVar65._20_4_ = fVar213 * fVar213 * fVar213 * auVar279._20_4_ * 0.5;
            auVar65._24_4_ = fVar212 * fVar212 * fVar212 * auVar279._24_4_ * 0.5;
            auVar65._28_4_ = auVar279._28_4_;
            auVar18 = vsubps_avx(auVar64,auVar65);
            fVar206 = auVar18._0_4_;
            fVar281 = auVar18._4_4_;
            fVar209 = auVar18._8_4_;
            fVar283 = auVar18._12_4_;
            fVar211 = auVar18._16_4_;
            fVar213 = auVar18._20_4_;
            fVar212 = auVar18._24_4_;
            fVar227 = fVar131 * fVar155 * fVar227;
            fVar242 = fVar146 * fVar156 * fVar242;
            auVar66._4_4_ = fVar242;
            auVar66._0_4_ = fVar227;
            fVar244 = fVar148 * fVar173 * fVar244;
            auVar66._8_4_ = fVar244;
            fVar255 = fVar150 * fVar174 * fVar255;
            auVar66._12_4_ = fVar255;
            fVar309 = fVar151 * fVar226 * fVar309;
            auVar66._16_4_ = fVar309;
            fVar310 = fVar152 * fVar259 * fVar310;
            auVar66._20_4_ = fVar310;
            fVar311 = fVar153 * fVar147 * fVar311;
            auVar66._24_4_ = fVar311;
            auVar66._28_4_ = auVar164._28_4_;
            local_7c0._4_4_ = fVar242 + auVar336._4_4_;
            local_7c0._0_4_ = fVar227 + auVar336._0_4_;
            uStack_7b8._0_4_ = fVar244 + auVar336._8_4_;
            uStack_7b8._4_4_ = fVar255 + auVar336._12_4_;
            auStack_7b0._0_4_ = fVar309 + auVar336._16_4_;
            auStack_7b0._4_4_ = fVar310 + auVar336._20_4_;
            fStack_7a8 = fVar311 + auVar336._24_4_;
            fStack_7a4 = auVar164._28_4_ + auVar336._28_4_;
            fVar227 = fVar131 * fVar155 * -fVar149;
            fVar242 = fVar146 * fVar156 * -fVar178;
            auVar67._4_4_ = fVar242;
            auVar67._0_4_ = fVar227;
            fVar244 = fVar148 * fVar173 * -fVar274;
            auVar67._8_4_ = fVar244;
            fVar255 = fVar150 * fVar174 * -fVar191;
            auVar67._12_4_ = fVar255;
            fVar309 = fVar151 * fVar226 * -fVar208;
            auVar67._16_4_ = fVar309;
            fVar310 = fVar152 * fVar259 * -fVar210;
            auVar67._20_4_ = fVar310;
            fVar311 = fVar153 * fVar147 * -fVar175;
            auVar67._24_4_ = fVar311;
            auVar67._28_4_ = -fVar177;
            local_6e0._4_4_ = local_740._4_4_ + fVar242;
            local_6e0._0_4_ = (float)local_740._0_4_ + fVar227;
            fStack_6d8 = local_740._8_4_ + fVar244;
            fStack_6d4 = local_740._12_4_ + fVar255;
            auStack_6d0._0_4_ = local_740._16_4_ + fVar309;
            auStack_6d0._4_4_ = local_740._20_4_ + fVar310;
            fStack_6c8 = local_740._24_4_ + fVar311;
            fStack_6c4 = local_740._28_4_ + -fVar177;
            fVar227 = fVar155 * 0.0 * fVar131;
            fVar242 = fVar156 * 0.0 * fVar146;
            auVar68._4_4_ = fVar242;
            auVar68._0_4_ = fVar227;
            fVar244 = fVar173 * 0.0 * fVar148;
            auVar68._8_4_ = fVar244;
            fVar255 = fVar174 * 0.0 * fVar150;
            auVar68._12_4_ = fVar255;
            fVar309 = fVar226 * 0.0 * fVar151;
            auVar68._16_4_ = fVar309;
            fVar310 = fVar259 * 0.0 * fVar152;
            auVar68._20_4_ = fVar310;
            fVar311 = fVar147 * 0.0 * fVar153;
            auVar68._24_4_ = fVar311;
            auVar68._28_4_ = fVar177;
            auVar144 = vsubps_avx(auVar336,auVar66);
            auVar337._0_4_ = fVar227 + auVar141._0_4_;
            auVar337._4_4_ = fVar242 + auVar141._4_4_;
            auVar337._8_4_ = fVar244 + auVar141._8_4_;
            auVar337._12_4_ = fVar255 + auVar141._12_4_;
            auVar337._16_4_ = fVar309 + auVar141._16_4_;
            auVar337._20_4_ = fVar310 + auVar141._20_4_;
            auVar337._24_4_ = fVar311 + auVar141._24_4_;
            auVar337._28_4_ = fVar177 + auVar141._28_4_;
            fVar227 = auVar165._0_4_ * fVar206 * fVar203;
            fVar203 = auVar165._4_4_ * fVar281 * fVar207;
            auVar69._4_4_ = fVar203;
            auVar69._0_4_ = fVar227;
            fVar242 = auVar165._8_4_ * fVar209 * fVar253;
            auVar69._8_4_ = fVar242;
            fVar207 = auVar165._12_4_ * fVar283 * fVar257;
            auVar69._12_4_ = fVar207;
            fVar244 = auVar165._16_4_ * fVar211 * fVar318;
            auVar69._16_4_ = fVar244;
            fVar253 = auVar165._20_4_ * fVar213 * fVar204;
            auVar69._20_4_ = fVar253;
            fVar255 = auVar165._24_4_ * fVar212 * fVar319;
            auVar69._24_4_ = fVar255;
            auVar69._28_4_ = fVar154;
            auVar233 = vsubps_avx(local_740,auVar67);
            auVar324._0_4_ = auVar251._0_4_ + fVar227;
            auVar324._4_4_ = auVar251._4_4_ + fVar203;
            auVar324._8_4_ = auVar251._8_4_ + fVar242;
            auVar324._12_4_ = auVar251._12_4_ + fVar207;
            auVar324._16_4_ = auVar251._16_4_ + fVar244;
            auVar324._20_4_ = auVar251._20_4_ + fVar253;
            auVar324._24_4_ = auVar251._24_4_ + fVar255;
            auVar324._28_4_ = auVar251._28_4_ + fVar154;
            fVar227 = fVar206 * -fVar176 * auVar165._0_4_;
            fVar203 = fVar281 * -fVar271 * auVar165._4_4_;
            auVar70._4_4_ = fVar203;
            auVar70._0_4_ = fVar227;
            fVar242 = fVar209 * -fVar282 * auVar165._8_4_;
            auVar70._8_4_ = fVar242;
            fVar207 = fVar283 * -fVar272 * auVar165._12_4_;
            auVar70._12_4_ = fVar207;
            fVar244 = fVar211 * -fVar284 * auVar165._16_4_;
            auVar70._16_4_ = fVar244;
            fVar253 = fVar213 * -fVar273 * auVar165._20_4_;
            auVar70._20_4_ = fVar253;
            fVar255 = fVar212 * -fVar285 * auVar165._24_4_;
            auVar70._24_4_ = fVar255;
            auVar70._28_4_ = auVar336._28_4_;
            auVar278 = vsubps_avx(auVar141,auVar68);
            auVar221._0_4_ = auVar236._0_4_ + fVar227;
            auVar221._4_4_ = auVar236._4_4_ + fVar203;
            auVar221._8_4_ = auVar236._8_4_ + fVar242;
            auVar221._12_4_ = auVar236._12_4_ + fVar207;
            auVar221._16_4_ = auVar236._16_4_ + fVar244;
            auVar221._20_4_ = auVar236._20_4_ + fVar253;
            auVar221._24_4_ = auVar236._24_4_ + fVar255;
            auVar221._28_4_ = auVar236._28_4_ + auVar336._28_4_;
            fVar227 = fVar206 * 0.0 * auVar165._0_4_;
            fVar203 = fVar281 * 0.0 * auVar165._4_4_;
            auVar71._4_4_ = fVar203;
            auVar71._0_4_ = fVar227;
            fVar242 = fVar209 * 0.0 * auVar165._8_4_;
            auVar71._8_4_ = fVar242;
            fVar207 = fVar283 * 0.0 * auVar165._12_4_;
            auVar71._12_4_ = fVar207;
            fVar244 = fVar211 * 0.0 * auVar165._16_4_;
            auVar71._16_4_ = fVar244;
            fVar253 = fVar213 * 0.0 * auVar165._20_4_;
            auVar71._20_4_ = fVar253;
            fVar255 = fVar212 * 0.0 * auVar165._24_4_;
            auVar71._24_4_ = fVar255;
            auVar71._28_4_ = auVar141._28_4_;
            auVar164 = vsubps_avx(auVar251,auVar69);
            auVar292._0_4_ = (float)local_5e0._0_4_ + fVar227;
            auVar292._4_4_ = (float)local_5e0._4_4_ + fVar203;
            auVar292._8_4_ = fStack_5d8 + fVar242;
            auVar292._12_4_ = fStack_5d4 + fVar207;
            auVar292._16_4_ = fStack_5d0 + fVar244;
            auVar292._20_4_ = fStack_5cc + fVar253;
            auVar292._24_4_ = fStack_5c8 + fVar255;
            auVar292._28_4_ = fStack_5c4 + auVar141._28_4_;
            auVar22 = vsubps_avx(auVar236,auVar70);
            auVar21 = vsubps_avx(_local_5e0,auVar71);
            auVar30 = vsubps_avx(auVar221,auVar233);
            auVar17 = vsubps_avx(auVar292,auVar278);
            auVar72._4_4_ = auVar278._4_4_ * auVar30._4_4_;
            auVar72._0_4_ = auVar278._0_4_ * auVar30._0_4_;
            auVar72._8_4_ = auVar278._8_4_ * auVar30._8_4_;
            auVar72._12_4_ = auVar278._12_4_ * auVar30._12_4_;
            auVar72._16_4_ = auVar278._16_4_ * auVar30._16_4_;
            auVar72._20_4_ = auVar278._20_4_ * auVar30._20_4_;
            auVar72._24_4_ = auVar278._24_4_ * auVar30._24_4_;
            auVar72._28_4_ = auVar316._28_4_;
            auVar73._4_4_ = auVar233._4_4_ * auVar17._4_4_;
            auVar73._0_4_ = auVar233._0_4_ * auVar17._0_4_;
            auVar73._8_4_ = auVar233._8_4_ * auVar17._8_4_;
            auVar73._12_4_ = auVar233._12_4_ * auVar17._12_4_;
            auVar73._16_4_ = auVar233._16_4_ * auVar17._16_4_;
            auVar73._20_4_ = auVar233._20_4_ * auVar17._20_4_;
            auVar73._24_4_ = auVar233._24_4_ * auVar17._24_4_;
            auVar73._28_4_ = fStack_5c4;
            auVar197 = vsubps_avx(auVar73,auVar72);
            auVar74._4_4_ = auVar144._4_4_ * auVar17._4_4_;
            auVar74._0_4_ = auVar144._0_4_ * auVar17._0_4_;
            auVar74._8_4_ = auVar144._8_4_ * auVar17._8_4_;
            auVar74._12_4_ = auVar144._12_4_ * auVar17._12_4_;
            auVar74._16_4_ = auVar144._16_4_ * auVar17._16_4_;
            auVar74._20_4_ = auVar144._20_4_ * auVar17._20_4_;
            auVar74._24_4_ = auVar144._24_4_ * auVar17._24_4_;
            auVar74._28_4_ = auVar17._28_4_;
            auVar17 = vsubps_avx(auVar324,auVar144);
            auVar75._4_4_ = auVar278._4_4_ * auVar17._4_4_;
            auVar75._0_4_ = auVar278._0_4_ * auVar17._0_4_;
            auVar75._8_4_ = auVar278._8_4_ * auVar17._8_4_;
            auVar75._12_4_ = auVar278._12_4_ * auVar17._12_4_;
            auVar75._16_4_ = auVar278._16_4_ * auVar17._16_4_;
            auVar75._20_4_ = auVar278._20_4_ * auVar17._20_4_;
            auVar75._24_4_ = auVar278._24_4_ * auVar17._24_4_;
            auVar75._28_4_ = auVar18._28_4_;
            auVar198 = vsubps_avx(auVar75,auVar74);
            auVar76._4_4_ = auVar233._4_4_ * auVar17._4_4_;
            auVar76._0_4_ = auVar233._0_4_ * auVar17._0_4_;
            auVar76._8_4_ = auVar233._8_4_ * auVar17._8_4_;
            auVar76._12_4_ = auVar233._12_4_ * auVar17._12_4_;
            auVar76._16_4_ = auVar233._16_4_ * auVar17._16_4_;
            auVar76._20_4_ = auVar233._20_4_ * auVar17._20_4_;
            auVar76._24_4_ = auVar233._24_4_ * auVar17._24_4_;
            auVar76._28_4_ = auVar18._28_4_;
            auVar77._4_4_ = auVar144._4_4_ * auVar30._4_4_;
            auVar77._0_4_ = auVar144._0_4_ * auVar30._0_4_;
            auVar77._8_4_ = auVar144._8_4_ * auVar30._8_4_;
            auVar77._12_4_ = auVar144._12_4_ * auVar30._12_4_;
            auVar77._16_4_ = auVar144._16_4_ * auVar30._16_4_;
            auVar77._20_4_ = auVar144._20_4_ * auVar30._20_4_;
            auVar77._24_4_ = auVar144._24_4_ * auVar30._24_4_;
            auVar77._28_4_ = auVar30._28_4_;
            auVar18 = vsubps_avx(auVar77,auVar76);
            auVar167._0_4_ = auVar197._0_4_ * 0.0 + auVar18._0_4_ + auVar198._0_4_ * 0.0;
            auVar167._4_4_ = auVar197._4_4_ * 0.0 + auVar18._4_4_ + auVar198._4_4_ * 0.0;
            auVar167._8_4_ = auVar197._8_4_ * 0.0 + auVar18._8_4_ + auVar198._8_4_ * 0.0;
            auVar167._12_4_ = auVar197._12_4_ * 0.0 + auVar18._12_4_ + auVar198._12_4_ * 0.0;
            auVar167._16_4_ = auVar197._16_4_ * 0.0 + auVar18._16_4_ + auVar198._16_4_ * 0.0;
            auVar167._20_4_ = auVar197._20_4_ * 0.0 + auVar18._20_4_ + auVar198._20_4_ * 0.0;
            auVar167._24_4_ = auVar197._24_4_ * 0.0 + auVar18._24_4_ + auVar198._24_4_ * 0.0;
            auVar167._28_4_ = auVar197._28_4_ + auVar18._28_4_ + auVar198._28_4_;
            auVar218 = vcmpps_avx(auVar167,ZEXT832(0) << 0x20,2);
            auVar164 = vblendvps_avx(auVar164,_local_7c0,auVar218);
            auVar202 = ZEXT3264(auVar164);
            auVar18 = vblendvps_avx(auVar22,_local_6e0,auVar218);
            auVar22 = vblendvps_avx(auVar21,auVar337,auVar218);
            auVar21 = vblendvps_avx(auVar144,auVar324,auVar218);
            auVar30 = vblendvps_avx(auVar233,auVar221,auVar218);
            auVar17 = vblendvps_avx(auVar278,auVar292,auVar218);
            auVar144 = vblendvps_avx(auVar324,auVar144,auVar218);
            auVar197 = vblendvps_avx(auVar221,auVar233,auVar218);
            auVar198 = vblendvps_avx(auVar292,auVar278,auVar218);
            local_740 = vandps_avx(_local_200,auVar277);
            auVar144 = vsubps_avx(auVar144,auVar164);
            auVar313 = vsubps_avx(auVar197,auVar18);
            auVar198 = vsubps_avx(auVar198,auVar22);
            auVar28 = vsubps_avx(auVar18,auVar30);
            auVar232 = auVar28._0_16_;
            fVar227 = auVar313._0_4_;
            fVar214 = auVar22._0_4_;
            fVar257 = auVar313._4_4_;
            fVar223 = auVar22._4_4_;
            auVar78._4_4_ = fVar223 * fVar257;
            auVar78._0_4_ = fVar214 * fVar227;
            fVar176 = auVar313._8_4_;
            fVar224 = auVar22._8_4_;
            auVar78._8_4_ = fVar224 * fVar176;
            fVar283 = auVar313._12_4_;
            fVar225 = auVar22._12_4_;
            auVar78._12_4_ = fVar225 * fVar283;
            fVar155 = auVar313._16_4_;
            fVar228 = auVar22._16_4_;
            auVar78._16_4_ = fVar228 * fVar155;
            fVar149 = auVar313._20_4_;
            fVar239 = auVar22._20_4_;
            auVar78._20_4_ = fVar239 * fVar149;
            fVar177 = auVar313._24_4_;
            fVar241 = auVar22._24_4_;
            auVar78._24_4_ = fVar241 * fVar177;
            auVar78._28_4_ = auVar197._28_4_;
            fVar203 = auVar18._0_4_;
            fVar243 = auVar198._0_4_;
            fVar309 = auVar18._4_4_;
            fVar245 = auVar198._4_4_;
            auVar79._4_4_ = fVar245 * fVar309;
            auVar79._0_4_ = fVar243 * fVar203;
            fVar206 = auVar18._8_4_;
            fVar254 = auVar198._8_4_;
            auVar79._8_4_ = fVar254 * fVar206;
            fVar284 = auVar18._12_4_;
            fVar256 = auVar198._12_4_;
            auVar79._12_4_ = fVar256 * fVar284;
            fVar156 = auVar18._16_4_;
            fVar258 = auVar198._16_4_;
            auVar79._16_4_ = fVar258 * fVar156;
            fVar178 = auVar18._20_4_;
            fVar261 = auVar198._20_4_;
            auVar79._20_4_ = fVar261 * fVar178;
            fVar179 = auVar18._24_4_;
            fVar268 = auVar198._24_4_;
            uVar8 = auVar233._28_4_;
            auVar79._24_4_ = fVar268 * fVar179;
            auVar79._28_4_ = uVar8;
            auVar197 = vsubps_avx(auVar79,auVar78);
            fVar242 = auVar164._0_4_;
            fVar318 = auVar164._4_4_;
            auVar80._4_4_ = fVar245 * fVar318;
            auVar80._0_4_ = fVar243 * fVar242;
            fVar271 = auVar164._8_4_;
            auVar80._8_4_ = fVar254 * fVar271;
            fVar211 = auVar164._12_4_;
            auVar80._12_4_ = fVar256 * fVar211;
            fVar173 = auVar164._16_4_;
            auVar80._16_4_ = fVar258 * fVar173;
            fVar274 = auVar164._20_4_;
            auVar80._20_4_ = fVar261 * fVar274;
            fVar260 = auVar164._24_4_;
            auVar80._24_4_ = fVar268 * fVar260;
            auVar80._28_4_ = uVar8;
            fVar207 = auVar144._0_4_;
            fVar310 = auVar144._4_4_;
            auVar81._4_4_ = fVar223 * fVar310;
            auVar81._0_4_ = fVar214 * fVar207;
            fVar281 = auVar144._8_4_;
            auVar81._8_4_ = fVar224 * fVar281;
            fVar273 = auVar144._12_4_;
            auVar81._12_4_ = fVar225 * fVar273;
            fVar174 = auVar144._16_4_;
            auVar81._16_4_ = fVar228 * fVar174;
            fVar191 = auVar144._20_4_;
            auVar81._20_4_ = fVar239 * fVar191;
            fVar334 = auVar144._24_4_;
            auVar81._24_4_ = fVar241 * fVar334;
            auVar81._28_4_ = auVar324._28_4_;
            auVar233 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = fVar309 * fVar310;
            auVar82._0_4_ = fVar203 * fVar207;
            auVar82._8_4_ = fVar206 * fVar281;
            auVar82._12_4_ = fVar284 * fVar273;
            auVar82._16_4_ = fVar156 * fVar174;
            auVar82._20_4_ = fVar178 * fVar191;
            auVar82._24_4_ = fVar179 * fVar334;
            auVar82._28_4_ = uVar8;
            auVar83._4_4_ = fVar318 * fVar257;
            auVar83._0_4_ = fVar242 * fVar227;
            auVar83._8_4_ = fVar271 * fVar176;
            auVar83._12_4_ = fVar211 * fVar283;
            auVar83._16_4_ = fVar173 * fVar155;
            auVar83._20_4_ = fVar274 * fVar149;
            auVar83._24_4_ = fVar260 * fVar177;
            auVar83._28_4_ = auVar278._28_4_;
            auVar278 = vsubps_avx(auVar83,auVar82);
            auVar29 = vsubps_avx(auVar22,auVar17);
            fVar253 = auVar278._28_4_ + auVar233._28_4_;
            auVar302._0_4_ = auVar278._0_4_ + auVar233._0_4_ * 0.0 + auVar197._0_4_ * 0.0;
            auVar302._4_4_ = auVar278._4_4_ + auVar233._4_4_ * 0.0 + auVar197._4_4_ * 0.0;
            auVar302._8_4_ = auVar278._8_4_ + auVar233._8_4_ * 0.0 + auVar197._8_4_ * 0.0;
            auVar302._12_4_ = auVar278._12_4_ + auVar233._12_4_ * 0.0 + auVar197._12_4_ * 0.0;
            auVar302._16_4_ = auVar278._16_4_ + auVar233._16_4_ * 0.0 + auVar197._16_4_ * 0.0;
            auVar302._20_4_ = auVar278._20_4_ + auVar233._20_4_ * 0.0 + auVar197._20_4_ * 0.0;
            auVar302._24_4_ = auVar278._24_4_ + auVar233._24_4_ * 0.0 + auVar197._24_4_ * 0.0;
            auVar302._28_4_ = fVar253 + auVar197._28_4_;
            fVar244 = auVar28._0_4_;
            fVar204 = auVar28._4_4_;
            auVar84._4_4_ = auVar17._4_4_ * fVar204;
            auVar84._0_4_ = auVar17._0_4_ * fVar244;
            fVar282 = auVar28._8_4_;
            auVar84._8_4_ = auVar17._8_4_ * fVar282;
            fVar213 = auVar28._12_4_;
            auVar84._12_4_ = auVar17._12_4_ * fVar213;
            fVar226 = auVar28._16_4_;
            auVar84._16_4_ = auVar17._16_4_ * fVar226;
            fVar208 = auVar28._20_4_;
            auVar84._20_4_ = auVar17._20_4_ * fVar208;
            fVar338 = auVar28._24_4_;
            auVar84._24_4_ = auVar17._24_4_ * fVar338;
            auVar84._28_4_ = fVar253;
            fVar253 = auVar29._0_4_;
            fVar311 = auVar29._4_4_;
            auVar85._4_4_ = auVar30._4_4_ * fVar311;
            auVar85._0_4_ = auVar30._0_4_ * fVar253;
            fVar209 = auVar29._8_4_;
            auVar85._8_4_ = auVar30._8_4_ * fVar209;
            fVar285 = auVar29._12_4_;
            auVar85._12_4_ = auVar30._12_4_ * fVar285;
            fVar259 = auVar29._16_4_;
            auVar85._16_4_ = auVar30._16_4_ * fVar259;
            fVar210 = auVar29._20_4_;
            auVar85._20_4_ = auVar30._20_4_ * fVar210;
            fVar339 = auVar29._24_4_;
            auVar85._24_4_ = auVar30._24_4_ * fVar339;
            auVar85._28_4_ = auVar278._28_4_;
            auVar233 = vsubps_avx(auVar85,auVar84);
            auVar278 = vsubps_avx(auVar164,auVar21);
            fVar255 = auVar278._0_4_;
            fVar319 = auVar278._4_4_;
            auVar86._4_4_ = auVar17._4_4_ * fVar319;
            auVar86._0_4_ = auVar17._0_4_ * fVar255;
            fVar272 = auVar278._8_4_;
            auVar86._8_4_ = auVar17._8_4_ * fVar272;
            fVar212 = auVar278._12_4_;
            auVar86._12_4_ = auVar17._12_4_ * fVar212;
            fVar147 = auVar278._16_4_;
            auVar86._16_4_ = auVar17._16_4_ * fVar147;
            fVar175 = auVar278._20_4_;
            auVar86._20_4_ = auVar17._20_4_ * fVar175;
            fVar340 = auVar278._24_4_;
            auVar86._24_4_ = auVar17._24_4_ * fVar340;
            auVar86._28_4_ = auVar17._28_4_;
            auVar87._4_4_ = fVar311 * auVar21._4_4_;
            auVar87._0_4_ = fVar253 * auVar21._0_4_;
            auVar87._8_4_ = fVar209 * auVar21._8_4_;
            auVar87._12_4_ = fVar285 * auVar21._12_4_;
            auVar87._16_4_ = fVar259 * auVar21._16_4_;
            auVar87._20_4_ = fVar210 * auVar21._20_4_;
            auVar87._24_4_ = fVar339 * auVar21._24_4_;
            auVar87._28_4_ = auVar197._28_4_;
            auVar17 = vsubps_avx(auVar86,auVar87);
            auVar88._4_4_ = auVar30._4_4_ * fVar319;
            auVar88._0_4_ = auVar30._0_4_ * fVar255;
            auVar88._8_4_ = auVar30._8_4_ * fVar272;
            auVar88._12_4_ = auVar30._12_4_ * fVar212;
            auVar88._16_4_ = auVar30._16_4_ * fVar147;
            auVar88._20_4_ = auVar30._20_4_ * fVar175;
            auVar88._24_4_ = auVar30._24_4_ * fVar340;
            auVar88._28_4_ = auVar30._28_4_;
            auVar89._4_4_ = fVar204 * auVar21._4_4_;
            auVar89._0_4_ = fVar244 * auVar21._0_4_;
            auVar89._8_4_ = fVar282 * auVar21._8_4_;
            auVar89._12_4_ = fVar213 * auVar21._12_4_;
            auVar89._16_4_ = fVar226 * auVar21._16_4_;
            auVar89._20_4_ = fVar208 * auVar21._20_4_;
            auVar89._24_4_ = fVar338 * auVar21._24_4_;
            auVar89._28_4_ = auVar21._28_4_;
            auVar21 = vsubps_avx(auVar89,auVar88);
            auVar142._0_4_ = auVar233._0_4_ * 0.0 + auVar21._0_4_ + auVar17._0_4_ * 0.0;
            auVar142._4_4_ = auVar233._4_4_ * 0.0 + auVar21._4_4_ + auVar17._4_4_ * 0.0;
            auVar142._8_4_ = auVar233._8_4_ * 0.0 + auVar21._8_4_ + auVar17._8_4_ * 0.0;
            auVar142._12_4_ = auVar233._12_4_ * 0.0 + auVar21._12_4_ + auVar17._12_4_ * 0.0;
            auVar142._16_4_ = auVar233._16_4_ * 0.0 + auVar21._16_4_ + auVar17._16_4_ * 0.0;
            auVar142._20_4_ = auVar233._20_4_ * 0.0 + auVar21._20_4_ + auVar17._20_4_ * 0.0;
            auVar142._24_4_ = auVar233._24_4_ * 0.0 + auVar21._24_4_ + auVar17._24_4_ * 0.0;
            auVar142._28_4_ = auVar17._28_4_ + auVar21._28_4_ + auVar17._28_4_;
            auVar145 = ZEXT3264(auVar142);
            auVar21 = vmaxps_avx(auVar302,auVar142);
            auVar21 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,2);
            auVar30 = local_740 & auVar21;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar30 >> 0x7f,0) == '\0') &&
                  (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0xbf,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar30[0x1f]) {
LAB_00fabc9e:
              auVar169._8_8_ = uStack_538;
              auVar169._0_8_ = local_540;
              auVar169._16_8_ = uStack_530;
              auVar169._24_8_ = uStack_528;
              auVar232 = vpcmpeqd_avx(auVar232,auVar232);
              auVar267 = ZEXT1664(auVar232);
              auVar330._4_4_ = fVar146;
              auVar330._0_4_ = fVar131;
              auVar330._8_4_ = fVar148;
              auVar330._12_4_ = fVar150;
              auVar330._16_4_ = fVar151;
              auVar330._20_4_ = fVar152;
              auVar330._24_4_ = fVar153;
              auVar330._28_4_ = fVar154;
            }
            else {
              auVar30 = vandps_avx(auVar21,local_740);
              auVar90._4_4_ = fVar311 * fVar257;
              auVar90._0_4_ = fVar253 * fVar227;
              auVar90._8_4_ = fVar209 * fVar176;
              auVar90._12_4_ = fVar285 * fVar283;
              auVar90._16_4_ = fVar259 * fVar155;
              auVar90._20_4_ = fVar210 * fVar149;
              auVar90._24_4_ = fVar339 * fVar177;
              auVar90._28_4_ = local_740._28_4_;
              auVar91._4_4_ = fVar204 * fVar245;
              auVar91._0_4_ = fVar244 * fVar243;
              auVar91._8_4_ = fVar282 * fVar254;
              auVar91._12_4_ = fVar213 * fVar256;
              auVar91._16_4_ = fVar226 * fVar258;
              auVar91._20_4_ = fVar208 * fVar261;
              auVar91._24_4_ = fVar338 * fVar268;
              auVar91._28_4_ = auVar21._28_4_;
              auVar17 = vsubps_avx(auVar91,auVar90);
              auVar92._4_4_ = fVar319 * fVar245;
              auVar92._0_4_ = fVar255 * fVar243;
              auVar92._8_4_ = fVar272 * fVar254;
              auVar92._12_4_ = fVar212 * fVar256;
              auVar92._16_4_ = fVar147 * fVar258;
              auVar92._20_4_ = fVar175 * fVar261;
              auVar92._24_4_ = fVar340 * fVar268;
              auVar92._28_4_ = auVar198._28_4_;
              auVar93._4_4_ = fVar311 * fVar310;
              auVar93._0_4_ = fVar253 * fVar207;
              auVar93._8_4_ = fVar209 * fVar281;
              auVar93._12_4_ = fVar285 * fVar273;
              auVar93._16_4_ = fVar259 * fVar174;
              auVar93._20_4_ = fVar210 * fVar191;
              auVar93._24_4_ = fVar339 * fVar334;
              auVar93._28_4_ = auVar29._28_4_;
              auVar197 = vsubps_avx(auVar93,auVar92);
              auVar94._4_4_ = fVar204 * fVar310;
              auVar94._0_4_ = fVar244 * fVar207;
              auVar94._8_4_ = fVar282 * fVar281;
              auVar94._12_4_ = fVar213 * fVar273;
              auVar94._16_4_ = fVar226 * fVar174;
              auVar94._20_4_ = fVar208 * fVar191;
              auVar94._24_4_ = fVar338 * fVar334;
              auVar94._28_4_ = auVar144._28_4_;
              auVar95._4_4_ = fVar319 * fVar257;
              auVar95._0_4_ = fVar255 * fVar227;
              auVar95._8_4_ = fVar272 * fVar176;
              auVar95._12_4_ = fVar212 * fVar283;
              auVar95._16_4_ = fVar147 * fVar155;
              auVar95._20_4_ = fVar175 * fVar149;
              auVar95._24_4_ = fVar340 * fVar177;
              auVar95._28_4_ = auVar313._28_4_;
              auVar198 = vsubps_avx(auVar95,auVar94);
              auVar232 = auVar198._0_16_;
              auVar168._0_4_ = auVar17._0_4_ * 0.0 + auVar198._0_4_ + auVar197._0_4_ * 0.0;
              auVar168._4_4_ = auVar17._4_4_ * 0.0 + auVar198._4_4_ + auVar197._4_4_ * 0.0;
              auVar168._8_4_ = auVar17._8_4_ * 0.0 + auVar198._8_4_ + auVar197._8_4_ * 0.0;
              auVar168._12_4_ = auVar17._12_4_ * 0.0 + auVar198._12_4_ + auVar197._12_4_ * 0.0;
              auVar168._16_4_ = auVar17._16_4_ * 0.0 + auVar198._16_4_ + auVar197._16_4_ * 0.0;
              auVar168._20_4_ = auVar17._20_4_ * 0.0 + auVar198._20_4_ + auVar197._20_4_ * 0.0;
              auVar168._24_4_ = auVar17._24_4_ * 0.0 + auVar198._24_4_ + auVar197._24_4_ * 0.0;
              auVar168._28_4_ = auVar313._28_4_ + auVar198._28_4_ + auVar144._28_4_;
              auVar21 = vrcpps_avx(auVar168);
              fVar227 = auVar21._0_4_;
              fVar207 = auVar21._4_4_;
              auVar96._4_4_ = auVar168._4_4_ * fVar207;
              auVar96._0_4_ = auVar168._0_4_ * fVar227;
              fVar244 = auVar21._8_4_;
              auVar96._8_4_ = auVar168._8_4_ * fVar244;
              fVar253 = auVar21._12_4_;
              auVar96._12_4_ = auVar168._12_4_ * fVar253;
              fVar255 = auVar21._16_4_;
              auVar96._16_4_ = auVar168._16_4_ * fVar255;
              fVar257 = auVar21._20_4_;
              auVar96._20_4_ = auVar168._20_4_ * fVar257;
              fVar310 = auVar21._24_4_;
              auVar96._24_4_ = auVar168._24_4_ * fVar310;
              auVar96._28_4_ = auVar29._28_4_;
              auVar317._8_4_ = 0x3f800000;
              auVar317._0_8_ = &DAT_3f8000003f800000;
              auVar317._12_4_ = 0x3f800000;
              auVar317._16_4_ = 0x3f800000;
              auVar317._20_4_ = 0x3f800000;
              auVar317._24_4_ = 0x3f800000;
              auVar317._28_4_ = 0x3f800000;
              auVar21 = vsubps_avx(auVar317,auVar96);
              fVar227 = auVar21._0_4_ * fVar227 + fVar227;
              fVar207 = auVar21._4_4_ * fVar207 + fVar207;
              fVar244 = auVar21._8_4_ * fVar244 + fVar244;
              fVar253 = auVar21._12_4_ * fVar253 + fVar253;
              fVar255 = auVar21._16_4_ * fVar255 + fVar255;
              fVar257 = auVar21._20_4_ * fVar257 + fVar257;
              fVar310 = auVar21._24_4_ * fVar310 + fVar310;
              auVar97._4_4_ =
                   (fVar318 * auVar17._4_4_ + auVar197._4_4_ * fVar309 + auVar198._4_4_ * fVar223) *
                   fVar207;
              auVar97._0_4_ =
                   (fVar242 * auVar17._0_4_ + auVar197._0_4_ * fVar203 + auVar198._0_4_ * fVar214) *
                   fVar227;
              auVar97._8_4_ =
                   (fVar271 * auVar17._8_4_ + auVar197._8_4_ * fVar206 + auVar198._8_4_ * fVar224) *
                   fVar244;
              auVar97._12_4_ =
                   (fVar211 * auVar17._12_4_ + auVar197._12_4_ * fVar284 + auVar198._12_4_ * fVar225
                   ) * fVar253;
              auVar97._16_4_ =
                   (fVar173 * auVar17._16_4_ + auVar197._16_4_ * fVar156 + auVar198._16_4_ * fVar228
                   ) * fVar255;
              auVar97._20_4_ =
                   (fVar274 * auVar17._20_4_ + auVar197._20_4_ * fVar178 + auVar198._20_4_ * fVar239
                   ) * fVar257;
              auVar97._24_4_ =
                   (fVar260 * auVar17._24_4_ + auVar197._24_4_ * fVar179 + auVar198._24_4_ * fVar241
                   ) * fVar310;
              auVar97._28_4_ = auVar164._28_4_ + auVar18._28_4_ + auVar22._28_4_;
              auVar202 = ZEXT3264(auVar97);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar222._4_4_ = uVar8;
              auVar222._0_4_ = uVar8;
              auVar222._8_4_ = uVar8;
              auVar222._12_4_ = uVar8;
              auVar222._16_4_ = uVar8;
              auVar222._20_4_ = uVar8;
              auVar222._24_4_ = uVar8;
              auVar222._28_4_ = uVar8;
              auVar164 = vcmpps_avx(local_260,auVar97,2);
              auVar18 = vcmpps_avx(auVar97,auVar222,2);
              auVar164 = vandps_avx(auVar164,auVar18);
              auVar22 = auVar30 & auVar164;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar22 >> 0x7f,0) == '\0') &&
                    (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar22 >> 0xbf,0) == '\0') &&
                  (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar22[0x1f]) goto LAB_00fabc9e;
              auVar164 = vandps_avx(auVar30,auVar164);
              auVar22 = vcmpps_avx(ZEXT832(0) << 0x20,auVar168,4);
              auVar21 = auVar164 & auVar22;
              auVar169._8_8_ = uStack_538;
              auVar169._0_8_ = local_540;
              auVar169._16_8_ = uStack_530;
              auVar169._24_8_ = uStack_528;
              auVar232 = vpcmpeqd_avx(auVar232,auVar232);
              auVar267 = ZEXT1664(auVar232);
              auVar330._4_4_ = fVar146;
              auVar330._0_4_ = fVar131;
              auVar330._8_4_ = fVar148;
              auVar330._12_4_ = fVar150;
              auVar330._16_4_ = fVar151;
              auVar330._20_4_ = fVar152;
              auVar330._24_4_ = fVar153;
              auVar330._28_4_ = fVar154;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0x7f,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0xbf,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                auVar169 = vandps_avx(auVar22,auVar164);
                auVar98._4_4_ = auVar302._4_4_ * fVar207;
                auVar98._0_4_ = auVar302._0_4_ * fVar227;
                auVar98._8_4_ = auVar302._8_4_ * fVar244;
                auVar98._12_4_ = auVar302._12_4_ * fVar253;
                auVar98._16_4_ = auVar302._16_4_ * fVar255;
                auVar98._20_4_ = auVar302._20_4_ * fVar257;
                auVar98._24_4_ = auVar302._24_4_ * fVar310;
                auVar98._28_4_ = auVar18._28_4_;
                auVar99._4_4_ = auVar142._4_4_ * fVar207;
                auVar99._0_4_ = auVar142._0_4_ * fVar227;
                auVar99._8_4_ = auVar142._8_4_ * fVar244;
                auVar99._12_4_ = auVar142._12_4_ * fVar253;
                auVar99._16_4_ = auVar142._16_4_ * fVar255;
                auVar99._20_4_ = auVar142._20_4_ * fVar257;
                auVar99._24_4_ = auVar142._24_4_ * fVar310;
                auVar99._28_4_ = auVar142._28_4_;
                auVar252._8_4_ = 0x3f800000;
                auVar252._0_8_ = &DAT_3f8000003f800000;
                auVar252._12_4_ = 0x3f800000;
                auVar252._16_4_ = 0x3f800000;
                auVar252._20_4_ = 0x3f800000;
                auVar252._24_4_ = 0x3f800000;
                auVar252._28_4_ = 0x3f800000;
                auVar164 = vsubps_avx(auVar252,auVar98);
                local_e0 = vblendvps_avx(auVar164,auVar98,auVar218);
                auVar164 = vsubps_avx(auVar252,auVar99);
                _local_160 = vblendvps_avx(auVar164,auVar99,auVar218);
                auVar145 = ZEXT3264(_local_160);
                local_4e0 = auVar97;
              }
            }
            auVar308 = ZEXT3264(local_600);
            if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar169 >> 0x7f,0) != '\0') ||
                  (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar169 >> 0xbf,0) != '\0') ||
                (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar169[0x1f] < '\0') {
              auVar164 = vsubps_avx(auVar165,auVar330);
              auVar202 = ZEXT3264(local_e0);
              fVar203 = auVar330._0_4_ + auVar164._0_4_ * local_e0._0_4_;
              fVar242 = auVar330._4_4_ + auVar164._4_4_ * local_e0._4_4_;
              fVar207 = auVar330._8_4_ + auVar164._8_4_ * local_e0._8_4_;
              fVar244 = auVar330._12_4_ + auVar164._12_4_ * local_e0._12_4_;
              fVar253 = auVar330._16_4_ + auVar164._16_4_ * local_e0._16_4_;
              fVar255 = auVar330._20_4_ + auVar164._20_4_ * local_e0._20_4_;
              fVar257 = auVar330._24_4_ + auVar164._24_4_ * local_e0._24_4_;
              fVar309 = auVar330._28_4_ + auVar164._28_4_;
              fVar227 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar100._4_4_ = (fVar242 + fVar242) * fVar227;
              auVar100._0_4_ = (fVar203 + fVar203) * fVar227;
              auVar100._8_4_ = (fVar207 + fVar207) * fVar227;
              auVar100._12_4_ = (fVar244 + fVar244) * fVar227;
              auVar100._16_4_ = (fVar253 + fVar253) * fVar227;
              auVar100._20_4_ = (fVar255 + fVar255) * fVar227;
              auVar100._24_4_ = (fVar257 + fVar257) * fVar227;
              auVar100._28_4_ = fVar309 + fVar309;
              auVar164 = vcmpps_avx(local_4e0,auVar100,6);
              auVar145 = ZEXT3264(auVar164);
              auVar18 = auVar169 & auVar164;
              if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar18 >> 0x7f,0) != '\0') ||
                    (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0xbf,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar18[0x1f] < '\0') {
                local_300 = vandps_avx(auVar164,auVar169);
                auVar145 = ZEXT3264(local_300);
                local_3a0 = (float)local_160._0_4_ + (float)local_160._0_4_ + -1.0;
                fStack_39c = (float)local_160._4_4_ + (float)local_160._4_4_ + -1.0;
                fStack_398 = fStack_158 + fStack_158 + -1.0;
                fStack_394 = fStack_154 + fStack_154 + -1.0;
                fStack_390 = fStack_150 + fStack_150 + -1.0;
                fStack_38c = fStack_14c + fStack_14c + -1.0;
                fStack_388 = fStack_148 + fStack_148 + -1.0;
                fStack_384 = fStack_144 + fStack_144 + -1.0;
                local_3c0 = local_e0;
                local_380 = local_4e0;
                local_35c = uVar11;
                local_340 = (float)local_800._0_4_;
                fStack_33c = (float)local_800._4_4_;
                fStack_338 = fStack_7f8;
                fStack_334 = fStack_7f4;
                local_330 = local_630;
                uStack_328 = uStack_628;
                local_320 = local_640;
                uStack_318 = uStack_638;
                pGVar13 = (context->scene->geometries).items[uVar125].ptr;
                local_160._4_4_ = fStack_39c;
                local_160._0_4_ = local_3a0;
                fStack_158 = fStack_398;
                fStack_154 = fStack_394;
                fStack_150 = fStack_390;
                fStack_14c = fStack_38c;
                fStack_148 = fStack_388;
                fStack_144 = fStack_384;
                if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar232 = vshufps_avx(ZEXT416((uint)(float)(int)local_360),
                                         ZEXT416((uint)(float)(int)local_360),0);
                  local_2e0[0] = (auVar232._0_4_ + local_e0._0_4_ + 0.0) * (float)local_4c0._0_4_;
                  local_2e0[1] = (auVar232._4_4_ + local_e0._4_4_ + 1.0) * (float)local_4c0._4_4_;
                  local_2e0[2] = (auVar232._8_4_ + local_e0._8_4_ + 2.0) * fStack_4b8;
                  local_2e0[3] = (auVar232._12_4_ + local_e0._12_4_ + 3.0) * fStack_4b4;
                  fStack_2d0 = (auVar232._0_4_ + local_e0._16_4_ + 4.0) * fStack_4b0;
                  fStack_2cc = (auVar232._4_4_ + local_e0._20_4_ + 5.0) * fStack_4ac;
                  fStack_2c8 = (auVar232._8_4_ + local_e0._24_4_ + 6.0) * fStack_4a8;
                  fStack_2c4 = auVar232._12_4_ + local_e0._28_4_ + 7.0;
                  local_2c0 = CONCAT44(fStack_39c,local_3a0);
                  uStack_2b8 = CONCAT44(fStack_394,fStack_398);
                  uStack_2b0 = CONCAT44(fStack_38c,fStack_390);
                  uStack_2a8 = CONCAT44(fStack_384,fStack_388);
                  local_2a0 = local_4e0;
                  auVar170._8_4_ = 0x7f800000;
                  auVar170._0_8_ = 0x7f8000007f800000;
                  auVar170._12_4_ = 0x7f800000;
                  auVar170._16_4_ = 0x7f800000;
                  auVar170._20_4_ = 0x7f800000;
                  auVar170._24_4_ = 0x7f800000;
                  auVar170._28_4_ = 0x7f800000;
                  auVar164 = vblendvps_avx(auVar170,local_4e0,local_300);
                  auVar18 = vshufps_avx(auVar164,auVar164,0xb1);
                  auVar18 = vminps_avx(auVar164,auVar18);
                  auVar22 = vshufpd_avx(auVar18,auVar18,5);
                  auVar18 = vminps_avx(auVar18,auVar22);
                  auVar22 = vperm2f128_avx(auVar18,auVar18,1);
                  auVar18 = vminps_avx(auVar18,auVar22);
                  auVar18 = vcmpps_avx(auVar164,auVar18,0);
                  auVar22 = local_300 & auVar18;
                  auVar164 = local_300;
                  if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar22 >> 0x7f,0) != '\0') ||
                        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar22 >> 0xbf,0) != '\0') ||
                      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar22[0x1f] < '\0') {
                    auVar164 = vandps_avx(auVar18,local_300);
                  }
                  uVar127 = vmovmskps_avx(auVar164);
                  local_860 = 0;
                  if (uVar127 != 0) {
                    for (; (uVar127 >> local_860 & 1) == 0; local_860 = local_860 + 1) {
                    }
                  }
                  uVar128 = (ulong)local_860;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar227 = local_2e0[uVar128];
                    auVar145 = ZEXT464((uint)fVar227);
                    uVar8 = *(undefined4 *)((long)&local_2c0 + uVar128 * 4);
                    fVar242 = 1.0 - fVar227;
                    fVar203 = fVar227 * fVar242 * 4.0;
                    auVar232 = ZEXT416((uint)(fVar227 * fVar227 * 0.5));
                    auVar232 = vshufps_avx(auVar232,auVar232,0);
                    auVar186 = ZEXT416((uint)((fVar242 * fVar242 + fVar203) * 0.5));
                    auVar186 = vshufps_avx(auVar186,auVar186,0);
                    auVar195 = ZEXT416((uint)((-fVar227 * fVar227 - fVar203) * 0.5));
                    auVar195 = vshufps_avx(auVar195,auVar195,0);
                    auVar196 = ZEXT416((uint)(fVar242 * -fVar242 * 0.5));
                    auVar196 = vshufps_avx(auVar196,auVar196,0);
                    auVar187._0_4_ =
                         fVar192 * auVar196._0_4_ +
                         (float)local_800._0_4_ * auVar195._0_4_ +
                         auVar232._0_4_ * (float)local_640._0_4_ +
                         auVar186._0_4_ * (float)local_630._0_4_;
                    auVar187._4_4_ =
                         fVar238 * auVar196._4_4_ +
                         (float)local_800._4_4_ * auVar195._4_4_ +
                         auVar232._4_4_ * (float)local_640._4_4_ +
                         auVar186._4_4_ * (float)local_630._4_4_;
                    auVar187._8_4_ =
                         fVar240 * auVar196._8_4_ +
                         fStack_7f8 * auVar195._8_4_ +
                         auVar232._8_4_ * (float)uStack_638 + auVar186._8_4_ * (float)uStack_628;
                    auVar187._12_4_ =
                         fVar205 * auVar196._12_4_ +
                         fStack_7f4 * auVar195._12_4_ +
                         auVar232._12_4_ * uStack_638._4_4_ + auVar186._12_4_ * uStack_628._4_4_;
                    auVar202 = ZEXT464(*(uint *)(local_2a0 + uVar128 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_2a0 + uVar128 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar187._0_4_;
                    uVar12 = vextractps_avx(auVar187,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar12;
                    uVar12 = vextractps_avx(auVar187,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar12;
                    *(float *)(ray + k * 4 + 0xf0) = fVar227;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                    *(uint *)(ray + k * 4 + 0x110) = uVar10;
                    *(uint *)(ray + k * 4 + 0x120) = uVar125;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    auStack_790 = auVar336._16_16_;
                    _local_7a0 = _local_800;
                    auStack_750 = auVar251._16_16_;
                    _local_760 = _local_630;
                    auStack_6b0 = auVar236._16_16_;
                    _local_6c0 = _local_640;
                    _local_7c0 = *local_768;
                    auVar280 = ZEXT1664(ZEXT816(0) << 0x40);
                    _local_700 = auVar277;
                    local_580 = local_300;
                    local_350 = local_880;
                    uStack_348 = uStack_878;
                    do {
                      local_740._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      uVar128 = (ulong)local_860;
                      local_420 = local_2e0[uVar128];
                      local_410._4_4_ = *(undefined4 *)((long)&local_2c0 + uVar128 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar128 * 4)
                      ;
                      fVar203 = 1.0 - local_420;
                      fVar227 = local_420 * fVar203 * 4.0;
                      auVar232 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                      auVar232 = vshufps_avx(auVar232,auVar232,0);
                      auVar186 = ZEXT416((uint)((fVar203 * fVar203 + fVar227) * 0.5));
                      auVar186 = vshufps_avx(auVar186,auVar186,0);
                      auVar195 = ZEXT416((uint)((-local_420 * local_420 - fVar227) * 0.5));
                      auVar195 = vshufps_avx(auVar195,auVar195,0);
                      local_7f0.context = context->user;
                      auVar196 = ZEXT416((uint)(fVar203 * -fVar203 * 0.5));
                      auVar196 = vshufps_avx(auVar196,auVar196,0);
                      auVar188._0_4_ =
                           fVar192 * auVar196._0_4_ +
                           auVar195._0_4_ * (float)local_7a0._0_4_ +
                           auVar232._0_4_ * (float)local_6c0._0_4_ +
                           auVar186._0_4_ * (float)local_760._0_4_;
                      auVar188._4_4_ =
                           fVar238 * auVar196._4_4_ +
                           auVar195._4_4_ * (float)local_7a0._4_4_ +
                           auVar232._4_4_ * (float)local_6c0._4_4_ +
                           auVar186._4_4_ * (float)local_760._4_4_;
                      auVar188._8_4_ =
                           fVar240 * auVar196._8_4_ +
                           auVar195._8_4_ * fStack_798 +
                           auVar232._8_4_ * (float)uStack_6b8 + auVar186._8_4_ * (float)uStack_758;
                      auVar188._12_4_ =
                           fVar205 * auVar196._12_4_ +
                           auVar195._12_4_ * fStack_794 +
                           auVar232._12_4_ * uStack_6b8._4_4_ + auVar186._12_4_ * uStack_758._4_4_;
                      auVar232 = vshufps_avx(auVar188,auVar188,0);
                      local_450[0] = (RTCHitN)auVar232[0];
                      local_450[1] = (RTCHitN)auVar232[1];
                      local_450[2] = (RTCHitN)auVar232[2];
                      local_450[3] = (RTCHitN)auVar232[3];
                      local_450[4] = (RTCHitN)auVar232[4];
                      local_450[5] = (RTCHitN)auVar232[5];
                      local_450[6] = (RTCHitN)auVar232[6];
                      local_450[7] = (RTCHitN)auVar232[7];
                      local_450[8] = (RTCHitN)auVar232[8];
                      local_450[9] = (RTCHitN)auVar232[9];
                      local_450[10] = (RTCHitN)auVar232[10];
                      local_450[0xb] = (RTCHitN)auVar232[0xb];
                      local_450[0xc] = (RTCHitN)auVar232[0xc];
                      local_450[0xd] = (RTCHitN)auVar232[0xd];
                      local_450[0xe] = (RTCHitN)auVar232[0xe];
                      local_450[0xf] = (RTCHitN)auVar232[0xf];
                      local_440 = vshufps_avx(auVar188,auVar188,0x55);
                      local_430 = vshufps_avx(auVar188,auVar188,0xaa);
                      fStack_41c = local_420;
                      fStack_418 = local_420;
                      fStack_414 = local_420;
                      local_410._0_4_ = local_410._4_4_;
                      local_410._8_4_ = local_410._4_4_;
                      local_410._12_4_ = local_410._4_4_;
                      local_400 = local_190._0_8_;
                      uStack_3f8 = local_190._8_8_;
                      local_3f0 = local_180._0_8_;
                      uStack_3e8 = local_180._8_8_;
                      vcmpps_avx(auVar280._0_32_,auVar280._0_32_,0xf);
                      uStack_3dc = (local_7f0.context)->instID[0];
                      local_3e0 = uStack_3dc;
                      uStack_3d8 = uStack_3dc;
                      uStack_3d4 = uStack_3dc;
                      uStack_3d0 = (local_7f0.context)->instPrimID[0];
                      uStack_3cc = uStack_3d0;
                      uStack_3c8 = uStack_3d0;
                      uStack_3c4 = uStack_3d0;
                      local_810 = local_7c0;
                      uStack_808 = uStack_7b8;
                      local_7f0.valid = (int *)&local_810;
                      local_7f0.geometryUserPtr = pGVar13->userPtr;
                      local_7f0.hit = local_450;
                      local_7f0.N = 4;
                      local_7f0.ray = (RTCRayN *)ray;
                      if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar232 = auVar267._0_16_;
                        (*pGVar13->intersectionFilterN)(&local_7f0);
                        auVar308 = ZEXT3264(local_600);
                        auVar232 = vpcmpeqd_avx(auVar232,auVar232);
                        auVar267 = ZEXT1664(auVar232);
                        auVar280 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar112._8_8_ = uStack_808;
                      auVar112._0_8_ = local_810;
                      auVar232 = auVar267._0_16_;
                      if (auVar112 == (undefined1  [16])0x0) {
                        auVar186 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar232 = auVar232 ^ auVar186;
                        auVar202 = ZEXT3264(local_4e0);
                      }
                      else {
                        p_Var14 = context->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var14)(&local_7f0);
                          auVar308 = ZEXT3264(local_600);
                          auVar232 = vpcmpeqd_avx(auVar232,auVar232);
                          auVar267 = ZEXT1664(auVar232);
                          auVar280 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        auVar113._8_8_ = uStack_808;
                        auVar113._0_8_ = local_810;
                        auVar186 = vpcmpeqd_avx(auVar113,_DAT_01feba10);
                        auVar232 = auVar267._0_16_ ^ auVar186;
                        auVar202 = ZEXT3264(local_4e0);
                        if (auVar113 != (undefined1  [16])0x0) {
                          auVar186 = auVar267._0_16_ ^ auVar186;
                          auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])local_7f0.hit);
                          *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar195;
                          auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar195;
                          auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar195;
                          auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar195;
                          auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar195;
                          auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar195;
                          auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar195;
                          auVar195 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar195;
                          auVar186 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar186;
                        }
                      }
                      auVar160._8_8_ = 0x100000001;
                      auVar160._0_8_ = 0x100000001;
                      if ((auVar160 & auVar232) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_740._0_4_;
                      }
                      *(undefined4 *)(local_580 + (ulong)local_860 * 4) = 0;
                      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar143._4_4_ = uVar8;
                      auVar143._0_4_ = uVar8;
                      auVar143._8_4_ = uVar8;
                      auVar143._12_4_ = uVar8;
                      auVar143._16_4_ = uVar8;
                      auVar143._20_4_ = uVar8;
                      auVar143._24_4_ = uVar8;
                      auVar143._28_4_ = uVar8;
                      auVar277 = vcmpps_avx(auVar202._0_32_,auVar143,2);
                      auVar164 = vandps_avx(auVar277,local_580);
                      auVar145 = ZEXT3264(auVar164);
                      local_580 = local_580 & auVar277;
                      bVar107 = (local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar108 = (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar106 = (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar105 = SUB321(local_580 >> 0x7f,0) != '\0';
                      bVar104 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar103 = SUB321(local_580 >> 0xbf,0) != '\0';
                      bVar102 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar101 = local_580[0x1f] < '\0';
                      if (((((((bVar107 || bVar108) || bVar106) || bVar105) || bVar104) || bVar103)
                          || bVar102) || bVar101) {
                        auVar171._8_4_ = 0x7f800000;
                        auVar171._0_8_ = 0x7f8000007f800000;
                        auVar171._12_4_ = 0x7f800000;
                        auVar171._16_4_ = 0x7f800000;
                        auVar171._20_4_ = 0x7f800000;
                        auVar171._24_4_ = 0x7f800000;
                        auVar171._28_4_ = 0x7f800000;
                        auVar277 = vblendvps_avx(auVar171,auVar202._0_32_,auVar164);
                        auVar18 = vshufps_avx(auVar277,auVar277,0xb1);
                        auVar18 = vminps_avx(auVar277,auVar18);
                        auVar22 = vshufpd_avx(auVar18,auVar18,5);
                        auVar18 = vminps_avx(auVar18,auVar22);
                        auVar22 = vperm2f128_avx(auVar18,auVar18,1);
                        auVar202 = ZEXT3264(auVar22);
                        auVar18 = vminps_avx(auVar18,auVar22);
                        auVar277 = vcmpps_avx(auVar277,auVar18,0);
                        auVar18 = auVar164 & auVar277;
                        if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar18 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar18 >> 0x7f,0) != '\0') ||
                              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar18 >> 0xbf,0) != '\0') ||
                            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar18[0x1f] < '\0') {
                          auVar277 = vandps_avx(auVar277,auVar164);
                          auVar145 = ZEXT3264(auVar277);
                        }
                        uVar127 = vmovmskps_avx(auVar145._0_32_);
                        local_860 = 0;
                        if (uVar127 != 0) {
                          for (; (uVar127 >> local_860 & 1) == 0; local_860 = local_860 + 1) {
                          }
                        }
                      }
                      local_580 = auVar164;
                    } while (((((((bVar107 || bVar108) || bVar106) || bVar105) || bVar104) ||
                              bVar103) || bVar102) || bVar101);
                  }
                }
              }
            }
          }
          lVar129 = lVar129 + 8;
          auVar267 = ZEXT3264(local_660);
          auVar280 = ZEXT3264(local_680);
          fVar334 = (float)local_720._0_4_;
          fVar338 = (float)local_720._4_4_;
          fVar339 = fStack_718;
          fVar340 = fStack_714;
          fVar207 = fStack_710;
          fVar244 = fStack_70c;
          fVar255 = fStack_708;
          fVar257 = fStack_704;
        } while ((int)lVar129 < (int)uVar11);
      }
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar135._4_4_ = uVar8;
      auVar135._0_4_ = uVar8;
      auVar135._8_4_ = uVar8;
      auVar135._12_4_ = uVar8;
      auVar232 = vcmpps_avx(local_170,auVar135,2);
      uVar125 = vmovmskps_avx(auVar232);
      uVar125 = (uint)uVar130 & uVar125;
    } while (uVar125 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }